

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O1

void ggml_compute_forward_abs(ggml_compute_params *params,ggml_tensor *dst)

{
  uint *puVar1;
  ggml_type gVar2;
  int iVar3;
  ggml_type gVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  void *pvVar12;
  ggml_tensor *pgVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  ulong uVar42;
  undefined8 uVar43;
  bool bVar44;
  byte bVar45;
  byte bVar46;
  char cVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  ulong in_RCX;
  char *pcVar53;
  long lVar54;
  long lVar55;
  ushort uVar56;
  undefined8 uVar57;
  ggml_tensor *pgVar58;
  ggml_tensor *pgVar59;
  ggml_tensor *pgVar60;
  ggml_tensor *pgVar61;
  ggml_tensor *pgVar62;
  uint uVar63;
  ggml_tensor *pgVar64;
  ggml_tensor *pgVar65;
  ggml_tensor *pgVar66;
  ulong uVar67;
  long in_R9;
  uint uVar68;
  ulong uVar69;
  int64_t ir;
  long lVar70;
  long lVar71;
  ggml_tensor *src0;
  long lVar72;
  undefined1 auVar81 [32];
  int iVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  float fVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auStack_900 [64];
  undefined8 uStack_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 uStack_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 uStack_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 uStack_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 uStack_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  ggml_tensor *pgStack_798;
  ggml_tensor *pgStack_790;
  ggml_tensor *pgStack_788;
  long lStack_780;
  long lStack_778;
  size_t sStack_770;
  size_t sStack_768;
  size_t sStack_760;
  size_t sStack_758;
  size_t sStack_750;
  size_t sStack_748;
  ggml_tensor *pgStack_740;
  ggml_tensor *pgStack_738;
  size_t sStack_730;
  ggml_tensor *pgStack_728;
  ggml_tensor *pgStack_720;
  ggml_tensor *pgStack_718;
  ggml_tensor *pgStack_710;
  ggml_tensor *pgStack_708;
  ggml_tensor *pgStack_700;
  long lStack_6f8;
  long lStack_6f0;
  size_t sStack_6e8;
  size_t sStack_6e0;
  size_t sStack_6d8;
  size_t sStack_6d0;
  size_t sStack_6c8;
  size_t sStack_6c0;
  ggml_tensor *pgStack_6b8;
  ggml_tensor *pgStack_6b0;
  size_t sStack_6a8;
  ggml_tensor *pgStack_6a0;
  ggml_tensor *pgStack_698;
  ggml_tensor *pgStack_690;
  ggml_tensor *pgStack_688;
  ggml_tensor *pgStack_680;
  ggml_tensor *pgStack_678;
  long lStack_670;
  long lStack_668;
  size_t sStack_660;
  size_t sStack_658;
  size_t sStack_650;
  size_t sStack_648;
  size_t sStack_640;
  size_t sStack_638;
  ggml_tensor *pgStack_630;
  ggml_tensor *pgStack_628;
  size_t sStack_620;
  ggml_tensor *pgStack_618;
  ggml_tensor *pgStack_610;
  ggml_tensor *pgStack_608;
  ggml_tensor *pgStack_600;
  ggml_tensor *pgStack_5f8;
  ggml_tensor *pgStack_5f0;
  long lStack_5e8;
  long lStack_5e0;
  size_t sStack_5d8;
  size_t sStack_5d0;
  size_t sStack_5c8;
  size_t sStack_5c0;
  size_t sStack_5b8;
  size_t sStack_5b0;
  ggml_tensor *pgStack_5a8;
  ggml_tensor *pgStack_5a0;
  size_t sStack_598;
  ggml_tensor *pgStack_590;
  ggml_tensor *pgStack_588;
  ggml_tensor *pgStack_580;
  ggml_tensor *pgStack_578;
  ggml_tensor *pgStack_570;
  ggml_tensor *pgStack_568;
  ggml_tensor *pgStack_560;
  size_t sStack_558;
  size_t sStack_550;
  size_t sStack_548;
  size_t sStack_540;
  size_t sStack_538;
  ggml_tensor *pgStack_530;
  ggml_tensor *pgStack_528;
  ggml_tensor *pgStack_520;
  ggml_tensor *pgStack_518;
  ggml_tensor *pgStack_510;
  ggml_tensor *pgStack_508;
  
  pgVar58 = dst->src[0];
  gVar2 = pgVar58->type;
  if ((gVar2 == GGML_TYPE_F32) && (dst->type == GGML_TYPE_F32)) {
    cVar47 = ggml_is_contiguous_1(pgVar58);
    if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(dst), cVar47 != '\0')) &&
       (cVar47 = ggml_are_same_shape(pgVar58,dst), cVar47 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_00128d3b;
      if (pgVar58->nb[0] == 4) {
        lVar55 = pgVar58->ne[1];
        lVar71 = pgVar58->ne[2];
        sVar5 = pgVar58->nb[1];
        sVar6 = pgVar58->nb[2];
        sVar7 = pgVar58->nb[3];
        lVar52 = dst->ne[0];
        sVar8 = dst->nb[1];
        sVar9 = dst->nb[2];
        sVar10 = dst->nb[3];
        iVar73 = params->ith;
        iVar3 = params->nth;
        lVar48 = ggml_nrows(pgVar58);
        lVar49 = ((long)iVar3 + -1 + lVar48) / (long)iVar3;
        lVar70 = iVar73 * lVar49;
        lVar49 = lVar49 + lVar70;
        if (lVar48 <= lVar49) {
          lVar49 = lVar48;
        }
        if (lVar49 <= lVar70) {
          return;
        }
        lVar71 = lVar71 * lVar55;
        pvVar11 = dst->data;
        pvVar12 = pgVar58->data;
        auVar93._8_4_ = 0x7fffffff;
        auVar93._0_8_ = 0x7fffffff7fffffff;
        auVar93._12_4_ = 0x7fffffff;
        do {
          lVar48 = lVar70 / lVar71;
          lVar54 = lVar70 % lVar71;
          lVar50 = lVar54 / lVar55;
          lVar54 = lVar54 % lVar55;
          if (0 < lVar52) {
            lVar51 = 0;
            do {
              auVar97 = vpand_avx(ZEXT416(*(uint *)((long)pvVar12 +
                                                   lVar51 * 4 +
                                                   lVar50 * sVar6 + lVar54 * sVar5 + lVar48 * sVar7)
                                         ),auVar93);
              *(int *)((long)pvVar11 +
                      lVar51 * 4 + lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) =
                   auVar97._0_4_;
              lVar51 = lVar51 + 1;
            } while (lVar52 != lVar51);
          }
          lVar70 = lVar70 + 1;
        } while (lVar70 != lVar49);
        return;
      }
LAB_00128d57:
      pcVar53 = "nb00 == sizeof(src0_t)";
      uVar57 = 0x56;
      goto LAB_00128d71;
    }
  }
  else if ((gVar2 == GGML_TYPE_F16) && (dst->type == GGML_TYPE_F16)) {
    cVar47 = ggml_is_contiguous_1(pgVar58);
    if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(dst), cVar47 != '\0')) &&
       (cVar47 = ggml_are_same_shape(pgVar58,dst), cVar47 != '\0')) {
      if (dst->nb[0] == 2) {
        if (pgVar58->nb[0] == 2) {
          lVar55 = pgVar58->ne[1];
          lVar71 = pgVar58->ne[2];
          sVar5 = pgVar58->nb[1];
          sVar6 = pgVar58->nb[2];
          sVar7 = pgVar58->nb[3];
          lVar52 = dst->ne[0];
          iVar73 = params->ith;
          iVar3 = params->nth;
          lVar48 = ggml_nrows();
          lVar49 = ((long)iVar3 + -1 + lVar48) / (long)iVar3;
          lVar70 = iVar73 * lVar49;
          lVar49 = lVar49 + lVar70;
          if (lVar48 <= lVar49) {
            lVar49 = lVar48;
          }
          if (lVar49 <= lVar70) {
            return;
          }
          lVar71 = lVar71 * lVar55;
          auVar91._8_4_ = 0x7fffffff;
          auVar91._0_8_ = 0x7fffffff7fffffff;
          auVar91._12_4_ = 0x7fffffff;
          do {
            lVar48 = lVar70 % lVar71;
            if (0 < lVar52) {
              lVar50 = 0;
              do {
                auVar97 = vpand_avx(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                     (ulong)*(ushort *)
                                                             ((long)pgVar58->data +
                                                             lVar50 * 2 +
                                                             (lVar48 / lVar55) * sVar6 +
                                                             (lVar48 % lVar55) * sVar5 +
                                                             (lVar70 / lVar71) * sVar7) * 4)),
                                    auVar91);
                auVar97 = vcvtps2ph_f16c(auVar97,0);
                vpextrw_avx(auVar97,0);
                lVar50 = lVar50 + 1;
              } while (lVar52 != lVar50);
            }
            lVar70 = lVar70 + 1;
          } while (lVar70 != lVar49);
          return;
        }
        goto LAB_00128d57;
      }
      goto LAB_00128d3b;
    }
  }
  else if (gVar2 == GGML_TYPE_BF16) {
    gVar4 = dst->type;
    in_RCX = (ulong)gVar4;
    if (gVar4 == GGML_TYPE_F32) {
      cVar47 = ggml_is_contiguous_1(pgVar58);
      if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(dst), cVar47 != '\0')) &&
         (cVar47 = ggml_are_same_shape(pgVar58,dst), cVar47 != '\0')) {
        if (dst->nb[0] == 4) {
          if (pgVar58->nb[0] == 2) {
            lVar55 = pgVar58->ne[1];
            lVar71 = pgVar58->ne[2];
            sVar5 = pgVar58->nb[1];
            sVar6 = pgVar58->nb[2];
            sVar7 = pgVar58->nb[3];
            lVar52 = dst->ne[0];
            sVar8 = dst->nb[1];
            sVar9 = dst->nb[2];
            sVar10 = dst->nb[3];
            iVar73 = params->ith;
            iVar3 = params->nth;
            lVar48 = ggml_nrows(pgVar58);
            lVar49 = ((long)iVar3 + -1 + lVar48) / (long)iVar3;
            lVar70 = iVar73 * lVar49;
            lVar49 = lVar49 + lVar70;
            if (lVar48 <= lVar49) {
              lVar49 = lVar48;
            }
            if (lVar49 <= lVar70) {
              return;
            }
            lVar71 = lVar71 * lVar55;
            pvVar11 = dst->data;
            pvVar12 = pgVar58->data;
            auVar89 = vpbroadcastq_avx512f();
            auVar85 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar86 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar87 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
            do {
              lVar48 = lVar70 / lVar71;
              lVar54 = lVar70 % lVar71;
              lVar50 = lVar54 / lVar55;
              lVar54 = lVar54 % lVar55;
              if (0 < lVar52) {
                uVar69 = 0;
                do {
                  auVar88 = vpbroadcastq_avx512f();
                  auVar82 = vporq_avx512f(auVar88,auVar85);
                  auVar88 = vporq_avx512f(auVar88,auVar86);
                  uVar57 = vpcmpuq_avx512f(auVar88,auVar89,2);
                  bVar45 = (byte)uVar57;
                  uVar57 = vpcmpuq_avx512f(auVar82,auVar89,2);
                  bVar46 = (byte)uVar57;
                  uVar56 = CONCAT11(bVar46,bVar45);
                  auVar74 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                ((long)pvVar12 +
                                                uVar69 * 2 +
                                                lVar50 * sVar6 + lVar54 * sVar5 + lVar48 * sVar7));
                  auVar81._2_2_ = (ushort)((byte)(uVar56 >> 1) & 1) * auVar74._2_2_;
                  auVar81._0_2_ = (ushort)(bVar45 & 1) * auVar74._0_2_;
                  auVar81._4_2_ = (ushort)((byte)(uVar56 >> 2) & 1) * auVar74._4_2_;
                  auVar81._6_2_ = (ushort)((byte)(uVar56 >> 3) & 1) * auVar74._6_2_;
                  auVar81._8_2_ = (ushort)((byte)(uVar56 >> 4) & 1) * auVar74._8_2_;
                  auVar81._10_2_ = (ushort)((byte)(uVar56 >> 5) & 1) * auVar74._10_2_;
                  auVar81._12_2_ = (ushort)((byte)(uVar56 >> 6) & 1) * auVar74._12_2_;
                  auVar81._14_2_ = (ushort)((byte)(uVar56 >> 7) & 1) * auVar74._14_2_;
                  auVar81._16_2_ = (ushort)(bVar46 & 1) * auVar74._16_2_;
                  auVar81._18_2_ = (ushort)(bVar46 >> 1 & 1) * auVar74._18_2_;
                  auVar81._20_2_ = (ushort)(bVar46 >> 2 & 1) * auVar74._20_2_;
                  auVar81._22_2_ = (ushort)(bVar46 >> 3 & 1) * auVar74._22_2_;
                  auVar81._24_2_ = (ushort)(bVar46 >> 4 & 1) * auVar74._24_2_;
                  auVar81._26_2_ = (ushort)(bVar46 >> 5 & 1) * auVar74._26_2_;
                  auVar81._28_2_ = (ushort)(bVar46 >> 6 & 1) * auVar74._28_2_;
                  auVar81._30_2_ = (ushort)(bVar46 >> 7) * auVar74._30_2_;
                  auVar88 = vpmovzxwd_avx512f(auVar81);
                  auVar88 = vpslld_avx512f(auVar88,0x10);
                  auVar88 = vpandd_avx512f(auVar88,auVar87);
                  puVar1 = (uint *)((long)pvVar11 +
                                   uVar69 * 4 + lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10);
                  bVar44 = (bool)((byte)(uVar56 >> 1) & 1);
                  bVar14 = (bool)((byte)(uVar56 >> 2) & 1);
                  bVar15 = (bool)((byte)(uVar56 >> 3) & 1);
                  bVar16 = (bool)((byte)(uVar56 >> 4) & 1);
                  bVar17 = (bool)((byte)(uVar56 >> 5) & 1);
                  bVar18 = (bool)((byte)(uVar56 >> 6) & 1);
                  bVar21 = (bool)((byte)(uVar56 >> 7) & 1);
                  bVar25 = (bool)(bVar46 >> 1 & 1);
                  bVar28 = (bool)(bVar46 >> 2 & 1);
                  bVar31 = (bool)(bVar46 >> 3 & 1);
                  bVar34 = (bool)(bVar46 >> 4 & 1);
                  bVar37 = (bool)(bVar46 >> 5 & 1);
                  bVar40 = (bool)(bVar46 >> 6 & 1);
                  *puVar1 = (uint)(bVar45 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar45 & 1) * *puVar1
                  ;
                  puVar1[1] = (uint)bVar44 * auVar88._4_4_ | (uint)!bVar44 * puVar1[1];
                  puVar1[2] = (uint)bVar14 * auVar88._8_4_ | (uint)!bVar14 * puVar1[2];
                  puVar1[3] = (uint)bVar15 * auVar88._12_4_ | (uint)!bVar15 * puVar1[3];
                  puVar1[4] = (uint)bVar16 * auVar88._16_4_ | (uint)!bVar16 * puVar1[4];
                  puVar1[5] = (uint)bVar17 * auVar88._20_4_ | (uint)!bVar17 * puVar1[5];
                  puVar1[6] = (uint)bVar18 * auVar88._24_4_ | (uint)!bVar18 * puVar1[6];
                  puVar1[7] = (uint)bVar21 * auVar88._28_4_ | (uint)!bVar21 * puVar1[7];
                  puVar1[8] = (uint)(bVar46 & 1) * auVar88._32_4_ |
                              (uint)!(bool)(bVar46 & 1) * puVar1[8];
                  puVar1[9] = (uint)bVar25 * auVar88._36_4_ | (uint)!bVar25 * puVar1[9];
                  puVar1[10] = (uint)bVar28 * auVar88._40_4_ | (uint)!bVar28 * puVar1[10];
                  puVar1[0xb] = (uint)bVar31 * auVar88._44_4_ | (uint)!bVar31 * puVar1[0xb];
                  puVar1[0xc] = (uint)bVar34 * auVar88._48_4_ | (uint)!bVar34 * puVar1[0xc];
                  puVar1[0xd] = (uint)bVar37 * auVar88._52_4_ | (uint)!bVar37 * puVar1[0xd];
                  puVar1[0xe] = (uint)bVar40 * auVar88._56_4_ | (uint)!bVar40 * puVar1[0xe];
                  puVar1[0xf] = (uint)(bVar46 >> 7) * auVar88._60_4_ |
                                (uint)!(bool)(bVar46 >> 7) * puVar1[0xf];
                  uVar69 = uVar69 + 0x10;
                } while ((lVar52 + 0xfU & 0xfffffffffffffff0) != uVar69);
              }
              lVar70 = lVar70 + 1;
            } while (lVar70 != lVar49);
            return;
          }
          goto LAB_00128d57;
        }
        goto LAB_00128d3b;
      }
    }
    else {
      if (gVar4 != GGML_TYPE_BF16) goto LAB_0012885d;
      cVar47 = ggml_is_contiguous_1(pgVar58);
      if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(dst), cVar47 != '\0')) &&
         (cVar47 = ggml_are_same_shape(pgVar58,dst), cVar47 != '\0')) {
        if (dst->nb[0] == 2) {
          if (pgVar58->nb[0] == 2) {
            lVar55 = pgVar58->ne[1];
            lVar71 = pgVar58->ne[2];
            sVar5 = pgVar58->nb[1];
            sVar6 = pgVar58->nb[2];
            sVar7 = pgVar58->nb[3];
            lVar52 = dst->ne[0];
            sVar8 = dst->nb[1];
            sVar9 = dst->nb[2];
            sVar10 = dst->nb[3];
            iVar73 = params->ith;
            iVar3 = params->nth;
            lVar48 = ggml_nrows(pgVar58);
            lVar49 = ((long)iVar3 + -1 + lVar48) / (long)iVar3;
            lVar70 = iVar73 * lVar49;
            lVar49 = lVar49 + lVar70;
            if (lVar48 <= lVar49) {
              lVar49 = lVar48;
            }
            if (lVar49 <= lVar70) {
              return;
            }
            lVar71 = lVar71 * lVar55;
            pvVar11 = dst->data;
            pvVar12 = pgVar58->data;
            do {
              lVar48 = lVar70 / lVar71;
              lVar54 = lVar70 % lVar71;
              lVar50 = lVar54 / lVar55;
              lVar54 = lVar54 % lVar55;
              if (0 < lVar52) {
                lVar51 = 0;
                do {
                  uVar56 = *(ushort *)
                            ((long)pvVar12 +
                            lVar51 * 2 + lVar50 * sVar6 + lVar54 * sVar5 + lVar48 * sVar7);
                  uVar68 = (uVar56 & 0x7fff) * 0x10000;
                  if (uVar68 < 0x7f800001) {
                    uVar56 = (ushort)(uVar68 + 0x7fff + (uVar56 & 1) >> 0x10);
                  }
                  else {
                    uVar56 = uVar56 & 0x7fff | 0x40;
                  }
                  *(ushort *)
                   ((long)pvVar11 + lVar51 * 2 + lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10)
                       = uVar56;
                  lVar51 = lVar51 + 1;
                } while (lVar52 != lVar51);
              }
              lVar70 = lVar70 + 1;
            } while (lVar70 != lVar49);
            return;
          }
          goto LAB_00128d57;
        }
        goto LAB_00128d3b;
      }
    }
  }
  else {
LAB_0012885d:
    if ((gVar2 != GGML_TYPE_F16) || (dst->type != GGML_TYPE_F32)) {
      ggml_compute_forward_abs_cold_1();
      pgVar59 = pgVar58->src[0];
      gVar2 = pgVar59->type;
      if ((gVar2 == GGML_TYPE_F32) && (pgVar58->type == GGML_TYPE_F32)) {
        cVar47 = ggml_is_contiguous_1(pgVar59);
        if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(pgVar58), cVar47 != '\0')) &&
           (cVar47 = ggml_are_same_shape(pgVar59,pgVar58), cVar47 != '\0')) {
          if (pgVar58->nb[0] != 4) goto LAB_00129674;
          if (pgVar59->nb[0] == 4) {
            lVar55 = pgVar59->ne[1];
            lVar71 = pgVar59->ne[2];
            sVar5 = pgVar59->nb[1];
            sVar6 = pgVar59->nb[2];
            sVar7 = pgVar59->nb[3];
            lVar52 = pgVar58->ne[0];
            sVar8 = pgVar58->nb[1];
            sVar9 = pgVar58->nb[2];
            sVar10 = pgVar58->nb[3];
            gVar2 = dst->type;
            iVar73 = *(int *)&dst->field_0x4;
            lVar48 = ggml_nrows(pgVar59);
            lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
            lVar70 = (int)gVar2 * lVar49;
            lVar49 = lVar49 + lVar70;
            if (lVar48 <= lVar49) {
              lVar49 = lVar48;
            }
            if (lVar49 <= lVar70) {
              return;
            }
            lVar71 = lVar71 * lVar55;
            pvVar11 = pgVar58->data;
            pvVar12 = pgVar59->data;
            do {
              lVar48 = lVar70 / lVar71;
              lVar54 = lVar70 % lVar71;
              lVar50 = lVar54 / lVar55;
              lVar54 = lVar54 % lVar55;
              if (0 < lVar52) {
                lVar51 = 0;
                do {
                  auVar97 = ZEXT416(*(uint *)((long)pvVar12 +
                                             lVar51 * 4 +
                                             lVar50 * sVar6 + lVar54 * sVar5 + lVar48 * sVar7));
                  uVar57 = vcmpss_avx512f(auVar97,ZEXT816(0) << 0x40,1);
                  uVar43 = vcmpss_avx512f(ZEXT816(0) << 0x40,auVar97,1);
                  bVar44 = (bool)((byte)uVar43 & 1);
                  *(uint *)((long)pvVar11 +
                           lVar51 * 4 + lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) =
                       (uint)bVar44 * 0x3f800000 +
                       (uint)!bVar44 * (uint)((byte)uVar57 & 1) * -0x40800000;
                  lVar51 = lVar51 + 1;
                } while (lVar52 != lVar51);
              }
              lVar70 = lVar70 + 1;
            } while (lVar70 != lVar49);
            return;
          }
LAB_00129690:
          pcVar53 = "nb00 == sizeof(src0_t)";
          uVar57 = 0x56;
          goto LAB_001296aa;
        }
      }
      else if ((gVar2 == GGML_TYPE_F16) && (pgVar58->type == GGML_TYPE_F16)) {
        cVar47 = ggml_is_contiguous_1(pgVar59);
        if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(pgVar58), cVar47 != '\0')) &&
           (cVar47 = ggml_are_same_shape(pgVar59,pgVar58), cVar47 != '\0')) {
          if (pgVar58->nb[0] == 2) {
            if (pgVar59->nb[0] == 2) {
              lVar55 = pgVar59->ne[1];
              lVar71 = pgVar59->ne[2];
              sVar5 = pgVar59->nb[1];
              sVar6 = pgVar59->nb[2];
              sVar7 = pgVar59->nb[3];
              lVar52 = pgVar58->ne[0];
              gVar2 = dst->type;
              iVar73 = *(int *)&dst->field_0x4;
              lVar48 = ggml_nrows();
              lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
              lVar70 = (int)gVar2 * lVar49;
              lVar49 = lVar49 + lVar70;
              if (lVar48 <= lVar49) {
                lVar49 = lVar48;
              }
              if (lVar49 <= lVar70) {
                return;
              }
              lVar71 = lVar71 * lVar55;
              do {
                lVar48 = lVar70 % lVar71;
                if (0 < lVar52) {
                  lVar50 = 0;
                  do {
                    uVar57 = vcmpss_avx512f(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                             (ulong)*(ushort *)
                                                                     ((long)pgVar59->data +
                                                                     lVar50 * 2 +
                                                                     (lVar48 / lVar55) * sVar6 +
                                                                     (lVar48 % lVar55) * sVar5 +
                                                                     (lVar70 / lVar71) * sVar7) * 4)
                                                   ),ZEXT816(0) << 0x40,1);
                    uVar43 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                            ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                             (ulong)*(ushort *)
                                                                     ((long)pgVar59->data +
                                                                     lVar50 * 2 +
                                                                     (lVar48 / lVar55) * sVar6 +
                                                                     (lVar48 % lVar55) * sVar5 +
                                                                     (lVar70 / lVar71) * sVar7) * 4)
                                                   ),1);
                    bVar44 = (bool)((byte)uVar43 & 1);
                    auVar97 = vcvtps2ph_f16c(ZEXT416((uint)bVar44 * 0x3f800000 +
                                                     (uint)!bVar44 *
                                                     (uint)((byte)uVar57 & 1) * -0x40800000),0);
                    vpextrw_avx(auVar97,0);
                    lVar50 = lVar50 + 1;
                  } while (lVar52 != lVar50);
                }
                lVar70 = lVar70 + 1;
              } while (lVar70 != lVar49);
              return;
            }
            goto LAB_00129690;
          }
          goto LAB_00129674;
        }
      }
      else if (gVar2 == GGML_TYPE_BF16) {
        gVar4 = pgVar58->type;
        in_RCX = (ulong)gVar4;
        if (gVar4 == GGML_TYPE_F32) {
          cVar47 = ggml_is_contiguous_1(pgVar59);
          if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(pgVar58), cVar47 != '\0')) &&
             (cVar47 = ggml_are_same_shape(pgVar59,pgVar58), cVar47 != '\0')) {
            if (pgVar58->nb[0] == 4) {
              if (pgVar59->nb[0] == 2) {
                lVar55 = pgVar59->ne[1];
                lVar71 = pgVar59->ne[2];
                sVar5 = pgVar59->nb[1];
                sVar6 = pgVar59->nb[2];
                sVar7 = pgVar59->nb[3];
                lVar52 = pgVar58->ne[0];
                sVar8 = pgVar58->nb[1];
                sVar9 = pgVar58->nb[2];
                sVar10 = pgVar58->nb[3];
                gVar2 = dst->type;
                iVar73 = *(int *)&dst->field_0x4;
                lVar48 = ggml_nrows(pgVar59);
                lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                lVar70 = (int)gVar2 * lVar49;
                lVar49 = lVar49 + lVar70;
                if (lVar48 <= lVar49) {
                  lVar49 = lVar48;
                }
                if (lVar49 <= lVar70) {
                  return;
                }
                lVar71 = lVar71 * lVar55;
                pvVar11 = pgVar58->data;
                pvVar12 = pgVar59->data;
                auVar89 = vpbroadcastq_avx512f();
                auVar85 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                auVar86 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                do {
                  lVar48 = lVar70 / lVar71;
                  lVar54 = lVar70 % lVar71;
                  lVar50 = lVar54 / lVar55;
                  lVar54 = lVar54 % lVar55;
                  if (0 < lVar52) {
                    uVar69 = 0;
                    do {
                      auVar87 = vpbroadcastq_avx512f();
                      auVar88 = vporq_avx512f(auVar87,auVar85);
                      auVar87 = vporq_avx512f(auVar87,auVar86);
                      uVar57 = vpcmpuq_avx512f(auVar87,auVar89,2);
                      bVar45 = (byte)uVar57;
                      uVar57 = vpcmpuq_avx512f(auVar88,auVar89,2);
                      bVar46 = (byte)uVar57;
                      uVar56 = CONCAT11(bVar46,bVar45);
                      auVar81 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                    ((long)pvVar12 +
                                                    uVar69 * 2 +
                                                    lVar50 * sVar6 + lVar54 * sVar5 + lVar48 * sVar7
                                                    ));
                      auVar74._2_2_ = (ushort)((byte)(uVar56 >> 1) & 1) * auVar81._2_2_;
                      auVar74._0_2_ = (ushort)(bVar45 & 1) * auVar81._0_2_;
                      auVar74._4_2_ = (ushort)((byte)(uVar56 >> 2) & 1) * auVar81._4_2_;
                      auVar74._6_2_ = (ushort)((byte)(uVar56 >> 3) & 1) * auVar81._6_2_;
                      auVar74._8_2_ = (ushort)((byte)(uVar56 >> 4) & 1) * auVar81._8_2_;
                      auVar74._10_2_ = (ushort)((byte)(uVar56 >> 5) & 1) * auVar81._10_2_;
                      auVar74._12_2_ = (ushort)((byte)(uVar56 >> 6) & 1) * auVar81._12_2_;
                      auVar74._14_2_ = (ushort)((byte)(uVar56 >> 7) & 1) * auVar81._14_2_;
                      auVar74._16_2_ = (ushort)(bVar46 & 1) * auVar81._16_2_;
                      auVar74._18_2_ = (ushort)(bVar46 >> 1 & 1) * auVar81._18_2_;
                      auVar74._20_2_ = (ushort)(bVar46 >> 2 & 1) * auVar81._20_2_;
                      auVar74._22_2_ = (ushort)(bVar46 >> 3 & 1) * auVar81._22_2_;
                      auVar74._24_2_ = (ushort)(bVar46 >> 4 & 1) * auVar81._24_2_;
                      auVar74._26_2_ = (ushort)(bVar46 >> 5 & 1) * auVar81._26_2_;
                      auVar74._28_2_ = (ushort)(bVar46 >> 6 & 1) * auVar81._28_2_;
                      auVar74._30_2_ = (ushort)(bVar46 >> 7) * auVar81._30_2_;
                      auVar87 = vpmovzxwd_avx512f(auVar74);
                      auVar87 = vpslld_avx512f(auVar87,0x10);
                      uVar67 = vcmpps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar87,1);
                      uVar42 = vcmpps_avx512f(auVar87,ZEXT1664(ZEXT816(0) << 0x40),1);
                      auVar87 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
                      auVar88 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                      bVar44 = (bool)((byte)uVar67 & 1);
                      bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar16 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar18 = (bool)((byte)(uVar67 >> 3) & 1);
                      bVar25 = (bool)((byte)(uVar67 >> 4) & 1);
                      bVar31 = (bool)((byte)(uVar67 >> 5) & 1);
                      bVar37 = (bool)((byte)(uVar67 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar67 >> 7) & 1);
                      bVar22 = (bool)((byte)(uVar67 >> 8) & 1);
                      bVar23 = (bool)((byte)(uVar67 >> 9) & 1);
                      bVar26 = (bool)((byte)(uVar67 >> 10) & 1);
                      bVar29 = (bool)((byte)(uVar67 >> 0xb) & 1);
                      bVar32 = (bool)((byte)(uVar67 >> 0xc) & 1);
                      bVar35 = (bool)((byte)(uVar67 >> 0xd) & 1);
                      bVar38 = (bool)((byte)(uVar67 >> 0xe) & 1);
                      bVar41 = SUB81(uVar67 >> 0xf,0);
                      puVar1 = (uint *)((long)pvVar11 +
                                       uVar69 * 4 +
                                       lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10);
                      bVar15 = (bool)((byte)(uVar56 >> 1) & 1);
                      bVar17 = (bool)((byte)(uVar56 >> 2) & 1);
                      bVar21 = (bool)((byte)(uVar56 >> 3) & 1);
                      bVar28 = (bool)((byte)(uVar56 >> 4) & 1);
                      bVar34 = (bool)((byte)(uVar56 >> 5) & 1);
                      bVar40 = (bool)((byte)(uVar56 >> 6) & 1);
                      bVar20 = (bool)((byte)(uVar56 >> 7) & 1);
                      bVar24 = (bool)(bVar46 >> 1 & 1);
                      bVar27 = (bool)(bVar46 >> 2 & 1);
                      bVar30 = (bool)(bVar46 >> 3 & 1);
                      bVar33 = (bool)(bVar46 >> 4 & 1);
                      bVar36 = (bool)(bVar46 >> 5 & 1);
                      bVar39 = (bool)(bVar46 >> 6 & 1);
                      *puVar1 = (uint)(bVar45 & 1) *
                                ((uint)bVar44 * auVar88._0_4_ |
                                (uint)!bVar44 * (uint)((byte)uVar42 & 1) * auVar87._0_4_) |
                                (uint)!(bool)(bVar45 & 1) * *puVar1;
                      puVar1[1] = (uint)bVar15 *
                                  ((uint)bVar14 * auVar88._4_4_ |
                                  (uint)!bVar14 * (uint)((byte)(uVar42 >> 1) & 1) * auVar87._4_4_) |
                                  (uint)!bVar15 * puVar1[1];
                      puVar1[2] = (uint)bVar17 *
                                  ((uint)bVar16 * auVar88._8_4_ |
                                  (uint)!bVar16 * (uint)((byte)(uVar42 >> 2) & 1) * auVar87._8_4_) |
                                  (uint)!bVar17 * puVar1[2];
                      puVar1[3] = (uint)bVar21 *
                                  ((uint)bVar18 * auVar88._12_4_ |
                                  (uint)!bVar18 * (uint)((byte)(uVar42 >> 3) & 1) * auVar87._12_4_)
                                  | (uint)!bVar21 * puVar1[3];
                      puVar1[4] = (uint)bVar28 *
                                  ((uint)bVar25 * auVar88._16_4_ |
                                  (uint)!bVar25 * (uint)((byte)(uVar42 >> 4) & 1) * auVar87._16_4_)
                                  | (uint)!bVar28 * puVar1[4];
                      puVar1[5] = (uint)bVar34 *
                                  ((uint)bVar31 * auVar88._20_4_ |
                                  (uint)!bVar31 * (uint)((byte)(uVar42 >> 5) & 1) * auVar87._20_4_)
                                  | (uint)!bVar34 * puVar1[5];
                      puVar1[6] = (uint)bVar40 *
                                  ((uint)bVar37 * auVar88._24_4_ |
                                  (uint)!bVar37 * (uint)((byte)(uVar42 >> 6) & 1) * auVar87._24_4_)
                                  | (uint)!bVar40 * puVar1[6];
                      puVar1[7] = (uint)bVar20 *
                                  ((uint)bVar19 * auVar88._28_4_ |
                                  (uint)!bVar19 * (uint)((byte)(uVar42 >> 7) & 1) * auVar87._28_4_)
                                  | (uint)!bVar20 * puVar1[7];
                      puVar1[8] = (uint)(bVar46 & 1) *
                                  ((uint)bVar22 * auVar88._32_4_ |
                                  (uint)!bVar22 * (uint)((byte)(uVar42 >> 8) & 1) * auVar87._32_4_)
                                  | (uint)!(bool)(bVar46 & 1) * puVar1[8];
                      puVar1[9] = (uint)bVar24 *
                                  ((uint)bVar23 * auVar88._36_4_ |
                                  (uint)!bVar23 * (uint)((byte)(uVar42 >> 9) & 1) * auVar87._36_4_)
                                  | (uint)!bVar24 * puVar1[9];
                      puVar1[10] = (uint)bVar27 *
                                   ((uint)bVar26 * auVar88._40_4_ |
                                   (uint)!bVar26 * (uint)((byte)(uVar42 >> 10) & 1) * auVar87._40_4_
                                   ) | (uint)!bVar27 * puVar1[10];
                      puVar1[0xb] = (uint)bVar30 *
                                    ((uint)bVar29 * auVar88._44_4_ |
                                    (uint)!bVar29 *
                                    (uint)((byte)(uVar42 >> 0xb) & 1) * auVar87._44_4_) |
                                    (uint)!bVar30 * puVar1[0xb];
                      puVar1[0xc] = (uint)bVar33 *
                                    ((uint)bVar32 * auVar88._48_4_ |
                                    (uint)!bVar32 *
                                    (uint)((byte)(uVar42 >> 0xc) & 1) * auVar87._48_4_) |
                                    (uint)!bVar33 * puVar1[0xc];
                      puVar1[0xd] = (uint)bVar36 *
                                    ((uint)bVar35 * auVar88._52_4_ |
                                    (uint)!bVar35 *
                                    (uint)((byte)(uVar42 >> 0xd) & 1) * auVar87._52_4_) |
                                    (uint)!bVar36 * puVar1[0xd];
                      puVar1[0xe] = (uint)bVar39 *
                                    ((uint)bVar38 * auVar88._56_4_ |
                                    (uint)!bVar38 *
                                    (uint)((byte)(uVar42 >> 0xe) & 1) * auVar87._56_4_) |
                                    (uint)!bVar39 * puVar1[0xe];
                      puVar1[0xf] = (uint)(bVar46 >> 7) *
                                    ((uint)bVar41 * auVar88._60_4_ |
                                    (uint)!bVar41 * (uint)(byte)(uVar42 >> 0xf) * auVar87._60_4_) |
                                    (uint)!(bool)(bVar46 >> 7) * puVar1[0xf];
                      uVar69 = uVar69 + 0x10;
                    } while ((lVar52 + 0xfU & 0xfffffffffffffff0) != uVar69);
                  }
                  lVar70 = lVar70 + 1;
                } while (lVar70 != lVar49);
                return;
              }
              goto LAB_00129690;
            }
            goto LAB_00129674;
          }
        }
        else {
          if (gVar4 != GGML_TYPE_BF16) goto LAB_00129149;
          cVar47 = ggml_is_contiguous_1(pgVar59);
          if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(pgVar58), cVar47 != '\0')) &&
             (cVar47 = ggml_are_same_shape(pgVar59,pgVar58), cVar47 != '\0')) {
            if (pgVar58->nb[0] == 2) {
              if (pgVar59->nb[0] == 2) {
                lVar55 = pgVar59->ne[1];
                lVar71 = pgVar59->ne[2];
                sVar5 = pgVar59->nb[1];
                sVar6 = pgVar59->nb[2];
                sVar7 = pgVar59->nb[3];
                lVar52 = pgVar58->ne[0];
                sVar8 = pgVar58->nb[1];
                sVar9 = pgVar58->nb[2];
                sVar10 = pgVar58->nb[3];
                gVar2 = dst->type;
                iVar73 = *(int *)&dst->field_0x4;
                lVar48 = ggml_nrows(pgVar59);
                lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                lVar70 = (int)gVar2 * lVar49;
                lVar49 = lVar49 + lVar70;
                if (lVar48 <= lVar49) {
                  lVar49 = lVar48;
                }
                if (lVar49 <= lVar70) {
                  return;
                }
                lVar71 = lVar71 * lVar55;
                pvVar11 = pgVar58->data;
                pvVar12 = pgVar59->data;
                auVar97 = ZEXT816(0) << 0x40;
                do {
                  lVar48 = lVar70 / lVar71;
                  lVar54 = lVar70 % lVar71;
                  lVar50 = lVar54 / lVar55;
                  lVar54 = lVar54 % lVar55;
                  if (0 < lVar52) {
                    lVar51 = 0;
                    do {
                      uVar56 = *(ushort *)
                                ((long)pvVar12 +
                                lVar51 * 2 + lVar50 * sVar6 + lVar54 * sVar5 + lVar48 * sVar7);
                      auVar95 = ZEXT216(uVar56) << 0x10;
                      uVar57 = vcmpss_avx512f(auVar95,auVar97,1);
                      uVar43 = vcmpss_avx512f(auVar97,auVar95,1);
                      bVar44 = (bool)((byte)uVar43 & 1);
                      iVar73 = (uint)bVar44 * 0x3f800000 +
                               (uint)!bVar44 * (uint)((byte)uVar57 & 1) * -0x40800000;
                      uVar57 = vcmpss_avx512f(ZEXT216(uVar56) << 0x10,auVar97,0xc);
                      if ((uint)((byte)uVar57 & 1) * 0x3f800000 < 0x7f800001) {
                        uVar56 = (ushort)((uint)(iVar73 + 0x7fff) >> 0x10);
                      }
                      else {
                        uVar56 = (ushort)((uint)iVar73 >> 0x10) | 0x40;
                      }
                      *(ushort *)
                       ((long)pvVar11 +
                       lVar51 * 2 + lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) = uVar56;
                      lVar51 = lVar51 + 1;
                    } while (lVar52 != lVar51);
                  }
                  lVar70 = lVar70 + 1;
                } while (lVar70 != lVar49);
                return;
              }
              goto LAB_00129690;
            }
            goto LAB_00129674;
          }
        }
      }
      else {
LAB_00129149:
        if ((gVar2 != GGML_TYPE_F16) || (pgVar58->type != GGML_TYPE_F32)) {
          ggml_compute_forward_sgn_cold_1();
          pgVar60 = pgVar59->src[0];
          gVar2 = pgVar60->type;
          if ((gVar2 == GGML_TYPE_F32) && (pgVar59->type == GGML_TYPE_F32)) {
            cVar47 = ggml_is_contiguous_1(pgVar60);
            if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(pgVar59), cVar47 != '\0')) &&
               (cVar47 = ggml_are_same_shape(pgVar60,pgVar59), cVar47 != '\0')) {
              if (pgVar59->nb[0] != 4) goto LAB_00129f0e;
              if (pgVar60->nb[0] == 4) {
                lVar55 = pgVar60->ne[1];
                lVar71 = pgVar60->ne[2];
                sVar5 = pgVar60->nb[1];
                sVar6 = pgVar60->nb[2];
                sVar7 = pgVar60->nb[3];
                lVar52 = pgVar59->ne[0];
                sVar8 = pgVar59->nb[1];
                sVar9 = pgVar59->nb[2];
                sVar10 = pgVar59->nb[3];
                gVar2 = pgVar58->type;
                iVar73 = *(int *)&pgVar58->field_0x4;
                lVar48 = ggml_nrows(pgVar60);
                lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                lVar70 = (int)gVar2 * lVar49;
                lVar49 = lVar49 + lVar70;
                if (lVar48 <= lVar49) {
                  lVar49 = lVar48;
                }
                if (lVar49 <= lVar70) {
                  return;
                }
                lVar71 = lVar71 * lVar55;
                pvVar11 = pgVar59->data;
                pvVar12 = pgVar60->data;
                do {
                  lVar48 = lVar70 / lVar71;
                  lVar54 = lVar70 % lVar71;
                  lVar50 = lVar54 / lVar55;
                  lVar54 = lVar54 % lVar55;
                  if (0 < lVar52) {
                    lVar51 = 0;
                    do {
                      *(uint *)((long)pvVar11 +
                               lVar51 * 4 + lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) =
                           *(uint *)((long)pvVar12 +
                                    lVar51 * 4 + lVar50 * sVar6 + lVar54 * sVar5 + lVar48 * sVar7) ^
                           0x80000000;
                      lVar51 = lVar51 + 1;
                    } while (lVar52 != lVar51);
                  }
                  lVar70 = lVar70 + 1;
                } while (lVar70 != lVar49);
                return;
              }
LAB_00129f2a:
              pcVar53 = "nb00 == sizeof(src0_t)";
              uVar57 = 0x56;
              goto LAB_00129f44;
            }
          }
          else if ((gVar2 == GGML_TYPE_F16) && (pgVar59->type == GGML_TYPE_F16)) {
            cVar47 = ggml_is_contiguous_1(pgVar60);
            if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(pgVar59), cVar47 != '\0')) &&
               (cVar47 = ggml_are_same_shape(pgVar60,pgVar59), cVar47 != '\0')) {
              if (pgVar59->nb[0] == 2) {
                if (pgVar60->nb[0] == 2) {
                  lVar55 = pgVar60->ne[1];
                  lVar71 = pgVar60->ne[2];
                  sVar5 = pgVar60->nb[1];
                  sVar6 = pgVar60->nb[2];
                  sVar7 = pgVar60->nb[3];
                  lVar52 = pgVar59->ne[0];
                  gVar2 = pgVar58->type;
                  iVar73 = *(int *)&pgVar58->field_0x4;
                  lVar48 = ggml_nrows();
                  lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                  lVar70 = (int)gVar2 * lVar49;
                  lVar49 = lVar49 + lVar70;
                  if (lVar48 <= lVar49) {
                    lVar49 = lVar48;
                  }
                  if (lVar49 <= lVar70) {
                    return;
                  }
                  lVar71 = lVar71 * lVar55;
                  auVar94._8_4_ = 0x80000000;
                  auVar94._0_8_ = 0x8000000080000000;
                  auVar94._12_4_ = 0x80000000;
                  do {
                    lVar48 = lVar70 % lVar71;
                    if (0 < lVar52) {
                      lVar50 = 0;
                      do {
                        auVar97 = vcvtps2ph_f16c(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                  (ulong)*(ushort *)
                                                                          ((long)pgVar60->data +
                                                                          lVar50 * 2 +
                                                                          (lVar48 / lVar55) * sVar6
                                                                          + (lVar48 % lVar55) *
                                                                            sVar5 + (lVar70 / lVar71
                                                                                    ) * sVar7) * 4))
                                                 ^ auVar94,0);
                        vpextrw_avx(auVar97,0);
                        lVar50 = lVar50 + 1;
                      } while (lVar52 != lVar50);
                    }
                    lVar70 = lVar70 + 1;
                  } while (lVar70 != lVar49);
                  return;
                }
                goto LAB_00129f2a;
              }
              goto LAB_00129f0e;
            }
          }
          else if (gVar2 == GGML_TYPE_BF16) {
            gVar4 = pgVar59->type;
            in_RCX = (ulong)gVar4;
            if (gVar4 == GGML_TYPE_F32) {
              cVar47 = ggml_is_contiguous_1(pgVar60);
              if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(pgVar59), cVar47 != '\0')) &&
                 (cVar47 = ggml_are_same_shape(pgVar60,pgVar59), cVar47 != '\0')) {
                if (pgVar59->nb[0] == 4) {
                  if (pgVar60->nb[0] == 2) {
                    lVar55 = pgVar60->ne[1];
                    lVar71 = pgVar60->ne[2];
                    sVar5 = pgVar60->nb[1];
                    sVar6 = pgVar60->nb[2];
                    sVar7 = pgVar60->nb[3];
                    lVar52 = pgVar59->ne[0];
                    sVar8 = pgVar59->nb[1];
                    sVar9 = pgVar59->nb[2];
                    sVar10 = pgVar59->nb[3];
                    gVar2 = pgVar58->type;
                    iVar73 = *(int *)&pgVar58->field_0x4;
                    lVar48 = ggml_nrows(pgVar60);
                    lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                    lVar70 = (int)gVar2 * lVar49;
                    lVar49 = lVar49 + lVar70;
                    if (lVar48 <= lVar49) {
                      lVar49 = lVar48;
                    }
                    if (lVar49 <= lVar70) {
                      return;
                    }
                    lVar71 = lVar71 * lVar55;
                    pvVar11 = pgVar59->data;
                    pvVar12 = pgVar60->data;
                    auVar89 = vpbroadcastq_avx512f();
                    auVar85 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                    auVar86 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                    auVar87 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
                    do {
                      lVar48 = lVar70 / lVar71;
                      lVar54 = lVar70 % lVar71;
                      lVar50 = lVar54 / lVar55;
                      lVar54 = lVar54 % lVar55;
                      if (0 < lVar52) {
                        uVar69 = 0;
                        do {
                          auVar88 = vpbroadcastq_avx512f();
                          auVar82 = vporq_avx512f(auVar88,auVar85);
                          auVar88 = vporq_avx512f(auVar88,auVar86);
                          uVar57 = vpcmpuq_avx512f(auVar88,auVar89,2);
                          bVar45 = (byte)uVar57;
                          uVar57 = vpcmpuq_avx512f(auVar82,auVar89,2);
                          bVar46 = (byte)uVar57;
                          uVar56 = CONCAT11(bVar46,bVar45);
                          auVar81 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                        ((long)pvVar12 +
                                                        uVar69 * 2 +
                                                        lVar50 * sVar6 +
                                                        lVar54 * sVar5 + lVar48 * sVar7));
                          auVar75._2_2_ = (ushort)((byte)(uVar56 >> 1) & 1) * auVar81._2_2_;
                          auVar75._0_2_ = (ushort)(bVar45 & 1) * auVar81._0_2_;
                          auVar75._4_2_ = (ushort)((byte)(uVar56 >> 2) & 1) * auVar81._4_2_;
                          auVar75._6_2_ = (ushort)((byte)(uVar56 >> 3) & 1) * auVar81._6_2_;
                          auVar75._8_2_ = (ushort)((byte)(uVar56 >> 4) & 1) * auVar81._8_2_;
                          auVar75._10_2_ = (ushort)((byte)(uVar56 >> 5) & 1) * auVar81._10_2_;
                          auVar75._12_2_ = (ushort)((byte)(uVar56 >> 6) & 1) * auVar81._12_2_;
                          auVar75._14_2_ = (ushort)((byte)(uVar56 >> 7) & 1) * auVar81._14_2_;
                          auVar75._16_2_ = (ushort)(bVar46 & 1) * auVar81._16_2_;
                          auVar75._18_2_ = (ushort)(bVar46 >> 1 & 1) * auVar81._18_2_;
                          auVar75._20_2_ = (ushort)(bVar46 >> 2 & 1) * auVar81._20_2_;
                          auVar75._22_2_ = (ushort)(bVar46 >> 3 & 1) * auVar81._22_2_;
                          auVar75._24_2_ = (ushort)(bVar46 >> 4 & 1) * auVar81._24_2_;
                          auVar75._26_2_ = (ushort)(bVar46 >> 5 & 1) * auVar81._26_2_;
                          auVar75._28_2_ = (ushort)(bVar46 >> 6 & 1) * auVar81._28_2_;
                          auVar75._30_2_ = (ushort)(bVar46 >> 7) * auVar81._30_2_;
                          auVar88 = vpmovzxwd_avx512f(auVar75);
                          auVar88 = vpslld_avx512f(auVar88,0x10);
                          auVar88 = vpxord_avx512f(auVar88,auVar87);
                          puVar1 = (uint *)((long)pvVar11 +
                                           uVar69 * 4 +
                                           lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10);
                          bVar44 = (bool)((byte)(uVar56 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar56 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar56 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar56 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar56 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar56 >> 6) & 1);
                          bVar21 = (bool)((byte)(uVar56 >> 7) & 1);
                          bVar25 = (bool)(bVar46 >> 1 & 1);
                          bVar28 = (bool)(bVar46 >> 2 & 1);
                          bVar31 = (bool)(bVar46 >> 3 & 1);
                          bVar34 = (bool)(bVar46 >> 4 & 1);
                          bVar37 = (bool)(bVar46 >> 5 & 1);
                          bVar40 = (bool)(bVar46 >> 6 & 1);
                          *puVar1 = (uint)(bVar45 & 1) * auVar88._0_4_ |
                                    (uint)!(bool)(bVar45 & 1) * *puVar1;
                          puVar1[1] = (uint)bVar44 * auVar88._4_4_ | (uint)!bVar44 * puVar1[1];
                          puVar1[2] = (uint)bVar14 * auVar88._8_4_ | (uint)!bVar14 * puVar1[2];
                          puVar1[3] = (uint)bVar15 * auVar88._12_4_ | (uint)!bVar15 * puVar1[3];
                          puVar1[4] = (uint)bVar16 * auVar88._16_4_ | (uint)!bVar16 * puVar1[4];
                          puVar1[5] = (uint)bVar17 * auVar88._20_4_ | (uint)!bVar17 * puVar1[5];
                          puVar1[6] = (uint)bVar18 * auVar88._24_4_ | (uint)!bVar18 * puVar1[6];
                          puVar1[7] = (uint)bVar21 * auVar88._28_4_ | (uint)!bVar21 * puVar1[7];
                          puVar1[8] = (uint)(bVar46 & 1) * auVar88._32_4_ |
                                      (uint)!(bool)(bVar46 & 1) * puVar1[8];
                          puVar1[9] = (uint)bVar25 * auVar88._36_4_ | (uint)!bVar25 * puVar1[9];
                          puVar1[10] = (uint)bVar28 * auVar88._40_4_ | (uint)!bVar28 * puVar1[10];
                          puVar1[0xb] = (uint)bVar31 * auVar88._44_4_ | (uint)!bVar31 * puVar1[0xb];
                          puVar1[0xc] = (uint)bVar34 * auVar88._48_4_ | (uint)!bVar34 * puVar1[0xc];
                          puVar1[0xd] = (uint)bVar37 * auVar88._52_4_ | (uint)!bVar37 * puVar1[0xd];
                          puVar1[0xe] = (uint)bVar40 * auVar88._56_4_ | (uint)!bVar40 * puVar1[0xe];
                          puVar1[0xf] = (uint)(bVar46 >> 7) * auVar88._60_4_ |
                                        (uint)!(bool)(bVar46 >> 7) * puVar1[0xf];
                          uVar69 = uVar69 + 0x10;
                        } while ((lVar52 + 0xfU & 0xfffffffffffffff0) != uVar69);
                      }
                      lVar70 = lVar70 + 1;
                    } while (lVar70 != lVar49);
                    return;
                  }
                  goto LAB_00129f2a;
                }
                goto LAB_00129f0e;
              }
            }
            else {
              if (gVar4 != GGML_TYPE_BF16) goto LAB_00129a30;
              cVar47 = ggml_is_contiguous_1(pgVar60);
              if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(pgVar59), cVar47 != '\0')) &&
                 (cVar47 = ggml_are_same_shape(pgVar60,pgVar59), cVar47 != '\0')) {
                if (pgVar59->nb[0] == 2) {
                  if (pgVar60->nb[0] == 2) {
                    lVar55 = pgVar60->ne[1];
                    lVar71 = pgVar60->ne[2];
                    sVar5 = pgVar60->nb[1];
                    sVar6 = pgVar60->nb[2];
                    sVar7 = pgVar60->nb[3];
                    lVar52 = pgVar59->ne[0];
                    sVar8 = pgVar59->nb[1];
                    sVar9 = pgVar59->nb[2];
                    sVar10 = pgVar59->nb[3];
                    gVar2 = pgVar58->type;
                    iVar73 = *(int *)&pgVar58->field_0x4;
                    lVar48 = ggml_nrows(pgVar60);
                    lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                    lVar70 = (int)gVar2 * lVar49;
                    lVar49 = lVar49 + lVar70;
                    if (lVar48 <= lVar49) {
                      lVar49 = lVar48;
                    }
                    if (lVar49 <= lVar70) {
                      return;
                    }
                    lVar71 = lVar71 * lVar55;
                    pvVar11 = pgVar59->data;
                    pvVar12 = pgVar60->data;
                    do {
                      lVar48 = lVar70 / lVar71;
                      lVar54 = lVar70 % lVar71;
                      lVar50 = lVar54 / lVar55;
                      lVar54 = lVar54 % lVar55;
                      if (0 < lVar52) {
                        lVar51 = 0;
                        do {
                          uVar68 = (uint)*(ushort *)
                                          ((long)pvVar12 +
                                          lVar51 * 2 +
                                          lVar50 * sVar6 + lVar54 * sVar5 + lVar48 * sVar7) *
                                   0x10000;
                          if ((uVar68 & 0x7fff0000) < 0x7f800001) {
                            uVar56 = (ushort)(uVar68 + 0x80007fff +
                                              (uVar68 + 0x80000000 >> 0x10 & 1) >> 0x10);
                          }
                          else {
                            uVar56 = (ushort)(uVar68 + 0x80000000 >> 0x10) | 0x40;
                          }
                          *(ushort *)
                           ((long)pvVar11 +
                           lVar51 * 2 + lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) = uVar56;
                          lVar51 = lVar51 + 1;
                        } while (lVar52 != lVar51);
                      }
                      lVar70 = lVar70 + 1;
                    } while (lVar70 != lVar49);
                    return;
                  }
                  goto LAB_00129f2a;
                }
                goto LAB_00129f0e;
              }
            }
          }
          else {
LAB_00129a30:
            if ((gVar2 != GGML_TYPE_F16) || (pgVar59->type != GGML_TYPE_F32)) {
              ggml_compute_forward_neg_cold_1();
              pgVar58 = pgVar60->src[0];
              gVar2 = pgVar58->type;
              if ((gVar2 == GGML_TYPE_F32) && (pgVar60->type == GGML_TYPE_F32)) {
                cVar47 = ggml_is_contiguous_1(pgVar58);
                if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(pgVar60), cVar47 != '\0'))
                   && (cVar47 = ggml_are_same_shape(pgVar58,pgVar60), cVar47 != '\0')) {
                  if (pgVar60->nb[0] != 4) goto LAB_0012a7c9;
                  if (pgVar58->nb[0] == 4) {
                    lVar55 = pgVar58->ne[1];
                    lVar71 = pgVar58->ne[2];
                    sVar5 = pgVar58->nb[1];
                    sVar6 = pgVar58->nb[2];
                    sVar7 = pgVar58->nb[3];
                    lVar52 = pgVar60->ne[0];
                    sVar8 = pgVar60->nb[1];
                    sVar9 = pgVar60->nb[2];
                    sVar10 = pgVar60->nb[3];
                    gVar2 = pgVar59->type;
                    iVar73 = *(int *)&pgVar59->field_0x4;
                    lVar48 = ggml_nrows(pgVar58);
                    lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                    lVar70 = (int)gVar2 * lVar49;
                    lVar49 = lVar49 + lVar70;
                    if (lVar48 <= lVar49) {
                      lVar49 = lVar48;
                    }
                    if (lVar49 <= lVar70) {
                      return;
                    }
                    lVar71 = lVar71 * lVar55;
                    pvVar11 = pgVar60->data;
                    pvVar12 = pgVar58->data;
                    do {
                      lVar48 = lVar70 / lVar71;
                      lVar54 = lVar70 % lVar71;
                      lVar50 = lVar54 / lVar55;
                      lVar54 = lVar54 % lVar55;
                      if (0 < lVar52) {
                        lVar51 = 0;
                        do {
                          uVar57 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                                  ZEXT416(*(uint *)((long)pvVar12 +
                                                                   lVar51 * 4 +
                                                                   lVar50 * sVar6 +
                                                                   lVar54 * sVar5 + lVar48 * sVar7))
                                                  ,1);
                          *(uint *)((long)pvVar11 +
                                   lVar51 * 4 + lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) =
                               (uint)((byte)uVar57 & 1) * 0x3f800000;
                          lVar51 = lVar51 + 1;
                        } while (lVar52 != lVar51);
                      }
                      lVar70 = lVar70 + 1;
                    } while (lVar70 != lVar49);
                    return;
                  }
LAB_0012a7e5:
                  pcVar53 = "nb00 == sizeof(src0_t)";
                  uVar57 = 0x56;
                  goto LAB_0012a7ff;
                }
              }
              else if ((gVar2 == GGML_TYPE_F16) && (pgVar60->type == GGML_TYPE_F16)) {
                cVar47 = ggml_is_contiguous_1(pgVar58);
                if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(pgVar60), cVar47 != '\0'))
                   && (cVar47 = ggml_are_same_shape(pgVar58,pgVar60), cVar47 != '\0')) {
                  if (pgVar60->nb[0] == 2) {
                    if (pgVar58->nb[0] == 2) {
                      lVar55 = pgVar58->ne[1];
                      lVar71 = pgVar58->ne[2];
                      sVar5 = pgVar58->nb[1];
                      sVar6 = pgVar58->nb[2];
                      sVar7 = pgVar58->nb[3];
                      lVar52 = pgVar60->ne[0];
                      gVar2 = pgVar59->type;
                      iVar73 = *(int *)&pgVar59->field_0x4;
                      lVar48 = ggml_nrows();
                      lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                      lVar70 = (int)gVar2 * lVar49;
                      lVar49 = lVar49 + lVar70;
                      if (lVar48 <= lVar49) {
                        lVar49 = lVar48;
                      }
                      if (lVar49 <= lVar70) {
                        return;
                      }
                      lVar71 = lVar71 * lVar55;
                      do {
                        lVar48 = lVar70 % lVar71;
                        if (0 < lVar52) {
                          lVar50 = 0;
                          do {
                            uVar57 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                                    ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                     (ulong)*(ushort *)
                                                                             ((long)pgVar58->data +
                                                                             lVar50 * 2 +
                                                                             (lVar48 / lVar55) *
                                                                             sVar6 + (lVar48 % 
                                                  lVar55) * sVar5 + (lVar70 / lVar71) * sVar7) * 4))
                                                  ,1);
                            auVar97 = vcvtps2ph_f16c(ZEXT416((uint)((byte)uVar57 & 1) * 0x3f800000),
                                                     0);
                            vpextrw_avx(auVar97,0);
                            lVar50 = lVar50 + 1;
                          } while (lVar52 != lVar50);
                        }
                        lVar70 = lVar70 + 1;
                      } while (lVar70 != lVar49);
                      return;
                    }
                    goto LAB_0012a7e5;
                  }
                  goto LAB_0012a7c9;
                }
              }
              else if (gVar2 == GGML_TYPE_BF16) {
                gVar4 = pgVar60->type;
                in_RCX = (ulong)gVar4;
                if (gVar4 == GGML_TYPE_F32) {
                  cVar47 = ggml_is_contiguous_1(pgVar58);
                  if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(pgVar60), cVar47 != '\0'))
                     && (cVar47 = ggml_are_same_shape(pgVar58,pgVar60), cVar47 != '\0')) {
                    if (pgVar60->nb[0] == 4) {
                      if (pgVar58->nb[0] == 2) {
                        lVar55 = pgVar58->ne[1];
                        lVar71 = pgVar58->ne[2];
                        sVar5 = pgVar58->nb[1];
                        sVar6 = pgVar58->nb[2];
                        sVar7 = pgVar58->nb[3];
                        lVar52 = pgVar60->ne[0];
                        sVar8 = pgVar60->nb[1];
                        sVar9 = pgVar60->nb[2];
                        sVar10 = pgVar60->nb[3];
                        gVar2 = pgVar59->type;
                        iVar73 = *(int *)&pgVar59->field_0x4;
                        lVar48 = ggml_nrows(pgVar58);
                        lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                        lVar70 = (int)gVar2 * lVar49;
                        lVar49 = lVar49 + lVar70;
                        if (lVar48 <= lVar49) {
                          lVar49 = lVar48;
                        }
                        if (lVar49 <= lVar70) {
                          return;
                        }
                        lVar71 = lVar71 * lVar55;
                        pvVar11 = pgVar60->data;
                        pvVar12 = pgVar58->data;
                        auVar89 = vpbroadcastq_avx512f();
                        auVar85 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                        auVar86 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                        do {
                          lVar48 = lVar70 / lVar71;
                          lVar54 = lVar70 % lVar71;
                          lVar50 = lVar54 / lVar55;
                          lVar54 = lVar54 % lVar55;
                          if (0 < lVar52) {
                            uVar69 = 0;
                            do {
                              auVar87 = vpbroadcastq_avx512f();
                              auVar88 = vporq_avx512f(auVar87,auVar85);
                              auVar87 = vporq_avx512f(auVar87,auVar86);
                              uVar57 = vpcmpuq_avx512f(auVar87,auVar89,2);
                              bVar45 = (byte)uVar57;
                              uVar57 = vpcmpuq_avx512f(auVar88,auVar89,2);
                              bVar46 = (byte)uVar57;
                              uVar56 = CONCAT11(bVar46,bVar45);
                              auVar81 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                            ((long)pvVar12 +
                                                            uVar69 * 2 +
                                                            lVar50 * sVar6 +
                                                            lVar54 * sVar5 + lVar48 * sVar7));
                              auVar76._2_2_ = (ushort)((byte)(uVar56 >> 1) & 1) * auVar81._2_2_;
                              auVar76._0_2_ = (ushort)(bVar45 & 1) * auVar81._0_2_;
                              auVar76._4_2_ = (ushort)((byte)(uVar56 >> 2) & 1) * auVar81._4_2_;
                              auVar76._6_2_ = (ushort)((byte)(uVar56 >> 3) & 1) * auVar81._6_2_;
                              auVar76._8_2_ = (ushort)((byte)(uVar56 >> 4) & 1) * auVar81._8_2_;
                              auVar76._10_2_ = (ushort)((byte)(uVar56 >> 5) & 1) * auVar81._10_2_;
                              auVar76._12_2_ = (ushort)((byte)(uVar56 >> 6) & 1) * auVar81._12_2_;
                              auVar76._14_2_ = (ushort)((byte)(uVar56 >> 7) & 1) * auVar81._14_2_;
                              auVar76._16_2_ = (ushort)(bVar46 & 1) * auVar81._16_2_;
                              auVar76._18_2_ = (ushort)(bVar46 >> 1 & 1) * auVar81._18_2_;
                              auVar76._20_2_ = (ushort)(bVar46 >> 2 & 1) * auVar81._20_2_;
                              auVar76._22_2_ = (ushort)(bVar46 >> 3 & 1) * auVar81._22_2_;
                              auVar76._24_2_ = (ushort)(bVar46 >> 4 & 1) * auVar81._24_2_;
                              auVar76._26_2_ = (ushort)(bVar46 >> 5 & 1) * auVar81._26_2_;
                              auVar76._28_2_ = (ushort)(bVar46 >> 6 & 1) * auVar81._28_2_;
                              auVar76._30_2_ = (ushort)(bVar46 >> 7) * auVar81._30_2_;
                              auVar87 = vpmovzxwd_avx512f(auVar76);
                              auVar87 = vpslld_avx512f(auVar87,0x10);
                              uVar67 = vcmpps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar87,1);
                              auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                              puVar1 = (uint *)((long)pvVar11 +
                                               uVar69 * 4 +
                                               lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10);
                              bVar44 = (bool)((byte)(uVar56 >> 1) & 1);
                              bVar14 = (bool)((byte)(uVar56 >> 2) & 1);
                              bVar15 = (bool)((byte)(uVar56 >> 3) & 1);
                              bVar16 = (bool)((byte)(uVar56 >> 4) & 1);
                              bVar17 = (bool)((byte)(uVar56 >> 5) & 1);
                              bVar18 = (bool)((byte)(uVar56 >> 6) & 1);
                              bVar21 = (bool)((byte)(uVar56 >> 7) & 1);
                              bVar25 = (bool)(bVar46 >> 1 & 1);
                              bVar28 = (bool)(bVar46 >> 2 & 1);
                              bVar31 = (bool)(bVar46 >> 3 & 1);
                              bVar34 = (bool)(bVar46 >> 4 & 1);
                              bVar37 = (bool)(bVar46 >> 5 & 1);
                              bVar40 = (bool)(bVar46 >> 6 & 1);
                              *puVar1 = (uint)(bVar45 & 1) *
                                        (uint)((byte)uVar67 & 1) * auVar87._0_4_ |
                                        (uint)!(bool)(bVar45 & 1) * *puVar1;
                              puVar1[1] = (uint)bVar44 *
                                          (uint)((byte)(uVar67 >> 1) & 1) * auVar87._4_4_ |
                                          (uint)!bVar44 * puVar1[1];
                              puVar1[2] = (uint)bVar14 *
                                          (uint)((byte)(uVar67 >> 2) & 1) * auVar87._8_4_ |
                                          (uint)!bVar14 * puVar1[2];
                              puVar1[3] = (uint)bVar15 *
                                          (uint)((byte)(uVar67 >> 3) & 1) * auVar87._12_4_ |
                                          (uint)!bVar15 * puVar1[3];
                              puVar1[4] = (uint)bVar16 *
                                          (uint)((byte)(uVar67 >> 4) & 1) * auVar87._16_4_ |
                                          (uint)!bVar16 * puVar1[4];
                              puVar1[5] = (uint)bVar17 *
                                          (uint)((byte)(uVar67 >> 5) & 1) * auVar87._20_4_ |
                                          (uint)!bVar17 * puVar1[5];
                              puVar1[6] = (uint)bVar18 *
                                          (uint)((byte)(uVar67 >> 6) & 1) * auVar87._24_4_ |
                                          (uint)!bVar18 * puVar1[6];
                              puVar1[7] = (uint)bVar21 *
                                          (uint)((byte)(uVar67 >> 7) & 1) * auVar87._28_4_ |
                                          (uint)!bVar21 * puVar1[7];
                              puVar1[8] = (uint)(bVar46 & 1) *
                                          (uint)((byte)(uVar67 >> 8) & 1) * auVar87._32_4_ |
                                          (uint)!(bool)(bVar46 & 1) * puVar1[8];
                              puVar1[9] = (uint)bVar25 *
                                          (uint)((byte)(uVar67 >> 9) & 1) * auVar87._36_4_ |
                                          (uint)!bVar25 * puVar1[9];
                              puVar1[10] = (uint)bVar28 *
                                           (uint)((byte)(uVar67 >> 10) & 1) * auVar87._40_4_ |
                                           (uint)!bVar28 * puVar1[10];
                              puVar1[0xb] = (uint)bVar31 *
                                            (uint)((byte)(uVar67 >> 0xb) & 1) * auVar87._44_4_ |
                                            (uint)!bVar31 * puVar1[0xb];
                              puVar1[0xc] = (uint)bVar34 *
                                            (uint)((byte)(uVar67 >> 0xc) & 1) * auVar87._48_4_ |
                                            (uint)!bVar34 * puVar1[0xc];
                              puVar1[0xd] = (uint)bVar37 *
                                            (uint)((byte)(uVar67 >> 0xd) & 1) * auVar87._52_4_ |
                                            (uint)!bVar37 * puVar1[0xd];
                              puVar1[0xe] = (uint)bVar40 *
                                            (uint)((byte)(uVar67 >> 0xe) & 1) * auVar87._56_4_ |
                                            (uint)!bVar40 * puVar1[0xe];
                              puVar1[0xf] = (uint)(bVar46 >> 7) *
                                            (uint)(byte)(uVar67 >> 0xf) * auVar87._60_4_ |
                                            (uint)!(bool)(bVar46 >> 7) * puVar1[0xf];
                              uVar69 = uVar69 + 0x10;
                            } while ((lVar52 + 0xfU & 0xfffffffffffffff0) != uVar69);
                          }
                          lVar70 = lVar70 + 1;
                        } while (lVar70 != lVar49);
                        return;
                      }
                      goto LAB_0012a7e5;
                    }
                    goto LAB_0012a7c9;
                  }
                }
                else {
                  if (gVar4 != GGML_TYPE_BF16) goto LAB_0012a2db;
                  cVar47 = ggml_is_contiguous_1(pgVar58);
                  if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(pgVar60), cVar47 != '\0'))
                     && (cVar47 = ggml_are_same_shape(pgVar58,pgVar60), cVar47 != '\0')) {
                    if (pgVar60->nb[0] == 2) {
                      if (pgVar58->nb[0] == 2) {
                        lVar55 = pgVar58->ne[1];
                        lVar71 = pgVar58->ne[2];
                        sVar5 = pgVar58->nb[1];
                        sVar6 = pgVar58->nb[2];
                        sVar7 = pgVar58->nb[3];
                        lVar52 = pgVar60->ne[0];
                        sVar8 = pgVar60->nb[1];
                        sVar9 = pgVar60->nb[2];
                        sVar10 = pgVar60->nb[3];
                        gVar2 = pgVar59->type;
                        iVar73 = *(int *)&pgVar59->field_0x4;
                        lVar48 = ggml_nrows(pgVar58);
                        lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                        lVar70 = (int)gVar2 * lVar49;
                        lVar49 = lVar49 + lVar70;
                        if (lVar48 <= lVar49) {
                          lVar49 = lVar48;
                        }
                        if (lVar49 <= lVar70) {
                          return;
                        }
                        lVar71 = lVar71 * lVar55;
                        pvVar11 = pgVar60->data;
                        pvVar12 = pgVar58->data;
                        do {
                          lVar48 = lVar70 / lVar71;
                          lVar54 = lVar70 % lVar71;
                          lVar50 = lVar54 / lVar55;
                          lVar54 = lVar54 % lVar55;
                          if (0 < lVar52) {
                            lVar51 = 0;
                            do {
                              uVar57 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                                      ZEXT216(*(ushort *)
                                                               ((long)pvVar12 +
                                                               lVar51 * 2 +
                                                               lVar50 * sVar6 +
                                                               lVar54 * sVar5 + lVar48 * sVar7)) <<
                                                      0x10,1);
                              uVar68 = (uint)((byte)uVar57 & 1) * 0x3f800000;
                              if (uVar68 < 0x7f800001) {
                                uVar56 = (ushort)(uVar68 + 0x7fff >> 0x10);
                              }
                              else {
                                uVar56 = (ushort)(uVar68 >> 0x10) | 0x40;
                              }
                              *(ushort *)
                               ((long)pvVar11 +
                               lVar51 * 2 + lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) =
                                   uVar56;
                              lVar51 = lVar51 + 1;
                            } while (lVar52 != lVar51);
                          }
                          lVar70 = lVar70 + 1;
                        } while (lVar70 != lVar49);
                        return;
                      }
                      goto LAB_0012a7e5;
                    }
                    goto LAB_0012a7c9;
                  }
                }
              }
              else {
LAB_0012a2db:
                if ((gVar2 != GGML_TYPE_F16) || (pgVar60->type != GGML_TYPE_F32)) {
                  ggml_compute_forward_step_cold_1();
                  pgVar59 = pgVar58->src[0];
                  gVar2 = pgVar59->type;
                  if ((gVar2 == GGML_TYPE_F32) && (pgVar58->type == GGML_TYPE_F32)) {
                    cVar47 = ggml_is_contiguous_1(pgVar59);
                    if (((cVar47 != '\0') &&
                        (cVar47 = ggml_is_contiguous_1(pgVar58), cVar47 != '\0')) &&
                       (cVar47 = ggml_are_same_shape(pgVar59,pgVar58), cVar47 != '\0')) {
                      if (pgVar58->nb[0] != 4) goto LAB_0012b055;
                      if (pgVar59->nb[0] == 4) {
                        lVar55 = pgVar59->ne[1];
                        lVar71 = pgVar59->ne[2];
                        sVar5 = pgVar59->nb[1];
                        sVar6 = pgVar59->nb[2];
                        sVar7 = pgVar59->nb[3];
                        lVar52 = pgVar58->ne[0];
                        sVar8 = pgVar58->nb[1];
                        sVar9 = pgVar58->nb[2];
                        sVar10 = pgVar58->nb[3];
                        gVar2 = pgVar60->type;
                        iVar73 = *(int *)&pgVar60->field_0x4;
                        lVar48 = ggml_nrows(pgVar59);
                        lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                        lVar70 = (int)gVar2 * lVar49;
                        lVar49 = lVar49 + lVar70;
                        if (lVar48 <= lVar49) {
                          lVar49 = lVar48;
                        }
                        if (lVar49 <= lVar70) {
                          return;
                        }
                        lVar71 = lVar71 * lVar55;
                        do {
                          lVar48 = lVar70 / lVar71;
                          lVar54 = lVar70 % lVar71;
                          lVar50 = lVar54 / lVar55;
                          lVar54 = lVar54 % lVar55;
                          if (0 < lVar52) {
                            pvVar11 = pgVar58->data;
                            pvVar12 = pgVar59->data;
                            lVar51 = 0;
                            do {
                              fVar90 = tanhf(*(float *)((long)pvVar12 +
                                                       lVar51 * 4 +
                                                       lVar50 * sVar6 +
                                                       lVar54 * sVar5 + lVar48 * sVar7));
                              *(float *)((long)pvVar11 +
                                        lVar51 * 4 +
                                        lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) = fVar90;
                              lVar51 = lVar51 + 1;
                            } while (lVar52 != lVar51);
                          }
                          lVar70 = lVar70 + 1;
                        } while (lVar70 != lVar49);
                        return;
                      }
LAB_0012b071:
                      pcVar53 = "nb00 == sizeof(src0_t)";
                      uVar57 = 0x56;
                      goto LAB_0012b08b;
                    }
                  }
                  else if ((gVar2 == GGML_TYPE_F16) && (pgVar58->type == GGML_TYPE_F16)) {
                    cVar47 = ggml_is_contiguous_1(pgVar59);
                    if (((cVar47 != '\0') &&
                        (cVar47 = ggml_is_contiguous_1(pgVar58), cVar47 != '\0')) &&
                       (cVar47 = ggml_are_same_shape(pgVar59,pgVar58), cVar47 != '\0')) {
                      if (pgVar58->nb[0] == 2) {
                        if (pgVar59->nb[0] == 2) {
                          lVar55 = pgVar59->ne[1];
                          lVar71 = pgVar59->ne[2];
                          sVar5 = pgVar59->nb[1];
                          sVar6 = pgVar59->nb[2];
                          sVar7 = pgVar59->nb[3];
                          lVar52 = pgVar58->ne[0];
                          gVar2 = pgVar60->type;
                          iVar73 = *(int *)&pgVar60->field_0x4;
                          lVar48 = ggml_nrows(pgVar59);
                          lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                          lVar70 = (int)gVar2 * lVar49;
                          lVar49 = lVar49 + lVar70;
                          if (lVar48 <= lVar49) {
                            lVar49 = lVar48;
                          }
                          if (lVar49 <= lVar70) {
                            return;
                          }
                          lVar71 = lVar71 * lVar55;
                          do {
                            lVar48 = lVar70 % lVar71;
                            if (0 < lVar52) {
                              pvVar11 = pgVar59->data;
                              lVar50 = 0;
                              do {
                                auVar84._0_4_ =
                                     tanhf(*(float *)(&ggml_table_f32_f16 +
                                                     (ulong)*(ushort *)
                                                             ((long)pvVar11 +
                                                             lVar50 * 2 +
                                                             (lVar48 / lVar55) * sVar6 +
                                                             (lVar48 % lVar55) * sVar5 +
                                                             (lVar70 / lVar71) * sVar7) * 4));
                                auVar84._4_60_ = extraout_var;
                                auVar97 = vcvtps2ph_f16c(auVar84._0_16_,0);
                                vpextrw_avx(auVar97,0);
                                lVar50 = lVar50 + 1;
                              } while (lVar52 != lVar50);
                            }
                            lVar70 = lVar70 + 1;
                          } while (lVar70 != lVar49);
                          return;
                        }
                        goto LAB_0012b071;
                      }
                      goto LAB_0012b055;
                    }
                  }
                  else if (gVar2 == GGML_TYPE_BF16) {
                    gVar4 = pgVar58->type;
                    in_RCX = (ulong)gVar4;
                    if (gVar4 == GGML_TYPE_F32) {
                      cVar47 = ggml_is_contiguous_1(pgVar59);
                      if (((cVar47 != '\0') &&
                          (cVar47 = ggml_is_contiguous_1(pgVar58), cVar47 != '\0')) &&
                         (cVar47 = ggml_are_same_shape(pgVar59,pgVar58), cVar47 != '\0')) {
                        if (pgVar58->nb[0] == 4) {
                          if (pgVar59->nb[0] == 2) {
                            lVar55 = pgVar59->ne[1];
                            lVar71 = pgVar59->ne[2];
                            sVar5 = pgVar59->nb[1];
                            sVar6 = pgVar59->nb[2];
                            sVar7 = pgVar59->nb[3];
                            lVar52 = pgVar58->ne[0];
                            sVar8 = pgVar58->nb[1];
                            sVar9 = pgVar58->nb[2];
                            sVar10 = pgVar58->nb[3];
                            gVar2 = pgVar60->type;
                            iVar73 = *(int *)&pgVar60->field_0x4;
                            lVar48 = ggml_nrows(pgVar59);
                            lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                            lVar70 = (int)gVar2 * lVar49;
                            lVar49 = lVar49 + lVar70;
                            if (lVar48 <= lVar49) {
                              lVar49 = lVar48;
                            }
                            if (lVar49 <= lVar70) {
                              return;
                            }
                            lVar71 = lVar71 * lVar55;
                            do {
                              lVar48 = lVar70 / lVar71;
                              lVar54 = lVar70 % lVar71;
                              lVar50 = lVar54 / lVar55;
                              lVar54 = lVar54 % lVar55;
                              if (0 < lVar52) {
                                pvVar11 = pgVar58->data;
                                pvVar12 = pgVar59->data;
                                lVar51 = 0;
                                do {
                                  fVar90 = tanhf((float)((uint)*(ushort *)
                                                                ((long)pvVar12 +
                                                                lVar51 * 2 +
                                                                lVar50 * sVar6 +
                                                                lVar54 * sVar5 + lVar48 * sVar7) <<
                                                        0x10));
                                  *(float *)((long)pvVar11 +
                                            lVar51 * 4 +
                                            lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) =
                                       fVar90;
                                  lVar51 = lVar51 + 1;
                                } while (lVar52 != lVar51);
                              }
                              lVar70 = lVar70 + 1;
                            } while (lVar70 != lVar49);
                            return;
                          }
                          goto LAB_0012b071;
                        }
                        goto LAB_0012b055;
                      }
                    }
                    else {
                      if (gVar4 != GGML_TYPE_BF16) goto LAB_0012abaa;
                      cVar47 = ggml_is_contiguous_1(pgVar59);
                      if (((cVar47 != '\0') &&
                          (cVar47 = ggml_is_contiguous_1(pgVar58), cVar47 != '\0')) &&
                         (cVar47 = ggml_are_same_shape(pgVar59,pgVar58), cVar47 != '\0')) {
                        if (pgVar58->nb[0] == 2) {
                          if (pgVar59->nb[0] == 2) {
                            lVar55 = pgVar59->ne[1];
                            lVar71 = pgVar59->ne[2];
                            sVar5 = pgVar59->nb[1];
                            sVar6 = pgVar59->nb[2];
                            sVar7 = pgVar59->nb[3];
                            lVar52 = pgVar58->ne[0];
                            sVar8 = pgVar58->nb[1];
                            sVar9 = pgVar58->nb[2];
                            sVar10 = pgVar58->nb[3];
                            gVar2 = pgVar60->type;
                            iVar73 = *(int *)&pgVar60->field_0x4;
                            lVar48 = ggml_nrows(pgVar59);
                            lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                            lVar70 = (int)gVar2 * lVar49;
                            lVar49 = lVar49 + lVar70;
                            if (lVar48 <= lVar49) {
                              lVar49 = lVar48;
                            }
                            if (lVar49 <= lVar70) {
                              return;
                            }
                            lVar71 = lVar71 * lVar55;
                            do {
                              lVar48 = lVar70 / lVar71;
                              lVar54 = lVar70 % lVar71;
                              lVar50 = lVar54 / lVar55;
                              lVar54 = lVar54 % lVar55;
                              if (0 < lVar52) {
                                pvVar11 = pgVar58->data;
                                pvVar12 = pgVar59->data;
                                lVar51 = 0;
                                do {
                                  fVar90 = tanhf((float)((uint)*(ushort *)
                                                                ((long)pvVar12 +
                                                                lVar51 * 2 +
                                                                lVar50 * sVar6 +
                                                                lVar54 * sVar5 + lVar48 * sVar7) <<
                                                        0x10));
                                  if ((uint)ABS(fVar90) < 0x7f800001) {
                                    uVar56 = (ushort)((int)fVar90 + 0x7fff +
                                                      ((uint)fVar90 >> 0x10 & 1) >> 0x10);
                                  }
                                  else {
                                    uVar56 = (ushort)((uint)fVar90 >> 0x10) | 0x40;
                                  }
                                  *(ushort *)
                                   ((long)pvVar11 +
                                   lVar51 * 2 + lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) =
                                       uVar56;
                                  lVar51 = lVar51 + 1;
                                } while (lVar52 != lVar51);
                              }
                              lVar70 = lVar70 + 1;
                            } while (lVar70 != lVar49);
                            return;
                          }
                          goto LAB_0012b071;
                        }
                        goto LAB_0012b055;
                      }
                    }
                  }
                  else {
LAB_0012abaa:
                    if ((gVar2 != GGML_TYPE_F16) || (pgVar58->type != GGML_TYPE_F32)) {
                      ggml_compute_forward_tanh_cold_1();
                      pgVar60 = pgVar59->src[0];
                      gVar2 = pgVar60->type;
                      if ((gVar2 == GGML_TYPE_F32) && (pgVar59->type == GGML_TYPE_F32)) {
                        cVar47 = ggml_is_contiguous_1(pgVar60);
                        if (((cVar47 != '\0') &&
                            (cVar47 = ggml_is_contiguous_1(pgVar59), cVar47 != '\0')) &&
                           (cVar47 = ggml_are_same_shape(pgVar60,pgVar59), cVar47 != '\0')) {
                          if (pgVar59->nb[0] != 4) goto LAB_0012b92f;
                          if (pgVar60->nb[0] == 4) {
                            lVar55 = pgVar60->ne[1];
                            lVar71 = pgVar60->ne[2];
                            sVar5 = pgVar60->nb[1];
                            sVar6 = pgVar60->nb[2];
                            sVar7 = pgVar60->nb[3];
                            lVar52 = pgVar59->ne[0];
                            sVar8 = pgVar59->nb[1];
                            sVar9 = pgVar59->nb[2];
                            sVar10 = pgVar59->nb[3];
                            gVar2 = pgVar58->type;
                            iVar73 = *(int *)&pgVar58->field_0x4;
                            lVar48 = ggml_nrows(pgVar60);
                            lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                            lVar70 = (int)gVar2 * lVar49;
                            lVar49 = lVar49 + lVar70;
                            if (lVar48 <= lVar49) {
                              lVar49 = lVar48;
                            }
                            if (lVar49 <= lVar70) {
                              return;
                            }
                            lVar71 = lVar71 * lVar55;
                            do {
                              lVar48 = lVar70 / lVar71;
                              lVar54 = lVar70 % lVar71;
                              lVar50 = lVar54 / lVar55;
                              lVar54 = lVar54 % lVar55;
                              if (0 < lVar52) {
                                pvVar11 = pgVar59->data;
                                pvVar12 = pgVar60->data;
                                lVar51 = 0;
                                do {
                                  fVar90 = *(float *)((long)pvVar12 +
                                                     lVar51 * 4 +
                                                     lVar50 * sVar6 +
                                                     lVar54 * sVar5 + lVar48 * sVar7);
                                  if (fVar90 <= 0.0) {
                                    fVar90 = expm1f(fVar90);
                                  }
                                  *(float *)((long)pvVar11 +
                                            lVar51 * 4 +
                                            lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) =
                                       fVar90;
                                  lVar51 = lVar51 + 1;
                                } while (lVar52 != lVar51);
                              }
                              lVar70 = lVar70 + 1;
                            } while (lVar70 != lVar49);
                            return;
                          }
LAB_0012b94b:
                          pcVar53 = "nb00 == sizeof(src0_t)";
                          uVar57 = 0x56;
                          goto LAB_0012b965;
                        }
                      }
                      else if ((gVar2 == GGML_TYPE_F16) && (pgVar59->type == GGML_TYPE_F16)) {
                        cVar47 = ggml_is_contiguous_1(pgVar60);
                        if (((cVar47 != '\0') &&
                            (cVar47 = ggml_is_contiguous_1(pgVar59), cVar47 != '\0')) &&
                           (cVar47 = ggml_are_same_shape(pgVar60,pgVar59), cVar47 != '\0')) {
                          if (pgVar59->nb[0] == 2) {
                            if (pgVar60->nb[0] == 2) {
                              lVar55 = pgVar60->ne[1];
                              lVar71 = pgVar60->ne[2];
                              sVar5 = pgVar60->nb[1];
                              sVar6 = pgVar60->nb[2];
                              sVar7 = pgVar60->nb[3];
                              lVar52 = pgVar59->ne[0];
                              gVar2 = pgVar58->type;
                              iVar73 = *(int *)&pgVar58->field_0x4;
                              lVar48 = ggml_nrows(pgVar60);
                              lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                              lVar70 = (int)gVar2 * lVar49;
                              lVar49 = lVar49 + lVar70;
                              if (lVar48 <= lVar49) {
                                lVar49 = lVar48;
                              }
                              if (lVar49 <= lVar70) {
                                return;
                              }
                              lVar71 = lVar71 * lVar55;
                              do {
                                lVar48 = lVar70 % lVar71;
                                if (0 < lVar52) {
                                  pvVar11 = pgVar60->data;
                                  lVar50 = 0;
                                  do {
                                    fVar90 = *(float *)(&ggml_table_f32_f16 +
                                                       (ulong)*(ushort *)
                                                               ((long)pvVar11 +
                                                               lVar50 * 2 +
                                                               (lVar48 / lVar55) * sVar6 +
                                                               (lVar48 % lVar55) * sVar5 +
                                                               (lVar70 / lVar71) * sVar7) * 4);
                                    auVar97 = ZEXT416((uint)fVar90);
                                    if (fVar90 <= 0.0) {
                                      auVar83._0_4_ = expm1f(fVar90);
                                      auVar83._4_60_ = extraout_var_00;
                                      auVar97 = auVar83._0_16_;
                                    }
                                    auVar97 = vcvtps2ph_f16c(auVar97,0);
                                    vpextrw_avx(auVar97,0);
                                    lVar50 = lVar50 + 1;
                                  } while (lVar52 != lVar50);
                                }
                                lVar70 = lVar70 + 1;
                              } while (lVar70 != lVar49);
                              return;
                            }
                            goto LAB_0012b94b;
                          }
                          goto LAB_0012b92f;
                        }
                      }
                      else if (gVar2 == GGML_TYPE_BF16) {
                        gVar4 = pgVar59->type;
                        in_RCX = (ulong)gVar4;
                        if (gVar4 == GGML_TYPE_F32) {
                          cVar47 = ggml_is_contiguous_1(pgVar60);
                          if (((cVar47 != '\0') &&
                              (cVar47 = ggml_is_contiguous_1(pgVar59), cVar47 != '\0')) &&
                             (cVar47 = ggml_are_same_shape(pgVar60,pgVar59), cVar47 != '\0')) {
                            if (pgVar59->nb[0] == 4) {
                              if (pgVar60->nb[0] == 2) {
                                lVar55 = pgVar60->ne[1];
                                lVar71 = pgVar60->ne[2];
                                sVar5 = pgVar60->nb[1];
                                sVar6 = pgVar60->nb[2];
                                sVar7 = pgVar60->nb[3];
                                lVar52 = pgVar59->ne[0];
                                sVar8 = pgVar59->nb[1];
                                sVar9 = pgVar59->nb[2];
                                sVar10 = pgVar59->nb[3];
                                gVar2 = pgVar58->type;
                                iVar73 = *(int *)&pgVar58->field_0x4;
                                lVar48 = ggml_nrows(pgVar60);
                                lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                lVar70 = (int)gVar2 * lVar49;
                                lVar49 = lVar49 + lVar70;
                                if (lVar48 <= lVar49) {
                                  lVar49 = lVar48;
                                }
                                if (lVar49 <= lVar70) {
                                  return;
                                }
                                lVar71 = lVar71 * lVar55;
                                do {
                                  lVar48 = lVar70 / lVar71;
                                  lVar54 = lVar70 % lVar71;
                                  lVar50 = lVar54 / lVar55;
                                  lVar54 = lVar54 % lVar55;
                                  if (0 < lVar52) {
                                    pvVar11 = pgVar59->data;
                                    pvVar12 = pgVar60->data;
                                    lVar51 = 0;
                                    do {
                                      fVar90 = (float)((uint)*(ushort *)
                                                              ((long)pvVar12 +
                                                              lVar51 * 2 +
                                                              lVar50 * sVar6 +
                                                              lVar54 * sVar5 + lVar48 * sVar7) <<
                                                      0x10);
                                      if (fVar90 <= 0.0) {
                                        fVar90 = expm1f(fVar90);
                                      }
                                      *(float *)((long)pvVar11 +
                                                lVar51 * 4 +
                                                lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) =
                                           fVar90;
                                      lVar51 = lVar51 + 1;
                                    } while (lVar52 != lVar51);
                                  }
                                  lVar70 = lVar70 + 1;
                                } while (lVar70 != lVar49);
                                return;
                              }
                              goto LAB_0012b94b;
                            }
                            goto LAB_0012b92f;
                          }
                        }
                        else {
                          if (gVar4 != GGML_TYPE_BF16) goto LAB_0012b456;
                          cVar47 = ggml_is_contiguous_1(pgVar60);
                          if (((cVar47 != '\0') &&
                              (cVar47 = ggml_is_contiguous_1(pgVar59), cVar47 != '\0')) &&
                             (cVar47 = ggml_are_same_shape(pgVar60,pgVar59), cVar47 != '\0')) {
                            if (pgVar59->nb[0] == 2) {
                              if (pgVar60->nb[0] == 2) {
                                lVar55 = pgVar60->ne[1];
                                lVar71 = pgVar60->ne[2];
                                sVar5 = pgVar60->nb[1];
                                sVar6 = pgVar60->nb[2];
                                sVar7 = pgVar60->nb[3];
                                lVar52 = pgVar59->ne[0];
                                sVar8 = pgVar59->nb[1];
                                sVar9 = pgVar59->nb[2];
                                sVar10 = pgVar59->nb[3];
                                gVar2 = pgVar58->type;
                                iVar73 = *(int *)&pgVar58->field_0x4;
                                lVar48 = ggml_nrows(pgVar60);
                                lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                lVar70 = (int)gVar2 * lVar49;
                                lVar49 = lVar49 + lVar70;
                                if (lVar48 <= lVar49) {
                                  lVar49 = lVar48;
                                }
                                if (lVar49 <= lVar70) {
                                  return;
                                }
                                lVar71 = lVar71 * lVar55;
                                do {
                                  lVar48 = lVar70 / lVar71;
                                  lVar54 = lVar70 % lVar71;
                                  lVar50 = lVar54 / lVar55;
                                  lVar54 = lVar54 % lVar55;
                                  if (0 < lVar52) {
                                    pvVar11 = pgVar59->data;
                                    pvVar12 = pgVar60->data;
                                    lVar51 = 0;
                                    do {
                                      fVar90 = (float)((uint)*(ushort *)
                                                              ((long)pvVar12 +
                                                              lVar51 * 2 +
                                                              lVar50 * sVar6 +
                                                              lVar54 * sVar5 + lVar48 * sVar7) <<
                                                      0x10);
                                      if (fVar90 <= 0.0) {
                                        fVar90 = expm1f(fVar90);
                                      }
                                      if ((uint)ABS(fVar90) < 0x7f800001) {
                                        uVar56 = (ushort)((int)fVar90 + 0x7fff +
                                                          ((uint)fVar90 >> 0x10 & 1) >> 0x10);
                                      }
                                      else {
                                        uVar56 = (ushort)((uint)fVar90 >> 0x10) | 0x40;
                                      }
                                      *(ushort *)
                                       ((long)pvVar11 +
                                       lVar51 * 2 +
                                       lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) = uVar56;
                                      lVar51 = lVar51 + 1;
                                    } while (lVar52 != lVar51);
                                  }
                                  lVar70 = lVar70 + 1;
                                } while (lVar70 != lVar49);
                                return;
                              }
                              goto LAB_0012b94b;
                            }
                            goto LAB_0012b92f;
                          }
                        }
                      }
                      else {
LAB_0012b456:
                        if ((gVar2 != GGML_TYPE_F16) || (pgVar59->type != GGML_TYPE_F32)) {
                          pgVar61 = pgVar60;
                          ggml_compute_forward_elu_cold_1();
                          pgVar58 = pgVar61->src[0];
                          gVar2 = pgVar58->type;
                          if ((gVar2 == GGML_TYPE_F32) && (pgVar61->type == GGML_TYPE_F32)) {
                            cVar47 = ggml_is_contiguous_1(pgVar58);
                            if (((cVar47 != '\0') &&
                                (cVar47 = ggml_is_contiguous_1(pgVar61), cVar47 != '\0')) &&
                               (cVar47 = ggml_are_same_shape(pgVar58,pgVar61), cVar47 != '\0')) {
                              if (pgVar61->nb[0] != 4) goto LAB_0012c1b5;
                              if (pgVar58->nb[0] == 4) {
                                lVar55 = pgVar58->ne[1];
                                lVar71 = pgVar58->ne[2];
                                sVar5 = pgVar58->nb[1];
                                sVar6 = pgVar58->nb[2];
                                sVar7 = pgVar58->nb[3];
                                lVar52 = pgVar61->ne[0];
                                sVar8 = pgVar61->nb[1];
                                sVar9 = pgVar61->nb[2];
                                sVar10 = pgVar61->nb[3];
                                gVar2 = pgVar59->type;
                                iVar73 = *(int *)&pgVar59->field_0x4;
                                lVar48 = ggml_nrows(pgVar58);
                                lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                lVar70 = (int)gVar2 * lVar49;
                                lVar49 = lVar49 + lVar70;
                                if (lVar48 <= lVar49) {
                                  lVar49 = lVar48;
                                }
                                if (lVar49 <= lVar70) {
                                  return;
                                }
                                lVar71 = lVar71 * lVar55;
                                pvVar11 = pgVar61->data;
                                pvVar12 = pgVar58->data;
                                do {
                                  lVar48 = lVar70 / lVar71;
                                  lVar54 = lVar70 % lVar71;
                                  lVar50 = lVar54 / lVar55;
                                  lVar54 = lVar54 % lVar55;
                                  if (0 < lVar52) {
                                    lVar51 = 0;
                                    do {
                                      auVar97 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar12 +
                                                                            lVar51 * 4 +
                                                                            lVar50 * sVar6 +
                                                                            lVar54 * sVar5 +
                                                                            lVar48 * sVar7)),
                                                           ZEXT816(0) << 0x40);
                                      *(int *)((long)pvVar11 +
                                              lVar51 * 4 +
                                              lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) =
                                           auVar97._0_4_;
                                      lVar51 = lVar51 + 1;
                                    } while (lVar52 != lVar51);
                                  }
                                  lVar70 = lVar70 + 1;
                                } while (lVar70 != lVar49);
                                return;
                              }
LAB_0012c1d1:
                              pcVar53 = "nb00 == sizeof(src0_t)";
                              uVar57 = 0x56;
                              goto LAB_0012c1eb;
                            }
                          }
                          else if ((gVar2 == GGML_TYPE_F16) && (pgVar61->type == GGML_TYPE_F16)) {
                            cVar47 = ggml_is_contiguous_1(pgVar58);
                            if (((cVar47 != '\0') &&
                                (cVar47 = ggml_is_contiguous_1(pgVar61), cVar47 != '\0')) &&
                               (cVar47 = ggml_are_same_shape(pgVar58,pgVar61), cVar47 != '\0')) {
                              if (pgVar61->nb[0] == 2) {
                                if (pgVar58->nb[0] == 2) {
                                  lVar55 = pgVar58->ne[1];
                                  lVar71 = pgVar58->ne[2];
                                  sVar5 = pgVar58->nb[1];
                                  sVar6 = pgVar58->nb[2];
                                  sVar7 = pgVar58->nb[3];
                                  lVar52 = pgVar61->ne[0];
                                  gVar2 = pgVar59->type;
                                  iVar73 = *(int *)&pgVar59->field_0x4;
                                  lVar48 = ggml_nrows();
                                  lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                  lVar70 = (int)gVar2 * lVar49;
                                  lVar49 = lVar49 + lVar70;
                                  if (lVar48 <= lVar49) {
                                    lVar49 = lVar48;
                                  }
                                  if (lVar49 <= lVar70) {
                                    return;
                                  }
                                  lVar71 = lVar71 * lVar55;
                                  do {
                                    lVar48 = lVar70 % lVar71;
                                    if (0 < lVar52) {
                                      lVar50 = 0;
                                      do {
                                        auVar97 = vmaxss_avx(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                              (ulong)*(ushort *)
                                                                                      ((long)pgVar58
                                                  ->data + lVar50 * 2 +
                                                           (lVar48 / lVar55) * sVar6 +
                                                           (lVar48 % lVar55) * sVar5 +
                                                           (lVar70 / lVar71) * sVar7) * 4)),
                                                  ZEXT816(0) << 0x40);
                                        auVar97 = vcvtps2ph_f16c(auVar97,0);
                                        vpextrw_avx(auVar97,0);
                                        lVar50 = lVar50 + 1;
                                      } while (lVar52 != lVar50);
                                    }
                                    lVar70 = lVar70 + 1;
                                  } while (lVar70 != lVar49);
                                  return;
                                }
                                goto LAB_0012c1d1;
                              }
                              goto LAB_0012c1b5;
                            }
                          }
                          else if (gVar2 == GGML_TYPE_BF16) {
                            gVar4 = pgVar61->type;
                            in_RCX = (ulong)gVar4;
                            if (gVar4 == GGML_TYPE_F32) {
                              cVar47 = ggml_is_contiguous_1(pgVar58);
                              if (((cVar47 != '\0') &&
                                  (cVar47 = ggml_is_contiguous_1(pgVar61), cVar47 != '\0')) &&
                                 (cVar47 = ggml_are_same_shape(pgVar58,pgVar61), cVar47 != '\0')) {
                                if (pgVar61->nb[0] == 4) {
                                  if (pgVar58->nb[0] == 2) {
                                    lVar55 = pgVar58->ne[1];
                                    lVar71 = pgVar58->ne[2];
                                    sVar5 = pgVar58->nb[1];
                                    sVar6 = pgVar58->nb[2];
                                    sVar7 = pgVar58->nb[3];
                                    lVar52 = pgVar61->ne[0];
                                    sVar8 = pgVar61->nb[1];
                                    sVar9 = pgVar61->nb[2];
                                    sVar10 = pgVar61->nb[3];
                                    gVar2 = pgVar59->type;
                                    iVar73 = *(int *)&pgVar59->field_0x4;
                                    lVar48 = ggml_nrows(pgVar58);
                                    lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                    lVar70 = (int)gVar2 * lVar49;
                                    lVar49 = lVar49 + lVar70;
                                    if (lVar48 <= lVar49) {
                                      lVar49 = lVar48;
                                    }
                                    if (lVar49 <= lVar70) {
                                      return;
                                    }
                                    lVar71 = lVar71 * lVar55;
                                    pvVar11 = pgVar61->data;
                                    pvVar12 = pgVar58->data;
                                    auVar89 = vpbroadcastq_avx512f();
                                    auVar85 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                    auVar86 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                    do {
                                      lVar48 = lVar70 / lVar71;
                                      lVar54 = lVar70 % lVar71;
                                      lVar50 = lVar54 / lVar55;
                                      lVar54 = lVar54 % lVar55;
                                      if (0 < lVar52) {
                                        uVar69 = 0;
                                        do {
                                          auVar87 = vpbroadcastq_avx512f();
                                          auVar88 = vporq_avx512f(auVar87,auVar85);
                                          auVar87 = vporq_avx512f(auVar87,auVar86);
                                          uVar57 = vpcmpuq_avx512f(auVar87,auVar89,2);
                                          bVar45 = (byte)uVar57;
                                          uVar57 = vpcmpuq_avx512f(auVar88,auVar89,2);
                                          bVar46 = (byte)uVar57;
                                          uVar56 = CONCAT11(bVar46,bVar45);
                                          auVar81 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                                        ((long)pvVar12 +
                                                                        uVar69 * 2 +
                                                                        lVar50 * sVar6 +
                                                                        lVar54 * sVar5 +
                                                                        lVar48 * sVar7));
                                          auVar77._2_2_ =
                                               (ushort)((byte)(uVar56 >> 1) & 1) * auVar81._2_2_;
                                          auVar77._0_2_ = (ushort)(bVar45 & 1) * auVar81._0_2_;
                                          auVar77._4_2_ =
                                               (ushort)((byte)(uVar56 >> 2) & 1) * auVar81._4_2_;
                                          auVar77._6_2_ =
                                               (ushort)((byte)(uVar56 >> 3) & 1) * auVar81._6_2_;
                                          auVar77._8_2_ =
                                               (ushort)((byte)(uVar56 >> 4) & 1) * auVar81._8_2_;
                                          auVar77._10_2_ =
                                               (ushort)((byte)(uVar56 >> 5) & 1) * auVar81._10_2_;
                                          auVar77._12_2_ =
                                               (ushort)((byte)(uVar56 >> 6) & 1) * auVar81._12_2_;
                                          auVar77._14_2_ =
                                               (ushort)((byte)(uVar56 >> 7) & 1) * auVar81._14_2_;
                                          auVar77._16_2_ = (ushort)(bVar46 & 1) * auVar81._16_2_;
                                          auVar77._18_2_ =
                                               (ushort)(bVar46 >> 1 & 1) * auVar81._18_2_;
                                          auVar77._20_2_ =
                                               (ushort)(bVar46 >> 2 & 1) * auVar81._20_2_;
                                          auVar77._22_2_ =
                                               (ushort)(bVar46 >> 3 & 1) * auVar81._22_2_;
                                          auVar77._24_2_ =
                                               (ushort)(bVar46 >> 4 & 1) * auVar81._24_2_;
                                          auVar77._26_2_ =
                                               (ushort)(bVar46 >> 5 & 1) * auVar81._26_2_;
                                          auVar77._28_2_ =
                                               (ushort)(bVar46 >> 6 & 1) * auVar81._28_2_;
                                          auVar77._30_2_ = (ushort)(bVar46 >> 7) * auVar81._30_2_;
                                          auVar87 = vpmovzxwd_avx512f(auVar77);
                                          auVar87 = vpslld_avx512f(auVar87,0x10);
                                          auVar87 = vmaxps_avx512f(auVar87,ZEXT1664(ZEXT816(0) <<
                                                                                    0x40));
                                          puVar1 = (uint *)((long)pvVar11 +
                                                           uVar69 * 4 +
                                                           lVar50 * sVar9 +
                                                           lVar54 * sVar8 + lVar48 * sVar10);
                                          bVar44 = (bool)((byte)(uVar56 >> 1) & 1);
                                          bVar14 = (bool)((byte)(uVar56 >> 2) & 1);
                                          bVar15 = (bool)((byte)(uVar56 >> 3) & 1);
                                          bVar16 = (bool)((byte)(uVar56 >> 4) & 1);
                                          bVar17 = (bool)((byte)(uVar56 >> 5) & 1);
                                          bVar18 = (bool)((byte)(uVar56 >> 6) & 1);
                                          bVar21 = (bool)((byte)(uVar56 >> 7) & 1);
                                          bVar25 = (bool)(bVar46 >> 1 & 1);
                                          bVar28 = (bool)(bVar46 >> 2 & 1);
                                          bVar31 = (bool)(bVar46 >> 3 & 1);
                                          bVar34 = (bool)(bVar46 >> 4 & 1);
                                          bVar37 = (bool)(bVar46 >> 5 & 1);
                                          bVar40 = (bool)(bVar46 >> 6 & 1);
                                          *puVar1 = (uint)(bVar45 & 1) * auVar87._0_4_ |
                                                    (uint)!(bool)(bVar45 & 1) * *puVar1;
                                          puVar1[1] = (uint)bVar44 * auVar87._4_4_ |
                                                      (uint)!bVar44 * puVar1[1];
                                          puVar1[2] = (uint)bVar14 * auVar87._8_4_ |
                                                      (uint)!bVar14 * puVar1[2];
                                          puVar1[3] = (uint)bVar15 * auVar87._12_4_ |
                                                      (uint)!bVar15 * puVar1[3];
                                          puVar1[4] = (uint)bVar16 * auVar87._16_4_ |
                                                      (uint)!bVar16 * puVar1[4];
                                          puVar1[5] = (uint)bVar17 * auVar87._20_4_ |
                                                      (uint)!bVar17 * puVar1[5];
                                          puVar1[6] = (uint)bVar18 * auVar87._24_4_ |
                                                      (uint)!bVar18 * puVar1[6];
                                          puVar1[7] = (uint)bVar21 * auVar87._28_4_ |
                                                      (uint)!bVar21 * puVar1[7];
                                          puVar1[8] = (uint)(bVar46 & 1) * auVar87._32_4_ |
                                                      (uint)!(bool)(bVar46 & 1) * puVar1[8];
                                          puVar1[9] = (uint)bVar25 * auVar87._36_4_ |
                                                      (uint)!bVar25 * puVar1[9];
                                          puVar1[10] = (uint)bVar28 * auVar87._40_4_ |
                                                       (uint)!bVar28 * puVar1[10];
                                          puVar1[0xb] = (uint)bVar31 * auVar87._44_4_ |
                                                        (uint)!bVar31 * puVar1[0xb];
                                          puVar1[0xc] = (uint)bVar34 * auVar87._48_4_ |
                                                        (uint)!bVar34 * puVar1[0xc];
                                          puVar1[0xd] = (uint)bVar37 * auVar87._52_4_ |
                                                        (uint)!bVar37 * puVar1[0xd];
                                          puVar1[0xe] = (uint)bVar40 * auVar87._56_4_ |
                                                        (uint)!bVar40 * puVar1[0xe];
                                          puVar1[0xf] = (uint)(bVar46 >> 7) * auVar87._60_4_ |
                                                        (uint)!(bool)(bVar46 >> 7) * puVar1[0xf];
                                          uVar69 = uVar69 + 0x10;
                                        } while ((lVar52 + 0xfU & 0xfffffffffffffff0) != uVar69);
                                      }
                                      lVar70 = lVar70 + 1;
                                    } while (lVar70 != lVar49);
                                    return;
                                  }
                                  goto LAB_0012c1d1;
                                }
                                goto LAB_0012c1b5;
                              }
                            }
                            else {
                              if (gVar4 != GGML_TYPE_BF16) goto LAB_0012bce7;
                              cVar47 = ggml_is_contiguous_1(pgVar58);
                              if (((cVar47 != '\0') &&
                                  (cVar47 = ggml_is_contiguous_1(pgVar61), cVar47 != '\0')) &&
                                 (cVar47 = ggml_are_same_shape(pgVar58,pgVar61), cVar47 != '\0')) {
                                if (pgVar61->nb[0] == 2) {
                                  if (pgVar58->nb[0] == 2) {
                                    lVar55 = pgVar58->ne[1];
                                    lVar71 = pgVar58->ne[2];
                                    sVar5 = pgVar58->nb[1];
                                    sVar6 = pgVar58->nb[2];
                                    sVar7 = pgVar58->nb[3];
                                    lVar52 = pgVar61->ne[0];
                                    sVar8 = pgVar61->nb[1];
                                    sVar9 = pgVar61->nb[2];
                                    sVar10 = pgVar61->nb[3];
                                    gVar2 = pgVar59->type;
                                    iVar73 = *(int *)&pgVar59->field_0x4;
                                    lVar48 = ggml_nrows(pgVar58);
                                    lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                    lVar70 = (int)gVar2 * lVar49;
                                    lVar49 = lVar49 + lVar70;
                                    if (lVar48 <= lVar49) {
                                      lVar49 = lVar48;
                                    }
                                    if (lVar49 <= lVar70) {
                                      return;
                                    }
                                    lVar71 = lVar71 * lVar55;
                                    pvVar11 = pgVar61->data;
                                    pvVar12 = pgVar58->data;
                                    do {
                                      lVar48 = lVar70 / lVar71;
                                      lVar54 = lVar70 % lVar71;
                                      lVar50 = lVar54 / lVar55;
                                      lVar54 = lVar54 % lVar55;
                                      if (0 < lVar52) {
                                        lVar51 = 0;
                                        do {
                                          auVar97 = vmaxss_avx(ZEXT216(*(ushort *)
                                                                        ((long)pvVar12 +
                                                                        lVar51 * 2 +
                                                                        lVar50 * sVar6 +
                                                                        lVar54 * sVar5 +
                                                                        lVar48 * sVar7)) << 0x10,
                                                               ZEXT816(0) << 0x40);
                                          uVar68 = auVar97._0_4_;
                                          if (uVar68 < 0x7f800001) {
                                            uVar56 = (ushort)(uVar68 + 0x7fff + (uVar68 >> 0x10 & 1)
                                                             >> 0x10);
                                          }
                                          else {
                                            uVar56 = auVar97._2_2_ | 0x40;
                                          }
                                          *(ushort *)
                                           ((long)pvVar11 +
                                           lVar51 * 2 +
                                           lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) =
                                               uVar56;
                                          lVar51 = lVar51 + 1;
                                        } while (lVar52 != lVar51);
                                      }
                                      lVar70 = lVar70 + 1;
                                    } while (lVar70 != lVar49);
                                    return;
                                  }
                                  goto LAB_0012c1d1;
                                }
                                goto LAB_0012c1b5;
                              }
                            }
                          }
                          else {
LAB_0012bce7:
                            if ((gVar2 != GGML_TYPE_F16) || (pgVar61->type != GGML_TYPE_F32)) {
                              ggml_compute_forward_relu_cold_1();
                              pgVar59 = pgVar58->src[0];
                              gVar2 = pgVar59->type;
                              if ((gVar2 == GGML_TYPE_F32) && (pgVar58->type == GGML_TYPE_F32)) {
                                cVar47 = ggml_is_contiguous_1(pgVar59);
                                if (((cVar47 != '\0') &&
                                    (cVar47 = ggml_is_contiguous_1(pgVar58), cVar47 != '\0')) &&
                                   (cVar47 = ggml_are_same_shape(pgVar59,pgVar58), cVar47 != '\0'))
                                {
                                  if (pgVar58->nb[0] != 4) goto LAB_0012cb39;
                                  if (pgVar59->nb[0] == 4) {
                                    lVar55 = pgVar59->ne[1];
                                    lVar71 = pgVar59->ne[2];
                                    sVar5 = pgVar59->nb[1];
                                    sVar6 = pgVar59->nb[2];
                                    sVar7 = pgVar59->nb[3];
                                    lVar52 = pgVar58->ne[0];
                                    sVar8 = pgVar58->nb[1];
                                    sVar9 = pgVar58->nb[2];
                                    sVar10 = pgVar58->nb[3];
                                    gVar2 = pgVar61->type;
                                    iVar73 = *(int *)&pgVar61->field_0x4;
                                    lVar48 = ggml_nrows(pgVar59);
                                    lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                    lVar70 = (int)gVar2 * lVar49;
                                    lVar49 = lVar49 + lVar70;
                                    if (lVar48 <= lVar49) {
                                      lVar49 = lVar48;
                                    }
                                    if (lVar49 <= lVar70) {
                                      return;
                                    }
                                    lVar71 = lVar71 * lVar55;
                                    pvVar11 = pgVar58->data;
                                    pvVar12 = pgVar59->data;
                                    do {
                                      lVar48 = lVar70 / lVar71;
                                      lVar54 = lVar70 % lVar71;
                                      lVar50 = lVar54 / lVar55;
                                      lVar54 = lVar54 % lVar55;
                                      if (0 < lVar52) {
                                        lVar51 = 0;
                                        do {
                                          fVar90 = expf(-*(float *)((long)pvVar12 +
                                                                   lVar51 * 4 +
                                                                   lVar50 * sVar6 +
                                                                   lVar54 * sVar5 + lVar48 * sVar7))
                                          ;
                                          *(float *)((long)pvVar11 +
                                                    lVar51 * 4 +
                                                    lVar50 * sVar9 +
                                                    lVar54 * sVar8 + lVar48 * sVar10) =
                                               1.0 / (fVar90 + 1.0);
                                          lVar51 = lVar51 + 1;
                                        } while (lVar52 != lVar51);
                                      }
                                      lVar70 = lVar70 + 1;
                                    } while (lVar70 != lVar49);
                                    return;
                                  }
LAB_0012cb55:
                                  pcVar53 = "nb00 == sizeof(src0_t)";
                                  uVar57 = 0x56;
                                  goto LAB_0012cb6f;
                                }
                              }
                              else if ((gVar2 == GGML_TYPE_F16) && (pgVar58->type == GGML_TYPE_F16))
                              {
                                cVar47 = ggml_is_contiguous_1(pgVar59);
                                if (((cVar47 != '\0') &&
                                    (cVar47 = ggml_is_contiguous_1(pgVar58), cVar47 != '\0')) &&
                                   (cVar47 = ggml_are_same_shape(pgVar59,pgVar58), cVar47 != '\0'))
                                {
                                  if (pgVar58->nb[0] == 2) {
                                    if (pgVar59->nb[0] == 2) {
                                      lVar55 = pgVar59->ne[1];
                                      lVar71 = pgVar59->ne[2];
                                      sVar5 = pgVar59->nb[1];
                                      sVar6 = pgVar59->nb[2];
                                      sVar7 = pgVar59->nb[3];
                                      lVar52 = pgVar58->ne[0];
                                      gVar2 = pgVar61->type;
                                      iVar73 = *(int *)&pgVar61->field_0x4;
                                      lVar48 = ggml_nrows(pgVar59);
                                      lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                      lVar70 = (int)gVar2 * lVar49;
                                      lVar49 = lVar49 + lVar70;
                                      if (lVar48 <= lVar49) {
                                        lVar49 = lVar48;
                                      }
                                      if (lVar49 <= lVar70) {
                                        return;
                                      }
                                      lVar71 = lVar71 * lVar55;
                                      pvVar11 = pgVar59->data;
                                      do {
                                        lVar48 = lVar70 % lVar71;
                                        if (0 < lVar52) {
                                          lVar50 = 0;
                                          do {
                                            fVar90 = expf(-*(float *)(&ggml_table_f32_f16 +
                                                                     (ulong)*(ushort *)
                                                                             ((long)pvVar11 +
                                                                             lVar50 * 2 +
                                                                             (lVar48 / lVar55) *
                                                                             sVar6 + (lVar48 % 
                                                  lVar55) * sVar5 + (lVar70 / lVar71) * sVar7) * 4))
                                            ;
                                            auVar97 = vcvtps2ph_f16c(ZEXT416((uint)(1.0 / (fVar90 + 
                                                  1.0))),0);
                                            vpextrw_avx(auVar97,0);
                                            lVar50 = lVar50 + 1;
                                          } while (lVar52 != lVar50);
                                        }
                                        lVar70 = lVar70 + 1;
                                      } while (lVar70 != lVar49);
                                      return;
                                    }
                                    goto LAB_0012cb55;
                                  }
                                  goto LAB_0012cb39;
                                }
                              }
                              else if (gVar2 == GGML_TYPE_BF16) {
                                gVar4 = pgVar58->type;
                                in_RCX = (ulong)gVar4;
                                if (gVar4 == GGML_TYPE_F32) {
                                  cVar47 = ggml_is_contiguous_1(pgVar59);
                                  if (((cVar47 != '\0') &&
                                      (cVar47 = ggml_is_contiguous_1(pgVar58), cVar47 != '\0')) &&
                                     (cVar47 = ggml_are_same_shape(pgVar59,pgVar58), cVar47 != '\0')
                                     ) {
                                    if (pgVar58->nb[0] == 4) {
                                      if (pgVar59->nb[0] == 2) {
                                        lVar55 = pgVar59->ne[1];
                                        lVar71 = pgVar59->ne[2];
                                        sVar5 = pgVar59->nb[1];
                                        sVar6 = pgVar59->nb[2];
                                        sVar7 = pgVar59->nb[3];
                                        lVar52 = pgVar58->ne[0];
                                        sVar8 = pgVar58->nb[1];
                                        sVar9 = pgVar58->nb[2];
                                        sVar10 = pgVar58->nb[3];
                                        gVar2 = pgVar61->type;
                                        iVar73 = *(int *)&pgVar61->field_0x4;
                                        lVar48 = ggml_nrows(pgVar59);
                                        lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                        lVar70 = (int)gVar2 * lVar49;
                                        lVar49 = lVar49 + lVar70;
                                        if (lVar48 <= lVar49) {
                                          lVar49 = lVar48;
                                        }
                                        if (lVar49 <= lVar70) {
                                          return;
                                        }
                                        lVar71 = lVar71 * lVar55;
                                        pvVar11 = pgVar58->data;
                                        pvVar12 = pgVar59->data;
                                        do {
                                          lVar48 = lVar70 / lVar71;
                                          lVar54 = lVar70 % lVar71;
                                          lVar50 = lVar54 / lVar55;
                                          lVar54 = lVar54 % lVar55;
                                          if (0 < lVar52) {
                                            lVar51 = 0;
                                            do {
                                              fVar90 = expf((float)((uint)*(ushort *)
                                                                           ((long)pvVar12 +
                                                                           lVar51 * 2 +
                                                                           lVar50 * sVar6 +
                                                                           lVar54 * sVar5 +
                                                                           lVar48 * sVar7) * 0x10000
                                                                   + -0x80000000));
                                              *(float *)((long)pvVar11 +
                                                        lVar51 * 4 +
                                                        lVar50 * sVar9 +
                                                        lVar54 * sVar8 + lVar48 * sVar10) =
                                                   1.0 / (fVar90 + 1.0);
                                              lVar51 = lVar51 + 1;
                                            } while (lVar52 != lVar51);
                                          }
                                          lVar70 = lVar70 + 1;
                                        } while (lVar70 != lVar49);
                                        return;
                                      }
                                      goto LAB_0012cb55;
                                    }
                                    goto LAB_0012cb39;
                                  }
                                }
                                else {
                                  if (gVar4 != GGML_TYPE_BF16) goto LAB_0012c5f1;
                                  cVar47 = ggml_is_contiguous_1(pgVar59);
                                  if (((cVar47 != '\0') &&
                                      (cVar47 = ggml_is_contiguous_1(pgVar58), cVar47 != '\0')) &&
                                     (cVar47 = ggml_are_same_shape(pgVar59,pgVar58), cVar47 != '\0')
                                     ) {
                                    if (pgVar58->nb[0] == 2) {
                                      if (pgVar59->nb[0] == 2) {
                                        lVar55 = pgVar59->ne[1];
                                        lVar71 = pgVar59->ne[2];
                                        sVar5 = pgVar59->nb[1];
                                        sVar6 = pgVar59->nb[2];
                                        sVar7 = pgVar59->nb[3];
                                        lVar52 = pgVar58->ne[0];
                                        sVar8 = pgVar58->nb[1];
                                        sVar9 = pgVar58->nb[2];
                                        sVar10 = pgVar58->nb[3];
                                        gVar2 = pgVar61->type;
                                        iVar73 = *(int *)&pgVar61->field_0x4;
                                        lVar48 = ggml_nrows(pgVar59);
                                        lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                        lVar70 = (int)gVar2 * lVar49;
                                        lVar49 = lVar49 + lVar70;
                                        if (lVar48 <= lVar49) {
                                          lVar49 = lVar48;
                                        }
                                        if (lVar49 <= lVar70) {
                                          return;
                                        }
                                        lVar71 = lVar71 * lVar55;
                                        pvVar11 = pgVar58->data;
                                        pvVar12 = pgVar59->data;
                                        do {
                                          lVar48 = lVar70 / lVar71;
                                          lVar54 = lVar70 % lVar71;
                                          lVar50 = lVar54 / lVar55;
                                          lVar54 = lVar54 % lVar55;
                                          if (0 < lVar52) {
                                            lVar51 = 0;
                                            do {
                                              fVar90 = expf((float)((uint)*(ushort *)
                                                                           ((long)pvVar12 +
                                                                           lVar51 * 2 +
                                                                           lVar50 * sVar6 +
                                                                           lVar54 * sVar5 +
                                                                           lVar48 * sVar7) * 0x10000
                                                                   + -0x80000000));
                                              fVar90 = 1.0 / (fVar90 + 1.0);
                                              if ((uint)ABS(fVar90) < 0x7f800001) {
                                                uVar56 = (ushort)((int)fVar90 + 0x7fff +
                                                                  ((uint)fVar90 >> 0x10 & 1) >> 0x10
                                                                 );
                                              }
                                              else {
                                                uVar56 = (ushort)((uint)fVar90 >> 0x10) | 0x40;
                                              }
                                              *(ushort *)
                                               ((long)pvVar11 +
                                               lVar51 * 2 +
                                               lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) =
                                                   uVar56;
                                              lVar51 = lVar51 + 1;
                                            } while (lVar52 != lVar51);
                                          }
                                          lVar70 = lVar70 + 1;
                                        } while (lVar70 != lVar49);
                                        return;
                                      }
                                      goto LAB_0012cb55;
                                    }
                                    goto LAB_0012cb39;
                                  }
                                }
                              }
                              else {
LAB_0012c5f1:
                                if ((gVar2 != GGML_TYPE_F16) || (pgVar58->type != GGML_TYPE_F32)) {
                                  ggml_compute_forward_sigmoid_cold_1();
                                  pgVar61 = pgVar59->src[0];
                                  gVar2 = pgVar61->type;
                                  if ((gVar2 == GGML_TYPE_F32) && (pgVar59->type == GGML_TYPE_F32))
                                  {
                                    cVar47 = ggml_is_contiguous_1(pgVar61);
                                    if (((cVar47 != '\0') &&
                                        (cVar47 = ggml_is_contiguous_1(pgVar59), cVar47 != '\0')) &&
                                       (cVar47 = ggml_are_same_shape(pgVar61,pgVar59),
                                       cVar47 != '\0')) {
                                      if (pgVar59->nb[0] != 4) goto LAB_0012d47e;
                                      if (pgVar61->nb[0] == 4) {
                                        lVar55 = pgVar61->ne[1];
                                        lVar71 = pgVar61->ne[2];
                                        sVar5 = pgVar61->nb[1];
                                        sVar6 = pgVar61->nb[2];
                                        sVar7 = pgVar61->nb[3];
                                        lVar52 = pgVar59->ne[0];
                                        sVar8 = pgVar59->nb[1];
                                        sVar9 = pgVar59->nb[2];
                                        sVar10 = pgVar59->nb[3];
                                        gVar2 = pgVar58->type;
                                        iVar73 = *(int *)&pgVar58->field_0x4;
                                        lVar48 = ggml_nrows(pgVar61);
                                        lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                        lVar70 = (int)gVar2 * lVar49;
                                        lVar49 = lVar49 + lVar70;
                                        if (lVar48 <= lVar49) {
                                          lVar49 = lVar48;
                                        }
                                        if (lVar49 <= lVar70) {
                                          return;
                                        }
                                        lVar71 = lVar71 * lVar55;
                                        pvVar11 = pgVar59->data;
                                        pvVar12 = pgVar61->data;
                                        do {
                                          lVar48 = lVar70 / lVar71;
                                          lVar54 = lVar70 % lVar71;
                                          lVar50 = lVar54 / lVar55;
                                          lVar54 = lVar54 % lVar55;
                                          if (0 < lVar52) {
                                            lVar51 = 0;
                                            do {
                                              auVar101._0_4_ =
                                                   (*(float *)((long)pvVar12 +
                                                              lVar51 * 4 +
                                                              lVar50 * sVar6 +
                                                              lVar54 * sVar5 + lVar48 * sVar7) + 3.0
                                                   ) / 6.0;
                                              auVar101._4_12_ = SUB6012((undefined1  [60])0x0,0);
                                              auVar97 = vmaxss_avx(auVar101,ZEXT816(0) << 0x40);
                                              auVar97 = vminss_avx(auVar97,SUB6416(ZEXT464(
                                                  0x3f800000),0));
                                              *(int *)((long)pvVar11 +
                                                      lVar51 * 4 +
                                                      lVar50 * sVar9 +
                                                      lVar54 * sVar8 + lVar48 * sVar10) =
                                                   auVar97._0_4_;
                                              lVar51 = lVar51 + 1;
                                            } while (lVar52 != lVar51);
                                          }
                                          lVar70 = lVar70 + 1;
                                        } while (lVar70 != lVar49);
                                        return;
                                      }
LAB_0012d49a:
                                      pcVar53 = "nb00 == sizeof(src0_t)";
                                      uVar57 = 0x56;
                                      goto LAB_0012d4b4;
                                    }
                                  }
                                  else if ((gVar2 == GGML_TYPE_F16) &&
                                          (pgVar59->type == GGML_TYPE_F16)) {
                                    cVar47 = ggml_is_contiguous_1(pgVar61);
                                    if (((cVar47 != '\0') &&
                                        (cVar47 = ggml_is_contiguous_1(pgVar59), cVar47 != '\0')) &&
                                       (cVar47 = ggml_are_same_shape(pgVar61,pgVar59),
                                       cVar47 != '\0')) {
                                      if (pgVar59->nb[0] == 2) {
                                        if (pgVar61->nb[0] == 2) {
                                          lVar55 = pgVar61->ne[1];
                                          lVar71 = pgVar61->ne[2];
                                          sVar5 = pgVar61->nb[1];
                                          sVar6 = pgVar61->nb[2];
                                          sVar7 = pgVar61->nb[3];
                                          lVar52 = pgVar59->ne[0];
                                          gVar2 = pgVar58->type;
                                          iVar73 = *(int *)&pgVar58->field_0x4;
                                          lVar48 = ggml_nrows();
                                          lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                          lVar70 = (int)gVar2 * lVar49;
                                          lVar49 = lVar49 + lVar70;
                                          if (lVar48 <= lVar49) {
                                            lVar49 = lVar48;
                                          }
                                          if (lVar49 <= lVar70) {
                                            return;
                                          }
                                          lVar71 = lVar71 * lVar55;
                                          do {
                                            lVar48 = lVar70 % lVar71;
                                            if (0 < lVar52) {
                                              lVar50 = 0;
                                              do {
                                                auVar98._0_4_ =
                                                     (*(float *)(&ggml_table_f32_f16 +
                                                                (ulong)*(ushort *)
                                                                        ((long)pgVar61->data +
                                                                        lVar50 * 2 +
                                                                        (lVar48 / lVar55) * sVar6 +
                                                                        (lVar48 % lVar55) * sVar5 +
                                                                        (lVar70 / lVar71) * sVar7) *
                                                                4) + 3.0) / 6.0;
                                                auVar98._4_12_ = SUB6012((undefined1  [60])0x0,0);
                                                auVar97 = vmaxss_avx(auVar98,ZEXT816(0) << 0x40);
                                                auVar97 = vminss_avx(auVar97,SUB6416(ZEXT464(
                                                  0x3f800000),0));
                                                auVar97 = vcvtps2ph_f16c(auVar97,0);
                                                vpextrw_avx(auVar97,0);
                                                lVar50 = lVar50 + 1;
                                              } while (lVar52 != lVar50);
                                            }
                                            lVar70 = lVar70 + 1;
                                          } while (lVar70 != lVar49);
                                          return;
                                        }
                                        goto LAB_0012d49a;
                                      }
                                      goto LAB_0012d47e;
                                    }
                                  }
                                  else if (gVar2 == GGML_TYPE_BF16) {
                                    gVar4 = pgVar59->type;
                                    in_RCX = (ulong)gVar4;
                                    if (gVar4 == GGML_TYPE_F32) {
                                      cVar47 = ggml_is_contiguous_1(pgVar61);
                                      if (((cVar47 != '\0') &&
                                          (cVar47 = ggml_is_contiguous_1(pgVar59), cVar47 != '\0'))
                                         && (cVar47 = ggml_are_same_shape(pgVar61,pgVar59),
                                            cVar47 != '\0')) {
                                        if (pgVar59->nb[0] == 4) {
                                          if (pgVar61->nb[0] == 2) {
                                            lVar55 = pgVar61->ne[1];
                                            lVar71 = pgVar61->ne[2];
                                            sVar5 = pgVar61->nb[1];
                                            sVar6 = pgVar61->nb[2];
                                            sVar7 = pgVar61->nb[3];
                                            lVar52 = pgVar59->ne[0];
                                            sVar8 = pgVar59->nb[1];
                                            sVar9 = pgVar59->nb[2];
                                            sVar10 = pgVar59->nb[3];
                                            gVar2 = pgVar58->type;
                                            iVar73 = *(int *)&pgVar58->field_0x4;
                                            lVar48 = ggml_nrows(pgVar61);
                                            lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                            lVar70 = (int)gVar2 * lVar49;
                                            lVar49 = lVar49 + lVar70;
                                            if (lVar48 <= lVar49) {
                                              lVar49 = lVar48;
                                            }
                                            if (lVar49 <= lVar70) {
                                              return;
                                            }
                                            lVar71 = lVar71 * lVar55;
                                            pvVar11 = pgVar59->data;
                                            pvVar12 = pgVar61->data;
                                            auVar89 = vpbroadcastq_avx512f();
                                            auVar85 = vbroadcastss_avx512f(ZEXT416(0x40400000));
                                            auVar86 = vbroadcastss_avx512f(ZEXT416(0x40c00000));
                                            auVar87 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                            auVar88 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                            auVar82 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                                            do {
                                              lVar48 = lVar70 / lVar71;
                                              lVar54 = lVar70 % lVar71;
                                              lVar50 = lVar54 / lVar55;
                                              lVar54 = lVar54 % lVar55;
                                              if (0 < lVar52) {
                                                uVar69 = 0;
                                                do {
                                                  auVar83 = vpbroadcastq_avx512f();
                                                  auVar84 = vporq_avx512f(auVar83,auVar87);
                                                  auVar83 = vporq_avx512f(auVar83,auVar88);
                                                  uVar57 = vpcmpuq_avx512f(auVar83,auVar89,2);
                                                  bVar45 = (byte)uVar57;
                                                  uVar57 = vpcmpuq_avx512f(auVar84,auVar89,2);
                                                  bVar46 = (byte)uVar57;
                                                  uVar56 = CONCAT11(bVar46,bVar45);
                                                  auVar81 = vmovdqu16_avx512vl(*(undefined1 (*) [32]
                                                                                )((long)pvVar12 +
                                                                                 uVar69 * 2 +
                                                                                 lVar50 * sVar6 +
                                                                                 lVar54 * sVar5 +
                                                                                 lVar48 * sVar7));
                                                  auVar78._2_2_ =
                                                       (ushort)((byte)(uVar56 >> 1) & 1) *
                                                       auVar81._2_2_;
                                                  auVar78._0_2_ =
                                                       (ushort)(bVar45 & 1) * auVar81._0_2_;
                                                  auVar78._4_2_ =
                                                       (ushort)((byte)(uVar56 >> 2) & 1) *
                                                       auVar81._4_2_;
                                                  auVar78._6_2_ =
                                                       (ushort)((byte)(uVar56 >> 3) & 1) *
                                                       auVar81._6_2_;
                                                  auVar78._8_2_ =
                                                       (ushort)((byte)(uVar56 >> 4) & 1) *
                                                       auVar81._8_2_;
                                                  auVar78._10_2_ =
                                                       (ushort)((byte)(uVar56 >> 5) & 1) *
                                                       auVar81._10_2_;
                                                  auVar78._12_2_ =
                                                       (ushort)((byte)(uVar56 >> 6) & 1) *
                                                       auVar81._12_2_;
                                                  auVar78._14_2_ =
                                                       (ushort)((byte)(uVar56 >> 7) & 1) *
                                                       auVar81._14_2_;
                                                  auVar78._16_2_ =
                                                       (ushort)(bVar46 & 1) * auVar81._16_2_;
                                                  auVar78._18_2_ =
                                                       (ushort)(bVar46 >> 1 & 1) * auVar81._18_2_;
                                                  auVar78._20_2_ =
                                                       (ushort)(bVar46 >> 2 & 1) * auVar81._20_2_;
                                                  auVar78._22_2_ =
                                                       (ushort)(bVar46 >> 3 & 1) * auVar81._22_2_;
                                                  auVar78._24_2_ =
                                                       (ushort)(bVar46 >> 4 & 1) * auVar81._24_2_;
                                                  auVar78._26_2_ =
                                                       (ushort)(bVar46 >> 5 & 1) * auVar81._26_2_;
                                                  auVar78._28_2_ =
                                                       (ushort)(bVar46 >> 6 & 1) * auVar81._28_2_;
                                                  auVar78._30_2_ =
                                                       (ushort)(bVar46 >> 7) * auVar81._30_2_;
                                                  auVar83 = vpmovzxwd_avx512f(auVar78);
                                                  auVar83 = vpslld_avx512f(auVar83,0x10);
                                                  auVar83 = vaddps_avx512f(auVar83,auVar85);
                                                  auVar83 = vdivps_avx512f(auVar83,auVar86);
                                                  auVar83 = vmaxps_avx512f(auVar83,ZEXT1664(ZEXT816(
                                                  0) << 0x40));
                                                  auVar83 = vminps_avx512f(auVar83,auVar82);
                                                  puVar1 = (uint *)((long)pvVar11 +
                                                                   uVar69 * 4 +
                                                                   lVar50 * sVar9 +
                                                                   lVar54 * sVar8 + lVar48 * sVar10)
                                                  ;
                                                  bVar44 = (bool)((byte)(uVar56 >> 1) & 1);
                                                  bVar14 = (bool)((byte)(uVar56 >> 2) & 1);
                                                  bVar15 = (bool)((byte)(uVar56 >> 3) & 1);
                                                  bVar16 = (bool)((byte)(uVar56 >> 4) & 1);
                                                  bVar17 = (bool)((byte)(uVar56 >> 5) & 1);
                                                  bVar18 = (bool)((byte)(uVar56 >> 6) & 1);
                                                  bVar21 = (bool)((byte)(uVar56 >> 7) & 1);
                                                  bVar25 = (bool)(bVar46 >> 1 & 1);
                                                  bVar28 = (bool)(bVar46 >> 2 & 1);
                                                  bVar31 = (bool)(bVar46 >> 3 & 1);
                                                  bVar34 = (bool)(bVar46 >> 4 & 1);
                                                  bVar37 = (bool)(bVar46 >> 5 & 1);
                                                  bVar40 = (bool)(bVar46 >> 6 & 1);
                                                  *puVar1 = (uint)(bVar45 & 1) * auVar83._0_4_ |
                                                            (uint)!(bool)(bVar45 & 1) * *puVar1;
                                                  puVar1[1] = (uint)bVar44 * auVar83._4_4_ |
                                                              (uint)!bVar44 * puVar1[1];
                                                  puVar1[2] = (uint)bVar14 * auVar83._8_4_ |
                                                              (uint)!bVar14 * puVar1[2];
                                                  puVar1[3] = (uint)bVar15 * auVar83._12_4_ |
                                                              (uint)!bVar15 * puVar1[3];
                                                  puVar1[4] = (uint)bVar16 * auVar83._16_4_ |
                                                              (uint)!bVar16 * puVar1[4];
                                                  puVar1[5] = (uint)bVar17 * auVar83._20_4_ |
                                                              (uint)!bVar17 * puVar1[5];
                                                  puVar1[6] = (uint)bVar18 * auVar83._24_4_ |
                                                              (uint)!bVar18 * puVar1[6];
                                                  puVar1[7] = (uint)bVar21 * auVar83._28_4_ |
                                                              (uint)!bVar21 * puVar1[7];
                                                  puVar1[8] = (uint)(bVar46 & 1) * auVar83._32_4_ |
                                                              (uint)!(bool)(bVar46 & 1) * puVar1[8];
                                                  puVar1[9] = (uint)bVar25 * auVar83._36_4_ |
                                                              (uint)!bVar25 * puVar1[9];
                                                  puVar1[10] = (uint)bVar28 * auVar83._40_4_ |
                                                               (uint)!bVar28 * puVar1[10];
                                                  puVar1[0xb] = (uint)bVar31 * auVar83._44_4_ |
                                                                (uint)!bVar31 * puVar1[0xb];
                                                  puVar1[0xc] = (uint)bVar34 * auVar83._48_4_ |
                                                                (uint)!bVar34 * puVar1[0xc];
                                                  puVar1[0xd] = (uint)bVar37 * auVar83._52_4_ |
                                                                (uint)!bVar37 * puVar1[0xd];
                                                  puVar1[0xe] = (uint)bVar40 * auVar83._56_4_ |
                                                                (uint)!bVar40 * puVar1[0xe];
                                                  puVar1[0xf] = (uint)(bVar46 >> 7) * auVar83._60_4_
                                                                | (uint)!(bool)(bVar46 >> 7) *
                                                                  puVar1[0xf];
                                                  uVar69 = uVar69 + 0x10;
                                                } while ((lVar52 + 0xfU & 0xfffffffffffffff0) !=
                                                         uVar69);
                                              }
                                              lVar70 = lVar70 + 1;
                                            } while (lVar70 != lVar49);
                                            return;
                                          }
                                          goto LAB_0012d49a;
                                        }
                                        goto LAB_0012d47e;
                                      }
                                    }
                                    else {
                                      if (gVar4 != GGML_TYPE_BF16) goto LAB_0012cf3f;
                                      cVar47 = ggml_is_contiguous_1(pgVar61);
                                      if (((cVar47 != '\0') &&
                                          (cVar47 = ggml_is_contiguous_1(pgVar59), cVar47 != '\0'))
                                         && (cVar47 = ggml_are_same_shape(pgVar61,pgVar59),
                                            cVar47 != '\0')) {
                                        if (pgVar59->nb[0] == 2) {
                                          if (pgVar61->nb[0] == 2) {
                                            lVar55 = pgVar61->ne[1];
                                            lVar71 = pgVar61->ne[2];
                                            sVar5 = pgVar61->nb[1];
                                            sVar6 = pgVar61->nb[2];
                                            sVar7 = pgVar61->nb[3];
                                            lVar52 = pgVar59->ne[0];
                                            sVar8 = pgVar59->nb[1];
                                            sVar9 = pgVar59->nb[2];
                                            sVar10 = pgVar59->nb[3];
                                            gVar2 = pgVar58->type;
                                            iVar73 = *(int *)&pgVar58->field_0x4;
                                            lVar48 = ggml_nrows(pgVar61);
                                            lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                            lVar70 = (int)gVar2 * lVar49;
                                            lVar49 = lVar49 + lVar70;
                                            if (lVar48 <= lVar49) {
                                              lVar49 = lVar48;
                                            }
                                            if (lVar49 <= lVar70) {
                                              return;
                                            }
                                            lVar71 = lVar71 * lVar55;
                                            pvVar11 = pgVar59->data;
                                            pvVar12 = pgVar61->data;
                                            do {
                                              lVar48 = lVar70 / lVar71;
                                              lVar54 = lVar70 % lVar71;
                                              lVar50 = lVar54 / lVar55;
                                              lVar54 = lVar54 % lVar55;
                                              if (0 < lVar52) {
                                                lVar51 = 0;
                                                do {
                                                  auVar99._0_4_ =
                                                       ((float)((uint)*(ushort *)
                                                                       ((long)pvVar12 +
                                                                       lVar51 * 2 +
                                                                       lVar50 * sVar6 +
                                                                       lVar54 * sVar5 +
                                                                       lVar48 * sVar7) << 0x10) +
                                                       3.0) / 6.0;
                                                  auVar99._4_12_ = SUB6012((undefined1  [60])0x0,0);
                                                  auVar97 = vmaxss_avx(auVar99,ZEXT816(0) << 0x40);
                                                  auVar97 = vminss_avx(auVar97,SUB6416(ZEXT464(
                                                  0x3f800000),0));
                                                  uVar68 = auVar97._0_4_;
                                                  if ((uVar68 & 0x7fffffff) < 0x7f800001) {
                                                    uVar56 = (ushort)(uVar68 + 0x7fff +
                                                                      (uVar68 >> 0x10 & 1) >> 0x10);
                                                  }
                                                  else {
                                                    uVar56 = auVar97._2_2_ | 0x40;
                                                  }
                                                  *(ushort *)
                                                   ((long)pvVar11 +
                                                   lVar51 * 2 +
                                                   lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10
                                                   ) = uVar56;
                                                  lVar51 = lVar51 + 1;
                                                } while (lVar52 != lVar51);
                                              }
                                              lVar70 = lVar70 + 1;
                                            } while (lVar70 != lVar49);
                                            return;
                                          }
                                          goto LAB_0012d49a;
                                        }
                                        goto LAB_0012d47e;
                                      }
                                    }
                                  }
                                  else {
LAB_0012cf3f:
                                    if ((gVar2 != GGML_TYPE_F16) || (pgVar59->type != GGML_TYPE_F32)
                                       ) {
                                      ggml_compute_forward_hardsigmoid_cold_1();
                                      pgVar58 = pgVar61->src[0];
                                      gVar2 = pgVar58->type;
                                      if ((gVar2 == GGML_TYPE_F32) &&
                                         (pgVar61->type == GGML_TYPE_F32)) {
                                        cVar47 = ggml_is_contiguous_1(pgVar58);
                                        if (((cVar47 != '\0') &&
                                            (cVar47 = ggml_is_contiguous_1(pgVar61), cVar47 != '\0')
                                            ) && (cVar47 = ggml_are_same_shape(pgVar58,pgVar61),
                                                 cVar47 != '\0')) {
                                          if (pgVar61->nb[0] != 4) goto LAB_0012dd5e;
                                          if (pgVar58->nb[0] == 4) {
                                            lVar55 = pgVar58->ne[1];
                                            lVar71 = pgVar58->ne[2];
                                            sVar5 = pgVar58->nb[1];
                                            sVar6 = pgVar58->nb[2];
                                            sVar7 = pgVar58->nb[3];
                                            lVar52 = pgVar61->ne[0];
                                            sVar8 = pgVar61->nb[1];
                                            sVar9 = pgVar61->nb[2];
                                            sVar10 = pgVar61->nb[3];
                                            gVar2 = pgVar59->type;
                                            iVar73 = *(int *)&pgVar59->field_0x4;
                                            lVar48 = ggml_nrows(pgVar58);
                                            lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                            lVar70 = (int)gVar2 * lVar49;
                                            lVar49 = lVar49 + lVar70;
                                            if (lVar48 <= lVar49) {
                                              lVar49 = lVar48;
                                            }
                                            if (lVar49 <= lVar70) {
                                              return;
                                            }
                                            lVar71 = lVar71 * lVar55;
                                            pvVar11 = pgVar61->data;
                                            pvVar12 = pgVar58->data;
                                            do {
                                              lVar48 = lVar70 / lVar71;
                                              lVar54 = lVar70 % lVar71;
                                              lVar50 = lVar54 / lVar55;
                                              lVar54 = lVar54 % lVar55;
                                              if (0 < lVar52) {
                                                lVar51 = 0;
                                                do {
                                                  fVar90 = expf(*(float *)((long)pvVar12 +
                                                                          lVar51 * 4 +
                                                                          lVar50 * sVar6 +
                                                                          lVar54 * sVar5 +
                                                                          lVar48 * sVar7));
                                                  *(float *)((long)pvVar11 +
                                                            lVar51 * 4 +
                                                            lVar50 * sVar9 +
                                                            lVar54 * sVar8 + lVar48 * sVar10) =
                                                       fVar90;
                                                  lVar51 = lVar51 + 1;
                                                } while (lVar52 != lVar51);
                                              }
                                              lVar70 = lVar70 + 1;
                                            } while (lVar70 != lVar49);
                                            return;
                                          }
LAB_0012dd7a:
                                          pcVar53 = "nb00 == sizeof(src0_t)";
                                          uVar57 = 0x56;
                                          goto LAB_0012dd94;
                                        }
                                      }
                                      else if ((gVar2 == GGML_TYPE_F16) &&
                                              (pgVar61->type == GGML_TYPE_F16)) {
                                        cVar47 = ggml_is_contiguous_1(pgVar58);
                                        if (((cVar47 != '\0') &&
                                            (cVar47 = ggml_is_contiguous_1(pgVar61), cVar47 != '\0')
                                            ) && (cVar47 = ggml_are_same_shape(pgVar58,pgVar61),
                                                 cVar47 != '\0')) {
                                          if (pgVar61->nb[0] == 2) {
                                            if (pgVar58->nb[0] == 2) {
                                              lVar55 = pgVar58->ne[1];
                                              lVar71 = pgVar58->ne[2];
                                              sVar5 = pgVar58->nb[1];
                                              sVar6 = pgVar58->nb[2];
                                              sVar7 = pgVar58->nb[3];
                                              lVar52 = pgVar61->ne[0];
                                              gVar2 = pgVar59->type;
                                              iVar73 = *(int *)&pgVar59->field_0x4;
                                              lVar48 = ggml_nrows(pgVar58);
                                              lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                              lVar70 = (int)gVar2 * lVar49;
                                              lVar49 = lVar49 + lVar70;
                                              if (lVar48 <= lVar49) {
                                                lVar49 = lVar48;
                                              }
                                              if (lVar49 <= lVar70) {
                                                return;
                                              }
                                              lVar71 = lVar71 * lVar55;
                                              pvVar11 = pgVar58->data;
                                              do {
                                                lVar48 = lVar70 % lVar71;
                                                if (0 < lVar52) {
                                                  lVar50 = 0;
                                                  do {
                                                    auVar82._0_4_ =
                                                         expf(*(float *)(&ggml_table_f32_f16 +
                                                                        (ulong)*(ushort *)
                                                                                ((long)pvVar11 +
                                                                                lVar50 * 2 +
                                                                                (lVar48 / lVar55) *
                                                                                sVar6 + (lVar48 % 
                                                  lVar55) * sVar5 + (lVar70 / lVar71) * sVar7) * 4))
                                                  ;
                                                  auVar82._4_60_ = extraout_var_01;
                                                  auVar97 = vcvtps2ph_f16c(auVar82._0_16_,0);
                                                  vpextrw_avx(auVar97,0);
                                                  lVar50 = lVar50 + 1;
                                                  } while (lVar52 != lVar50);
                                                }
                                                lVar70 = lVar70 + 1;
                                              } while (lVar70 != lVar49);
                                              return;
                                            }
                                            goto LAB_0012dd7a;
                                          }
                                          goto LAB_0012dd5e;
                                        }
                                      }
                                      else if (gVar2 == GGML_TYPE_BF16) {
                                        gVar4 = pgVar61->type;
                                        in_RCX = (ulong)gVar4;
                                        if (gVar4 == GGML_TYPE_F32) {
                                          cVar47 = ggml_is_contiguous_1(pgVar58);
                                          if (((cVar47 != '\0') &&
                                              (cVar47 = ggml_is_contiguous_1(pgVar61),
                                              cVar47 != '\0')) &&
                                             (cVar47 = ggml_are_same_shape(pgVar58,pgVar61),
                                             cVar47 != '\0')) {
                                            if (pgVar61->nb[0] == 4) {
                                              if (pgVar58->nb[0] == 2) {
                                                lVar55 = pgVar58->ne[1];
                                                lVar71 = pgVar58->ne[2];
                                                sVar5 = pgVar58->nb[1];
                                                sVar6 = pgVar58->nb[2];
                                                sVar7 = pgVar58->nb[3];
                                                lVar52 = pgVar61->ne[0];
                                                sVar8 = pgVar61->nb[1];
                                                sVar9 = pgVar61->nb[2];
                                                sVar10 = pgVar61->nb[3];
                                                gVar2 = pgVar59->type;
                                                iVar73 = *(int *)&pgVar59->field_0x4;
                                                lVar48 = ggml_nrows(pgVar58);
                                                lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73
                                                ;
                                                lVar70 = (int)gVar2 * lVar49;
                                                lVar49 = lVar49 + lVar70;
                                                if (lVar48 <= lVar49) {
                                                  lVar49 = lVar48;
                                                }
                                                if (lVar49 <= lVar70) {
                                                  return;
                                                }
                                                lVar71 = lVar71 * lVar55;
                                                pvVar11 = pgVar61->data;
                                                pvVar12 = pgVar58->data;
                                                do {
                                                  lVar48 = lVar70 / lVar71;
                                                  lVar54 = lVar70 % lVar71;
                                                  lVar50 = lVar54 / lVar55;
                                                  lVar54 = lVar54 % lVar55;
                                                  if (0 < lVar52) {
                                                    lVar51 = 0;
                                                    do {
                                                      fVar90 = expf((float)((uint)*(ushort *)
                                                                                   ((long)pvVar12 +
                                                                                   lVar51 * 2 +
                                                                                   lVar50 * sVar6 +
                                                                                   lVar54 * sVar5 +
                                                                                   lVar48 * sVar7)
                                                                           << 0x10));
                                                      *(float *)((long)pvVar11 +
                                                                lVar51 * 4 +
                                                                lVar50 * sVar9 +
                                                                lVar54 * sVar8 + lVar48 * sVar10) =
                                                           fVar90;
                                                      lVar51 = lVar51 + 1;
                                                    } while (lVar52 != lVar51);
                                                  }
                                                  lVar70 = lVar70 + 1;
                                                } while (lVar70 != lVar49);
                                                return;
                                              }
                                              goto LAB_0012dd7a;
                                            }
                                            goto LAB_0012dd5e;
                                          }
                                        }
                                        else {
                                          if (gVar4 != GGML_TYPE_BF16) goto LAB_0012d87b;
                                          cVar47 = ggml_is_contiguous_1(pgVar58);
                                          if (((cVar47 != '\0') &&
                                              (cVar47 = ggml_is_contiguous_1(pgVar61),
                                              cVar47 != '\0')) &&
                                             (cVar47 = ggml_are_same_shape(pgVar58,pgVar61),
                                             cVar47 != '\0')) {
                                            if (pgVar61->nb[0] == 2) {
                                              if (pgVar58->nb[0] == 2) {
                                                lVar55 = pgVar58->ne[1];
                                                lVar71 = pgVar58->ne[2];
                                                sVar5 = pgVar58->nb[1];
                                                sVar6 = pgVar58->nb[2];
                                                sVar7 = pgVar58->nb[3];
                                                lVar52 = pgVar61->ne[0];
                                                sVar8 = pgVar61->nb[1];
                                                sVar9 = pgVar61->nb[2];
                                                sVar10 = pgVar61->nb[3];
                                                gVar2 = pgVar59->type;
                                                iVar73 = *(int *)&pgVar59->field_0x4;
                                                lVar48 = ggml_nrows(pgVar58);
                                                lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73
                                                ;
                                                lVar70 = (int)gVar2 * lVar49;
                                                lVar49 = lVar49 + lVar70;
                                                if (lVar48 <= lVar49) {
                                                  lVar49 = lVar48;
                                                }
                                                if (lVar49 <= lVar70) {
                                                  return;
                                                }
                                                lVar71 = lVar71 * lVar55;
                                                pvVar11 = pgVar61->data;
                                                pvVar12 = pgVar58->data;
                                                do {
                                                  lVar48 = lVar70 / lVar71;
                                                  lVar54 = lVar70 % lVar71;
                                                  lVar50 = lVar54 / lVar55;
                                                  lVar54 = lVar54 % lVar55;
                                                  if (0 < lVar52) {
                                                    lVar51 = 0;
                                                    do {
                                                      fVar90 = expf((float)((uint)*(ushort *)
                                                                                   ((long)pvVar12 +
                                                                                   lVar51 * 2 +
                                                                                   lVar50 * sVar6 +
                                                                                   lVar54 * sVar5 +
                                                                                   lVar48 * sVar7)
                                                                           << 0x10));
                                                      if ((uint)ABS(fVar90) < 0x7f800001) {
                                                        uVar56 = (ushort)((int)fVar90 + 0x7fff +
                                                                          ((uint)fVar90 >> 0x10 & 1)
                                                                         >> 0x10);
                                                      }
                                                      else {
                                                        uVar56 = (ushort)((uint)fVar90 >> 0x10) |
                                                                 0x40;
                                                      }
                                                      *(ushort *)
                                                       ((long)pvVar11 +
                                                       lVar51 * 2 +
                                                       lVar50 * sVar9 +
                                                       lVar54 * sVar8 + lVar48 * sVar10) = uVar56;
                                                      lVar51 = lVar51 + 1;
                                                    } while (lVar52 != lVar51);
                                                  }
                                                  lVar70 = lVar70 + 1;
                                                } while (lVar70 != lVar49);
                                                return;
                                              }
                                              goto LAB_0012dd7a;
                                            }
                                            goto LAB_0012dd5e;
                                          }
                                        }
                                      }
                                      else {
LAB_0012d87b:
                                        if ((gVar2 != GGML_TYPE_F16) ||
                                           (pgVar61->type != GGML_TYPE_F32)) {
                                          ggml_compute_forward_exp_cold_1();
                                          pgVar13 = pgVar58->src[0];
                                          gVar2 = pgVar13->type;
                                          if ((gVar2 == GGML_TYPE_F32) &&
                                             (pgVar58->type == GGML_TYPE_F32)) {
                                            cVar47 = ggml_is_contiguous_1(pgVar13);
                                            if (((cVar47 != '\0') &&
                                                (cVar47 = ggml_is_contiguous_1(pgVar58),
                                                cVar47 != '\0')) &&
                                               (cVar47 = ggml_are_same_shape(pgVar13,pgVar58),
                                               cVar47 != '\0')) {
                                              if (pgVar58->nb[0] != 4) goto LAB_0012e6c9;
                                              if (pgVar13->nb[0] == 4) {
                                                lVar55 = pgVar13->ne[1];
                                                lVar71 = pgVar13->ne[2];
                                                sVar5 = pgVar13->nb[1];
                                                sVar6 = pgVar13->nb[2];
                                                sVar7 = pgVar13->nb[3];
                                                lVar52 = pgVar58->ne[0];
                                                sVar8 = pgVar58->nb[1];
                                                sVar9 = pgVar58->nb[2];
                                                sVar10 = pgVar58->nb[3];
                                                gVar2 = pgVar61->type;
                                                iVar73 = *(int *)&pgVar61->field_0x4;
                                                lVar48 = ggml_nrows(pgVar13);
                                                lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73
                                                ;
                                                lVar70 = (int)gVar2 * lVar49;
                                                lVar49 = lVar49 + lVar70;
                                                if (lVar48 <= lVar49) {
                                                  lVar49 = lVar48;
                                                }
                                                if (lVar49 <= lVar70) {
                                                  return;
                                                }
                                                lVar71 = lVar71 * lVar55;
                                                pvVar11 = pgVar58->data;
                                                pvVar12 = pgVar13->data;
                                                do {
                                                  lVar48 = lVar70 / lVar71;
                                                  lVar54 = lVar70 % lVar71;
                                                  lVar50 = lVar54 / lVar55;
                                                  lVar54 = lVar54 % lVar55;
                                                  if (0 < lVar52) {
                                                    lVar51 = 0;
                                                    do {
                                                      fVar90 = *(float *)((long)pvVar12 +
                                                                         lVar51 * 4 +
                                                                         lVar50 * sVar6 +
                                                                         lVar54 * sVar5 +
                                                                         lVar48 * sVar7);
                                                      auVar104._0_4_ = (fVar90 + 3.0) / 6.0;
                                                      auVar104._4_12_ =
                                                           SUB6012((undefined1  [60])0x0,0);
                                                      auVar97 = vmaxss_avx(auVar104,ZEXT816(0) <<
                                                                                    0x40);
                                                      auVar97 = vminss_avx(auVar97,SUB6416(ZEXT464(
                                                  0x3f800000),0));
                                                  *(float *)((long)pvVar11 +
                                                            lVar51 * 4 +
                                                            lVar50 * sVar9 +
                                                            lVar54 * sVar8 + lVar48 * sVar10) =
                                                       fVar90 * auVar97._0_4_;
                                                  lVar51 = lVar51 + 1;
                                                  } while (lVar52 != lVar51);
                                                  }
                                                  lVar70 = lVar70 + 1;
                                                } while (lVar70 != lVar49);
                                                return;
                                              }
LAB_0012e6e5:
                                              pcVar53 = "nb00 == sizeof(src0_t)";
                                              uVar57 = 0x56;
                                              goto LAB_0012e6ff;
                                            }
                                          }
                                          else if ((gVar2 == GGML_TYPE_F16) &&
                                                  (pgVar58->type == GGML_TYPE_F16)) {
                                            cVar47 = ggml_is_contiguous_1(pgVar13);
                                            if (((cVar47 != '\0') &&
                                                (cVar47 = ggml_is_contiguous_1(pgVar58),
                                                cVar47 != '\0')) &&
                                               (cVar47 = ggml_are_same_shape(pgVar13,pgVar58),
                                               cVar47 != '\0')) {
                                              if (pgVar58->nb[0] == 2) {
                                                if (pgVar13->nb[0] == 2) {
                                                  lVar55 = pgVar13->ne[1];
                                                  lVar71 = pgVar13->ne[2];
                                                  sVar5 = pgVar13->nb[1];
                                                  sVar6 = pgVar13->nb[2];
                                                  sVar7 = pgVar13->nb[3];
                                                  lVar52 = pgVar58->ne[0];
                                                  gVar2 = pgVar61->type;
                                                  iVar73 = *(int *)&pgVar61->field_0x4;
                                                  lVar48 = ggml_nrows();
                                                  lVar49 = ((long)iVar73 + -1 + lVar48) /
                                                           (long)iVar73;
                                                  lVar70 = (int)gVar2 * lVar49;
                                                  lVar49 = lVar49 + lVar70;
                                                  if (lVar48 <= lVar49) {
                                                    lVar49 = lVar48;
                                                  }
                                                  if (lVar49 <= lVar70) {
                                                    return;
                                                  }
                                                  lVar71 = lVar71 * lVar55;
                                                  do {
                                                    lVar48 = lVar70 % lVar71;
                                                    if (0 < lVar52) {
                                                      lVar50 = 0;
                                                      do {
                                                        auVar102._0_4_ =
                                                             (*(float *)(&ggml_table_f32_f16 +
                                                                        (ulong)*(ushort *)
                                                                                ((long)pgVar13->data
                                                                                + lVar50 * 2 +
                                                                                  (lVar48 / lVar55)
                                                                                  * sVar6 + (lVar48 
                                                  % lVar55) * sVar5 + (lVar70 / lVar71) * sVar7) * 4
                                                  ) + 3.0) / 6.0;
                                                  auVar102._4_12_ = SUB6012((undefined1  [60])0x0,0)
                                                  ;
                                                  auVar97 = vmaxss_avx(auVar102,ZEXT816(0) << 0x40);
                                                  auVar97 = vminss_avx(auVar97,SUB6416(ZEXT464(
                                                  0x3f800000),0));
                                                  auVar97 = vcvtps2ph_f16c(ZEXT416((uint)(*(float *)
                                                  (&ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pgVar13->data +
                                                          lVar50 * 2 +
                                                          (lVar48 / lVar55) * sVar6 +
                                                          (lVar48 % lVar55) * sVar5 +
                                                          (lVar70 / lVar71) * sVar7) * 4) *
                                                  auVar97._0_4_)),0);
                                                  vpextrw_avx(auVar97,0);
                                                  lVar50 = lVar50 + 1;
                                                  } while (lVar52 != lVar50);
                                                  }
                                                  lVar70 = lVar70 + 1;
                                                  } while (lVar70 != lVar49);
                                                  return;
                                                }
                                                goto LAB_0012e6e5;
                                              }
                                              goto LAB_0012e6c9;
                                            }
                                          }
                                          else if (gVar2 == GGML_TYPE_BF16) {
                                            gVar4 = pgVar58->type;
                                            in_RCX = (ulong)gVar4;
                                            if (gVar4 == GGML_TYPE_F32) {
                                              cVar47 = ggml_is_contiguous_1(pgVar13);
                                              if (((cVar47 != '\0') &&
                                                  (cVar47 = ggml_is_contiguous_1(pgVar58),
                                                  cVar47 != '\0')) &&
                                                 (cVar47 = ggml_are_same_shape(pgVar13,pgVar58),
                                                 cVar47 != '\0')) {
                                                if (pgVar58->nb[0] == 4) {
                                                  if (pgVar13->nb[0] == 2) {
                                                    lVar55 = pgVar13->ne[1];
                                                    lVar71 = pgVar13->ne[2];
                                                    sVar5 = pgVar13->nb[1];
                                                    sVar6 = pgVar13->nb[2];
                                                    sVar7 = pgVar13->nb[3];
                                                    lVar52 = pgVar58->ne[0];
                                                    sVar8 = pgVar58->nb[1];
                                                    sVar9 = pgVar58->nb[2];
                                                    sVar10 = pgVar58->nb[3];
                                                    gVar2 = pgVar61->type;
                                                    iVar73 = *(int *)&pgVar61->field_0x4;
                                                    lVar48 = ggml_nrows(pgVar13);
                                                    lVar49 = ((long)iVar73 + -1 + lVar48) /
                                                             (long)iVar73;
                                                    lVar70 = (int)gVar2 * lVar49;
                                                    lVar49 = lVar49 + lVar70;
                                                    if (lVar48 <= lVar49) {
                                                      lVar49 = lVar48;
                                                    }
                                                    if (lVar49 <= lVar70) {
                                                      return;
                                                    }
                                                    lVar71 = lVar71 * lVar55;
                                                    pvVar11 = pgVar58->data;
                                                    pvVar12 = pgVar13->data;
                                                    auVar89 = vpbroadcastq_avx512f();
                                                    auVar85 = vbroadcastss_avx512f
                                                                        (ZEXT416(0x40400000));
                                                    auVar86 = vbroadcastss_avx512f
                                                                        (ZEXT416(0x40c00000));
                                                    auVar87 = vpmovsxbq_avx512f(ZEXT816(
                                                  0xf0e0d0c0b0a0908));
                                                  auVar88 = vpmovsxbq_avx512f(ZEXT816(
                                                  0x706050403020100));
                                                  auVar82 = vbroadcastss_avx512f
                                                                      (ZEXT416(0x3f800000));
                                                  do {
                                                    lVar48 = lVar70 / lVar71;
                                                    lVar54 = lVar70 % lVar71;
                                                    lVar50 = lVar54 / lVar55;
                                                    lVar54 = lVar54 % lVar55;
                                                    if (0 < lVar52) {
                                                      uVar69 = 0;
                                                      do {
                                                        auVar83 = vpbroadcastq_avx512f();
                                                        auVar84 = vporq_avx512f(auVar83,auVar87);
                                                        auVar83 = vporq_avx512f(auVar83,auVar88);
                                                        uVar57 = vpcmpuq_avx512f(auVar83,auVar89,2);
                                                        bVar45 = (byte)uVar57;
                                                        uVar57 = vpcmpuq_avx512f(auVar84,auVar89,2);
                                                        bVar46 = (byte)uVar57;
                                                        uVar56 = CONCAT11(bVar46,bVar45);
                                                        auVar81 = vmovdqu16_avx512vl(*(undefined1
                                                                                       (*) [32])
                                                                                      ((long)pvVar12
                                                                                      + uVar69 * 2 +
                                                                                        lVar50 * 
                                                  sVar6 + lVar54 * sVar5 + lVar48 * sVar7));
                                                  auVar79._2_2_ =
                                                       (ushort)((byte)(uVar56 >> 1) & 1) *
                                                       auVar81._2_2_;
                                                  auVar79._0_2_ =
                                                       (ushort)(bVar45 & 1) * auVar81._0_2_;
                                                  auVar79._4_2_ =
                                                       (ushort)((byte)(uVar56 >> 2) & 1) *
                                                       auVar81._4_2_;
                                                  auVar79._6_2_ =
                                                       (ushort)((byte)(uVar56 >> 3) & 1) *
                                                       auVar81._6_2_;
                                                  auVar79._8_2_ =
                                                       (ushort)((byte)(uVar56 >> 4) & 1) *
                                                       auVar81._8_2_;
                                                  auVar79._10_2_ =
                                                       (ushort)((byte)(uVar56 >> 5) & 1) *
                                                       auVar81._10_2_;
                                                  auVar79._12_2_ =
                                                       (ushort)((byte)(uVar56 >> 6) & 1) *
                                                       auVar81._12_2_;
                                                  auVar79._14_2_ =
                                                       (ushort)((byte)(uVar56 >> 7) & 1) *
                                                       auVar81._14_2_;
                                                  auVar79._16_2_ =
                                                       (ushort)(bVar46 & 1) * auVar81._16_2_;
                                                  auVar79._18_2_ =
                                                       (ushort)(bVar46 >> 1 & 1) * auVar81._18_2_;
                                                  auVar79._20_2_ =
                                                       (ushort)(bVar46 >> 2 & 1) * auVar81._20_2_;
                                                  auVar79._22_2_ =
                                                       (ushort)(bVar46 >> 3 & 1) * auVar81._22_2_;
                                                  auVar79._24_2_ =
                                                       (ushort)(bVar46 >> 4 & 1) * auVar81._24_2_;
                                                  auVar79._26_2_ =
                                                       (ushort)(bVar46 >> 5 & 1) * auVar81._26_2_;
                                                  auVar79._28_2_ =
                                                       (ushort)(bVar46 >> 6 & 1) * auVar81._28_2_;
                                                  auVar79._30_2_ =
                                                       (ushort)(bVar46 >> 7) * auVar81._30_2_;
                                                  auVar83 = vpmovzxwd_avx512f(auVar79);
                                                  auVar83 = vpslld_avx512f(auVar83,0x10);
                                                  auVar84 = vaddps_avx512f(auVar83,auVar85);
                                                  auVar84 = vdivps_avx512f(auVar84,auVar86);
                                                  auVar84 = vmaxps_avx512f(auVar84,ZEXT1664(ZEXT816(
                                                  0) << 0x40));
                                                  auVar84 = vminps_avx512f(auVar84,auVar82);
                                                  auVar83 = vmulps_avx512f(auVar84,auVar83);
                                                  puVar1 = (uint *)((long)pvVar11 +
                                                                   uVar69 * 4 +
                                                                   lVar50 * sVar9 +
                                                                   lVar54 * sVar8 + lVar48 * sVar10)
                                                  ;
                                                  bVar44 = (bool)((byte)(uVar56 >> 1) & 1);
                                                  bVar14 = (bool)((byte)(uVar56 >> 2) & 1);
                                                  bVar15 = (bool)((byte)(uVar56 >> 3) & 1);
                                                  bVar16 = (bool)((byte)(uVar56 >> 4) & 1);
                                                  bVar17 = (bool)((byte)(uVar56 >> 5) & 1);
                                                  bVar18 = (bool)((byte)(uVar56 >> 6) & 1);
                                                  bVar21 = (bool)((byte)(uVar56 >> 7) & 1);
                                                  bVar25 = (bool)(bVar46 >> 1 & 1);
                                                  bVar28 = (bool)(bVar46 >> 2 & 1);
                                                  bVar31 = (bool)(bVar46 >> 3 & 1);
                                                  bVar34 = (bool)(bVar46 >> 4 & 1);
                                                  bVar37 = (bool)(bVar46 >> 5 & 1);
                                                  bVar40 = (bool)(bVar46 >> 6 & 1);
                                                  *puVar1 = (uint)(bVar45 & 1) * auVar83._0_4_ |
                                                            (uint)!(bool)(bVar45 & 1) * *puVar1;
                                                  puVar1[1] = (uint)bVar44 * auVar83._4_4_ |
                                                              (uint)!bVar44 * puVar1[1];
                                                  puVar1[2] = (uint)bVar14 * auVar83._8_4_ |
                                                              (uint)!bVar14 * puVar1[2];
                                                  puVar1[3] = (uint)bVar15 * auVar83._12_4_ |
                                                              (uint)!bVar15 * puVar1[3];
                                                  puVar1[4] = (uint)bVar16 * auVar83._16_4_ |
                                                              (uint)!bVar16 * puVar1[4];
                                                  puVar1[5] = (uint)bVar17 * auVar83._20_4_ |
                                                              (uint)!bVar17 * puVar1[5];
                                                  puVar1[6] = (uint)bVar18 * auVar83._24_4_ |
                                                              (uint)!bVar18 * puVar1[6];
                                                  puVar1[7] = (uint)bVar21 * auVar83._28_4_ |
                                                              (uint)!bVar21 * puVar1[7];
                                                  puVar1[8] = (uint)(bVar46 & 1) * auVar83._32_4_ |
                                                              (uint)!(bool)(bVar46 & 1) * puVar1[8];
                                                  puVar1[9] = (uint)bVar25 * auVar83._36_4_ |
                                                              (uint)!bVar25 * puVar1[9];
                                                  puVar1[10] = (uint)bVar28 * auVar83._40_4_ |
                                                               (uint)!bVar28 * puVar1[10];
                                                  puVar1[0xb] = (uint)bVar31 * auVar83._44_4_ |
                                                                (uint)!bVar31 * puVar1[0xb];
                                                  puVar1[0xc] = (uint)bVar34 * auVar83._48_4_ |
                                                                (uint)!bVar34 * puVar1[0xc];
                                                  puVar1[0xd] = (uint)bVar37 * auVar83._52_4_ |
                                                                (uint)!bVar37 * puVar1[0xd];
                                                  puVar1[0xe] = (uint)bVar40 * auVar83._56_4_ |
                                                                (uint)!bVar40 * puVar1[0xe];
                                                  puVar1[0xf] = (uint)(bVar46 >> 7) * auVar83._60_4_
                                                                | (uint)!(bool)(bVar46 >> 7) *
                                                                  puVar1[0xf];
                                                  uVar69 = uVar69 + 0x10;
                                                  } while ((lVar52 + 0xfU & 0xfffffffffffffff0) !=
                                                           uVar69);
                                                  }
                                                  lVar70 = lVar70 + 1;
                                                  } while (lVar70 != lVar49);
                                                  return;
                                                  }
                                                  goto LAB_0012e6e5;
                                                }
                                                goto LAB_0012e6c9;
                                              }
                                            }
                                            else {
                                              if (gVar4 != GGML_TYPE_BF16) goto LAB_0012e170;
                                              cVar47 = ggml_is_contiguous_1(pgVar13);
                                              if (((cVar47 != '\0') &&
                                                  (cVar47 = ggml_is_contiguous_1(pgVar58),
                                                  cVar47 != '\0')) &&
                                                 (cVar47 = ggml_are_same_shape(pgVar13,pgVar58),
                                                 cVar47 != '\0')) {
                                                if (pgVar58->nb[0] == 2) {
                                                  if (pgVar13->nb[0] == 2) {
                                                    lVar55 = pgVar13->ne[1];
                                                    lVar71 = pgVar13->ne[2];
                                                    sVar5 = pgVar13->nb[1];
                                                    sVar6 = pgVar13->nb[2];
                                                    sVar7 = pgVar13->nb[3];
                                                    lVar52 = pgVar58->ne[0];
                                                    sVar8 = pgVar58->nb[1];
                                                    sVar9 = pgVar58->nb[2];
                                                    sVar10 = pgVar58->nb[3];
                                                    gVar2 = pgVar61->type;
                                                    iVar73 = *(int *)&pgVar61->field_0x4;
                                                    lVar48 = ggml_nrows(pgVar13);
                                                    lVar49 = ((long)iVar73 + -1 + lVar48) /
                                                             (long)iVar73;
                                                    lVar70 = (int)gVar2 * lVar49;
                                                    lVar49 = lVar49 + lVar70;
                                                    if (lVar48 <= lVar49) {
                                                      lVar49 = lVar48;
                                                    }
                                                    if (lVar49 <= lVar70) {
                                                      return;
                                                    }
                                                    lVar71 = lVar71 * lVar55;
                                                    pvVar11 = pgVar58->data;
                                                    pvVar12 = pgVar13->data;
                                                    do {
                                                      lVar48 = lVar70 / lVar71;
                                                      lVar54 = lVar70 % lVar71;
                                                      lVar50 = lVar54 / lVar55;
                                                      lVar54 = lVar54 % lVar55;
                                                      if (0 < lVar52) {
                                                        lVar51 = 0;
                                                        do {
                                                          fVar90 = (float)((uint)*(ushort *)
                                                                                  ((long)pvVar12 +
                                                                                  lVar51 * 2 +
                                                                                  lVar50 * sVar6 +
                                                                                  lVar54 * sVar5 +
                                                                                  lVar48 * sVar7) <<
                                                                          0x10);
                                                          auVar103._0_4_ = (fVar90 + 3.0) / 6.0;
                                                          auVar103._4_12_ =
                                                               SUB6012((undefined1  [60])0x0,0);
                                                          auVar97 = vmaxss_avx(auVar103,ZEXT816(0)
                                                                                        << 0x40);
                                                          auVar97 = vminss_avx(auVar97,SUB6416(
                                                  ZEXT464(0x3f800000),0));
                                                  fVar90 = auVar97._0_4_ * fVar90;
                                                  if ((uint)ABS(fVar90) < 0x7f800001) {
                                                    uVar56 = (ushort)((int)fVar90 + 0x7fff +
                                                                      ((uint)fVar90 >> 0x10 & 1) >>
                                                                     0x10);
                                                  }
                                                  else {
                                                    uVar56 = (ushort)((uint)fVar90 >> 0x10) | 0x40;
                                                  }
                                                  *(ushort *)
                                                   ((long)pvVar11 +
                                                   lVar51 * 2 +
                                                   lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10
                                                   ) = uVar56;
                                                  lVar51 = lVar51 + 1;
                                                  } while (lVar52 != lVar51);
                                                  }
                                                  lVar70 = lVar70 + 1;
                                                  } while (lVar70 != lVar49);
                                                  return;
                                                  }
                                                  goto LAB_0012e6e5;
                                                }
                                                goto LAB_0012e6c9;
                                              }
                                            }
                                          }
                                          else {
LAB_0012e170:
                                            if ((gVar2 != GGML_TYPE_F16) ||
                                               (pgVar58->type != GGML_TYPE_F32)) {
                                              pgVar62 = pgVar13;
                                              pgVar64 = pgVar58;
                                              ggml_compute_forward_hardswish_cold_1();
                                              pgVar66 = pgVar62->src[0];
                                              gVar2 = pgVar66->type;
                                              pgStack_560 = pgVar66;
                                              pgStack_530 = pgVar62;
                                              pgStack_528 = pgVar61;
                                              pgStack_520 = pgVar58;
                                              pgStack_518 = pgVar60;
                                              pgStack_510 = pgVar13;
                                              pgStack_508 = pgVar59;
                                              if ((gVar2 == GGML_TYPE_F32) &&
                                                 (pgVar62->type == GGML_TYPE_F32)) {
                                                pgStack_568 = (ggml_tensor *)0x12ec0c;
                                                cVar47 = ggml_is_contiguous_1(pgVar66);
                                                if (cVar47 != '\0') {
                                                  pgStack_568 = (ggml_tensor *)0x12ec1c;
                                                  cVar47 = ggml_is_contiguous_1(pgVar62);
                                                  if (cVar47 != '\0') {
                                                    pgStack_568 = (ggml_tensor *)0x12ec2f;
                                                    cVar47 = ggml_are_same_shape(pgVar66,pgVar62);
                                                    if (cVar47 != '\0') {
                                                      if (pgVar62->nb[0] != 4) goto LAB_0012ef51;
                                                      if (pgVar66->nb[0] == 4) {
                                                        lVar55 = pgVar66->ne[1];
                                                        lVar71 = pgVar66->ne[2];
                                                        sStack_538 = pgVar66->nb[1];
                                                        sStack_540 = pgVar66->nb[2];
                                                        sStack_548 = pgVar66->nb[3];
                                                        lVar52 = pgVar62->ne[0];
                                                        sStack_550 = pgVar62->nb[1];
                                                        sVar5 = pgVar62->nb[2];
                                                        sVar6 = pgVar62->nb[3];
                                                        gVar2 = pgVar64->type;
                                                        sStack_558 = (size_t)*(int *)&pgVar64->
                                                  field_0x4;
                                                  pgStack_568 = (ggml_tensor *)0x12eca5;
                                                  lVar48 = ggml_nrows();
                                                  lVar49 = (long)(sStack_558 + -1 + lVar48) /
                                                           (long)sStack_558;
                                                  lVar70 = (int)gVar2 * lVar49;
                                                  lVar49 = lVar49 + lVar70;
                                                  if (lVar48 <= lVar49) {
                                                    lVar49 = lVar48;
                                                  }
                                                  if (lVar49 <= lVar70) {
                                                    return;
                                                  }
                                                  lVar71 = lVar71 * lVar55;
                                                  pvVar11 = pgStack_530->data;
                                                  pvVar12 = pgStack_560->data;
                                                  do {
                                                    lVar48 = lVar70 / lVar71;
                                                    lVar54 = lVar70 % lVar71;
                                                    lVar50 = lVar54 / lVar55;
                                                    lVar54 = lVar54 % lVar55;
                                                    if (0 < lVar52) {
                                                      lVar51 = 0;
                                                      do {
                                                        fVar90 = *(float *)((long)pvVar12 +
                                                                           lVar51 * 4 +
                                                                           lVar50 * sStack_540 +
                                                                           lVar54 * sStack_538 +
                                                                           lVar48 * sStack_548);
                                                        *(float *)((long)pvVar11 +
                                                                  lVar51 * 4 +
                                                                  lVar50 * sVar5 +
                                                                  lVar54 * sStack_550 +
                                                                  lVar48 * sVar6) = fVar90 * fVar90;
                                                        lVar51 = lVar51 + 1;
                                                      } while (lVar52 != lVar51);
                                                    }
                                                    lVar70 = lVar70 + 1;
                                                  } while (lVar70 != lVar49);
                                                  return;
                                                  }
LAB_0012ef6d:
                                                  pcVar53 = "nb00 == sizeof(src0_t)";
                                                  uVar57 = 0x56;
                                                  goto LAB_0012ef87;
                                                  }
                                                  }
                                                }
                                              }
                                              else if ((gVar2 == GGML_TYPE_F16) &&
                                                      (pgVar62->type == GGML_TYPE_F16)) {
                                                pgStack_568 = (ggml_tensor *)0x12e75e;
                                                cVar47 = ggml_is_contiguous_1(pgVar66);
                                                if (cVar47 != '\0') {
                                                  pgStack_568 = (ggml_tensor *)0x12e76e;
                                                  cVar47 = ggml_is_contiguous_1(pgVar62);
                                                  if (cVar47 != '\0') {
                                                    pgStack_568 = (ggml_tensor *)0x12e781;
                                                    cVar47 = ggml_are_same_shape(pgVar66,pgVar62);
                                                    if (cVar47 != '\0') {
                                                      if (pgVar62->nb[0] == 2) {
                                                        if (pgVar66->nb[0] == 2) {
                                                          lVar55 = pgVar66->ne[1];
                                                          lVar71 = pgVar66->ne[2];
                                                          sStack_538 = pgVar66->nb[1];
                                                          sStack_540 = pgVar66->nb[2];
                                                          sStack_548 = pgVar66->nb[3];
                                                          lVar52 = pgVar62->ne[0];
                                                          sStack_550 = pgVar62->nb[1];
                                                          sStack_558 = pgVar62->nb[2];
                                                          gVar2 = pgVar64->type;
                                                          iVar73 = *(int *)&pgVar64->field_0x4;
                                                          pgStack_568 = (ggml_tensor *)0x12e7f5;
                                                          lVar48 = ggml_nrows();
                                                          lVar49 = ((long)iVar73 + -1 + lVar48) /
                                                                   (long)iVar73;
                                                          lVar70 = (int)gVar2 * lVar49;
                                                          lVar49 = lVar49 + lVar70;
                                                          if (lVar48 <= lVar49) {
                                                            lVar49 = lVar48;
                                                          }
                                                          if (lVar49 <= lVar70) {
                                                            return;
                                                          }
                                                          lVar71 = lVar71 * lVar55;
                                                          do {
                                                            lVar48 = lVar70 % lVar71;
                                                            if (0 < lVar52) {
                                                              lVar50 = 0;
                                                              do {
                                                                auVar97 = vcvtps2ph_f16c(ZEXT416((
                                                  uint)(*(float *)(&ggml_table_f32_f16 +
                                                                  (ulong)*(ushort *)
                                                                          ((long)pgStack_560->data +
                                                                          lVar50 * 2 +
                                                                          (lVar48 / lVar55) *
                                                                          sStack_540 +
                                                                          (lVar48 % lVar55) *
                                                                          sStack_538 +
                                                                          (lVar70 / lVar71) *
                                                                          sStack_548) * 4) *
                                                       *(float *)(&ggml_table_f32_f16 +
                                                                 (ulong)*(ushort *)
                                                                         ((long)pgStack_560->data +
                                                                         lVar50 * 2 +
                                                                         (lVar48 / lVar55) *
                                                                         sStack_540 +
                                                                         (lVar48 % lVar55) *
                                                                         sStack_538 +
                                                                         (lVar70 / lVar71) *
                                                                         sStack_548) * 4))),0);
                                                  vpextrw_avx(auVar97,0);
                                                  lVar50 = lVar50 + 1;
                                                  } while (lVar52 != lVar50);
                                                  }
                                                  lVar70 = lVar70 + 1;
                                                  } while (lVar70 != lVar49);
                                                  return;
                                                  }
                                                  goto LAB_0012ef6d;
                                                  }
                                                  goto LAB_0012ef51;
                                                  }
                                                  }
                                                }
                                              }
                                              else if (gVar2 == GGML_TYPE_BF16) {
                                                gVar4 = pgVar62->type;
                                                in_RCX = (ulong)gVar4;
                                                if (gVar4 == GGML_TYPE_F32) {
                                                  pgStack_568 = (ggml_tensor *)0x12ed6d;
                                                  cVar47 = ggml_is_contiguous_1(pgVar66);
                                                  if (cVar47 != '\0') {
                                                    pgStack_568 = (ggml_tensor *)0x12ed7d;
                                                    cVar47 = ggml_is_contiguous_1(pgVar62);
                                                    if (cVar47 != '\0') {
                                                      pgStack_568 = (ggml_tensor *)0x12ed90;
                                                      cVar47 = ggml_are_same_shape(pgVar66,pgVar62);
                                                      if (cVar47 != '\0') {
                                                        if (pgVar62->nb[0] == 4) {
                                                          if (pgVar66->nb[0] == 2) {
                                                            lVar55 = pgVar66->ne[1];
                                                            lVar71 = pgVar66->ne[2];
                                                            sStack_538 = pgVar66->nb[1];
                                                            sStack_540 = pgVar66->nb[2];
                                                            sStack_548 = pgVar66->nb[3];
                                                            lVar52 = pgVar62->ne[0];
                                                            sStack_550 = pgVar62->nb[1];
                                                            sStack_558 = pgVar62->nb[2];
                                                            pgStack_560 = (ggml_tensor *)
                                                                          pgVar62->nb[3];
                                                            gVar2 = pgVar64->type;
                                                            iVar73 = *(int *)&pgVar64->field_0x4;
                                                            pgStack_568 = (ggml_tensor *)0x12ee09;
                                                            lVar48 = ggml_nrows(pgVar66);
                                                            lVar49 = ((long)iVar73 + -1 + lVar48) /
                                                                     (long)iVar73;
                                                            lVar70 = (int)gVar2 * lVar49;
                                                            lVar49 = lVar49 + lVar70;
                                                            if (lVar48 <= lVar49) {
                                                              lVar49 = lVar48;
                                                            }
                                                            if (lVar49 <= lVar70) {
                                                              return;
                                                            }
                                                            lVar71 = lVar71 * lVar55;
                                                            pvVar11 = pgStack_530->data;
                                                            pvVar12 = pgVar66->data;
                                                            auVar89 = vpbroadcastq_avx512f();
                                                            auVar85 = vpmovsxbq_avx512f(ZEXT816(
                                                  0xf0e0d0c0b0a0908));
                                                  auVar86 = vpmovsxbq_avx512f(ZEXT816(
                                                  0x706050403020100));
                                                  do {
                                                    lVar48 = lVar70 / lVar71;
                                                    lVar54 = lVar70 % lVar71;
                                                    lVar50 = lVar54 / lVar55;
                                                    lVar54 = lVar54 % lVar55;
                                                    if (0 < lVar52) {
                                                      uVar69 = 0;
                                                      do {
                                                        auVar87 = vpbroadcastq_avx512f();
                                                        auVar88 = vporq_avx512f(auVar87,auVar85);
                                                        auVar87 = vporq_avx512f(auVar87,auVar86);
                                                        uVar57 = vpcmpuq_avx512f(auVar87,auVar89,2);
                                                        bVar45 = (byte)uVar57;
                                                        uVar57 = vpcmpuq_avx512f(auVar88,auVar89,2);
                                                        bVar46 = (byte)uVar57;
                                                        uVar56 = CONCAT11(bVar46,bVar45);
                                                        auVar81 = vmovdqu16_avx512vl(*(undefined1
                                                                                       (*) [32])
                                                                                      ((long)pvVar12
                                                                                      + uVar69 * 2 +
                                                                                        lVar50 * 
                                                  sStack_540 +
                                                  lVar54 * sStack_538 + lVar48 * sStack_548));
                                                  auVar80._2_2_ =
                                                       (ushort)((byte)(uVar56 >> 1) & 1) *
                                                       auVar81._2_2_;
                                                  auVar80._0_2_ =
                                                       (ushort)(bVar45 & 1) * auVar81._0_2_;
                                                  auVar80._4_2_ =
                                                       (ushort)((byte)(uVar56 >> 2) & 1) *
                                                       auVar81._4_2_;
                                                  auVar80._6_2_ =
                                                       (ushort)((byte)(uVar56 >> 3) & 1) *
                                                       auVar81._6_2_;
                                                  auVar80._8_2_ =
                                                       (ushort)((byte)(uVar56 >> 4) & 1) *
                                                       auVar81._8_2_;
                                                  auVar80._10_2_ =
                                                       (ushort)((byte)(uVar56 >> 5) & 1) *
                                                       auVar81._10_2_;
                                                  auVar80._12_2_ =
                                                       (ushort)((byte)(uVar56 >> 6) & 1) *
                                                       auVar81._12_2_;
                                                  auVar80._14_2_ =
                                                       (ushort)((byte)(uVar56 >> 7) & 1) *
                                                       auVar81._14_2_;
                                                  auVar80._16_2_ =
                                                       (ushort)(bVar46 & 1) * auVar81._16_2_;
                                                  auVar80._18_2_ =
                                                       (ushort)(bVar46 >> 1 & 1) * auVar81._18_2_;
                                                  auVar80._20_2_ =
                                                       (ushort)(bVar46 >> 2 & 1) * auVar81._20_2_;
                                                  auVar80._22_2_ =
                                                       (ushort)(bVar46 >> 3 & 1) * auVar81._22_2_;
                                                  auVar80._24_2_ =
                                                       (ushort)(bVar46 >> 4 & 1) * auVar81._24_2_;
                                                  auVar80._26_2_ =
                                                       (ushort)(bVar46 >> 5 & 1) * auVar81._26_2_;
                                                  auVar80._28_2_ =
                                                       (ushort)(bVar46 >> 6 & 1) * auVar81._28_2_;
                                                  auVar80._30_2_ =
                                                       (ushort)(bVar46 >> 7) * auVar81._30_2_;
                                                  auVar87 = vpmovzxwd_avx512f(auVar80);
                                                  auVar87 = vpslld_avx512f(auVar87,0x10);
                                                  auVar87 = vmulps_avx512f(auVar87,auVar87);
                                                  puVar1 = (uint *)((long)pvVar11 +
                                                                   uVar69 * 4 +
                                                                   lVar50 * sStack_558 +
                                                                   lVar54 * sStack_550 +
                                                                   lVar48 * (long)pgStack_560);
                                                  bVar44 = (bool)((byte)(uVar56 >> 1) & 1);
                                                  bVar14 = (bool)((byte)(uVar56 >> 2) & 1);
                                                  bVar15 = (bool)((byte)(uVar56 >> 3) & 1);
                                                  bVar16 = (bool)((byte)(uVar56 >> 4) & 1);
                                                  bVar17 = (bool)((byte)(uVar56 >> 5) & 1);
                                                  bVar18 = (bool)((byte)(uVar56 >> 6) & 1);
                                                  bVar21 = (bool)((byte)(uVar56 >> 7) & 1);
                                                  bVar25 = (bool)(bVar46 >> 1 & 1);
                                                  bVar28 = (bool)(bVar46 >> 2 & 1);
                                                  bVar31 = (bool)(bVar46 >> 3 & 1);
                                                  bVar34 = (bool)(bVar46 >> 4 & 1);
                                                  bVar37 = (bool)(bVar46 >> 5 & 1);
                                                  bVar40 = (bool)(bVar46 >> 6 & 1);
                                                  *puVar1 = (uint)(bVar45 & 1) * auVar87._0_4_ |
                                                            (uint)!(bool)(bVar45 & 1) * *puVar1;
                                                  puVar1[1] = (uint)bVar44 * auVar87._4_4_ |
                                                              (uint)!bVar44 * puVar1[1];
                                                  puVar1[2] = (uint)bVar14 * auVar87._8_4_ |
                                                              (uint)!bVar14 * puVar1[2];
                                                  puVar1[3] = (uint)bVar15 * auVar87._12_4_ |
                                                              (uint)!bVar15 * puVar1[3];
                                                  puVar1[4] = (uint)bVar16 * auVar87._16_4_ |
                                                              (uint)!bVar16 * puVar1[4];
                                                  puVar1[5] = (uint)bVar17 * auVar87._20_4_ |
                                                              (uint)!bVar17 * puVar1[5];
                                                  puVar1[6] = (uint)bVar18 * auVar87._24_4_ |
                                                              (uint)!bVar18 * puVar1[6];
                                                  puVar1[7] = (uint)bVar21 * auVar87._28_4_ |
                                                              (uint)!bVar21 * puVar1[7];
                                                  puVar1[8] = (uint)(bVar46 & 1) * auVar87._32_4_ |
                                                              (uint)!(bool)(bVar46 & 1) * puVar1[8];
                                                  puVar1[9] = (uint)bVar25 * auVar87._36_4_ |
                                                              (uint)!bVar25 * puVar1[9];
                                                  puVar1[10] = (uint)bVar28 * auVar87._40_4_ |
                                                               (uint)!bVar28 * puVar1[10];
                                                  puVar1[0xb] = (uint)bVar31 * auVar87._44_4_ |
                                                                (uint)!bVar31 * puVar1[0xb];
                                                  puVar1[0xc] = (uint)bVar34 * auVar87._48_4_ |
                                                                (uint)!bVar34 * puVar1[0xc];
                                                  puVar1[0xd] = (uint)bVar37 * auVar87._52_4_ |
                                                                (uint)!bVar37 * puVar1[0xd];
                                                  puVar1[0xe] = (uint)bVar40 * auVar87._56_4_ |
                                                                (uint)!bVar40 * puVar1[0xe];
                                                  puVar1[0xf] = (uint)(bVar46 >> 7) * auVar87._60_4_
                                                                | (uint)!(bool)(bVar46 >> 7) *
                                                                  puVar1[0xf];
                                                  uVar69 = uVar69 + 0x10;
                                                  } while ((lVar52 + 0xfU & 0xfffffffffffffff0) !=
                                                           uVar69);
                                                  }
                                                  lVar70 = lVar70 + 1;
                                                  } while (lVar70 != lVar49);
                                                  return;
                                                  }
                                                  goto LAB_0012ef6d;
                                                  }
                                                  goto LAB_0012ef51;
                                                  }
                                                  }
                                                  }
                                                }
                                                else {
                                                  if (gVar4 != GGML_TYPE_BF16) goto LAB_0012ea86;
                                                  pgStack_568 = (ggml_tensor *)0x12e8ef;
                                                  cVar47 = ggml_is_contiguous_1(pgVar66);
                                                  if (cVar47 != '\0') {
                                                    pgStack_568 = (ggml_tensor *)0x12e8ff;
                                                    cVar47 = ggml_is_contiguous_1(pgVar62);
                                                    if (cVar47 != '\0') {
                                                      pgStack_568 = (ggml_tensor *)0x12e912;
                                                      cVar47 = ggml_are_same_shape(pgVar66,pgVar62);
                                                      if (cVar47 != '\0') {
                                                        if (pgVar62->nb[0] == 2) {
                                                          if (pgVar66->nb[0] == 2) {
                                                            lVar55 = pgVar66->ne[1];
                                                            lVar71 = pgVar66->ne[2];
                                                            pgStack_560 = (ggml_tensor *)
                                                                          pgVar66->nb[1];
                                                            sStack_538 = pgVar66->nb[2];
                                                            sStack_540 = pgVar66->nb[3];
                                                            lVar52 = pgVar62->ne[0];
                                                            sStack_548 = pgVar62->nb[1];
                                                            sStack_550 = pgVar62->nb[2];
                                                            sStack_558 = pgVar62->nb[3];
                                                            gVar2 = pgVar64->type;
                                                            iVar73 = *(int *)&pgVar64->field_0x4;
                                                            pgStack_568 = (ggml_tensor *)0x12e98b;
                                                            lVar48 = ggml_nrows(pgVar66);
                                                            lVar49 = ((long)iVar73 + -1 + lVar48) /
                                                                     (long)iVar73;
                                                            lVar70 = (int)gVar2 * lVar49;
                                                            lVar49 = lVar49 + lVar70;
                                                            if (lVar48 <= lVar49) {
                                                              lVar49 = lVar48;
                                                            }
                                                            if (lVar49 <= lVar70) {
                                                              return;
                                                            }
                                                            lVar71 = lVar71 * lVar55;
                                                            pvVar11 = pgStack_530->data;
                                                            pvVar12 = pgVar66->data;
                                                            do {
                                                              lVar48 = lVar70 / lVar71;
                                                              lVar54 = lVar70 % lVar71;
                                                              lVar50 = lVar54 / lVar55;
                                                              lVar54 = lVar54 % lVar55;
                                                              if (0 < lVar52) {
                                                                lVar51 = 0;
                                                                do {
                                                                  fVar90 = (float)((uint)*(ushort *)
                                                                                          ((long)
                                                  pvVar12 + lVar51 * 2 +
                                                            lVar50 * sStack_538 +
                                                            lVar54 * (long)pgStack_560 +
                                                            lVar48 * sStack_540) << 0x10);
                                                  fVar90 = fVar90 * fVar90;
                                                  if ((uint)ABS(fVar90) < 0x7f800001) {
                                                    uVar56 = (ushort)((int)fVar90 + 0x7fff +
                                                                      ((uint)fVar90 >> 0x10 & 1) >>
                                                                     0x10);
                                                  }
                                                  else {
                                                    uVar56 = (ushort)((uint)fVar90 >> 0x10) | 0x40;
                                                  }
                                                  *(ushort *)
                                                   ((long)pvVar11 +
                                                   lVar51 * 2 +
                                                   lVar50 * sStack_550 +
                                                   lVar54 * sStack_548 + lVar48 * sStack_558) =
                                                       uVar56;
                                                  lVar51 = lVar51 + 1;
                                                  } while (lVar52 != lVar51);
                                                  }
                                                  lVar70 = lVar70 + 1;
                                                  } while (lVar70 != lVar49);
                                                  return;
                                                  }
                                                  goto LAB_0012ef6d;
                                                  }
                                                  goto LAB_0012ef51;
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                              else {
LAB_0012ea86:
                                                if ((gVar2 != GGML_TYPE_F16) ||
                                                   (pgVar62->type != GGML_TYPE_F32)) {
                                                  pgStack_568 = (ggml_tensor *)
                                                                ggml_compute_forward_sqrt;
                                                  pgVar61 = pgVar66;
                                                  pgVar65 = pgVar62;
                                                  ggml_compute_forward_sqr_cold_1();
                                                  pgVar58 = pgVar61->src[0];
                                                  gVar2 = pgVar58->type;
                                                  pgStack_5a8 = pgVar58;
                                                  pgStack_5a0 = pgVar61;
                                                  pgStack_590 = pgVar66;
                                                  pgStack_588 = pgVar62;
                                                  pgStack_580 = pgVar60;
                                                  pgStack_578 = pgVar13;
                                                  pgStack_570 = pgVar59;
                                                  pgStack_568 = pgVar64;
                                                  if ((gVar2 == GGML_TYPE_F32) &&
                                                     (pgVar61->type == GGML_TYPE_F32)) {
                                                    pgStack_5f0 = (ggml_tensor *)0x12f515;
                                                    cVar47 = ggml_is_contiguous_1(pgVar58);
                                                    if (cVar47 != '\0') {
                                                      pgStack_5f0 = (ggml_tensor *)0x12f525;
                                                      cVar47 = ggml_is_contiguous_1(pgVar61);
                                                      if (cVar47 != '\0') {
                                                        pgStack_5f0 = (ggml_tensor *)0x12f538;
                                                        cVar47 = ggml_are_same_shape(pgVar58,pgVar61
                                                                                    );
                                                        if (cVar47 != '\0') {
                                                          if (pgVar61->nb[0] != 4)
                                                          goto LAB_0012f851;
                                                          if (pgVar58->nb[0] == 4) {
                                                            lStack_5e0 = pgVar58->ne[1];
                                                            lStack_5e8 = pgVar58->ne[2];
                                                            sStack_5b0 = pgVar58->nb[1];
                                                            sStack_5b8 = pgVar58->nb[2];
                                                            sStack_5c0 = pgVar58->nb[3];
                                                            lVar55 = pgVar61->ne[0];
                                                            sStack_5c8 = pgVar61->nb[1];
                                                            sStack_5d0 = pgVar61->nb[2];
                                                            sStack_5d8 = pgVar61->nb[3];
                                                            gVar2 = pgVar65->type;
                                                            iVar73 = *(int *)&pgVar65->field_0x4;
                                                            pgStack_5f0 = (ggml_tensor *)0x12f5b0;
                                                            lVar52 = ggml_nrows(pgVar58);
                                                            lVar71 = ((long)iVar73 + -1 + lVar52) /
                                                                     (long)iVar73;
                                                            lVar49 = (int)gVar2 * lVar71;
                                                            lVar71 = lVar71 + lVar49;
                                                            if (lVar52 <= lVar71) {
                                                              lVar71 = lVar52;
                                                            }
                                                            if (lVar71 <= lVar49) {
                                                              return;
                                                            }
                                                            lStack_5e8 = lStack_5e8 * lStack_5e0;
                                                            do {
                                                              lVar52 = (lVar49 % lStack_5e8) /
                                                                       lStack_5e0;
                                                              lVar48 = (lVar49 % lStack_5e8) %
                                                                       lStack_5e0;
                                                              if (0 < lVar55) {
                                                                lVar50 = (lVar49 / lStack_5e8) *
                                                                         sStack_5d8;
                                                                lVar54 = lVar52 * sStack_5d0;
                                                                lVar51 = lVar48 * sStack_5c8;
                                                                lVar70 = (lVar49 / lStack_5e8) *
                                                                         sStack_5c0;
                                                                lVar52 = lVar52 * sStack_5b8;
                                                                lVar48 = lVar48 * sStack_5b0;
                                                                pvVar11 = pgStack_5a0->data;
                                                                pvVar12 = pgStack_5a8->data;
                                                                lVar72 = 0;
                                                                do {
                                                                  fVar90 = *(float *)((long)pvVar12
                                                                                     + lVar72 * 4 +
                                                                                       lVar52 + 
                                                  lVar48 + lVar70);
                                                  if (fVar90 < 0.0) {
                                                    pgStack_5f0 = (ggml_tensor *)0x12f676;
                                                    fVar90 = sqrtf(fVar90);
                                                  }
                                                  else {
                                                    auVar97 = vsqrtss_avx(ZEXT416((uint)fVar90),
                                                                          ZEXT416((uint)fVar90));
                                                    fVar90 = auVar97._0_4_;
                                                  }
                                                  *(float *)((long)pvVar11 +
                                                            lVar72 * 4 + lVar54 + lVar51 + lVar50) =
                                                       fVar90;
                                                  lVar72 = lVar72 + 1;
                                                  } while (lVar55 != lVar72);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != lVar71);
                                                  return;
                                                  }
LAB_0012f86d:
                                                  pcVar53 = "nb00 == sizeof(src0_t)";
                                                  uVar57 = 0x56;
                                                  goto LAB_0012f887;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else if ((gVar2 == GGML_TYPE_F16) &&
                                                          (pgVar61->type == GGML_TYPE_F16)) {
                                                    pgStack_5f0 = (ggml_tensor *)0x12efe9;
                                                    cVar47 = ggml_is_contiguous_1(pgVar58);
                                                    if (cVar47 != '\0') {
                                                      pgStack_5f0 = (ggml_tensor *)0x12eff9;
                                                      cVar47 = ggml_is_contiguous_1(pgVar61);
                                                      if (cVar47 != '\0') {
                                                        pgStack_5f0 = (ggml_tensor *)0x12f00c;
                                                        cVar47 = ggml_are_same_shape(pgVar58,pgVar61
                                                                                    );
                                                        if (cVar47 != '\0') {
                                                          if (pgVar61->nb[0] == 2) {
                                                            if (pgVar58->nb[0] == 2) {
                                                              lStack_5e0 = pgVar58->ne[1];
                                                              lStack_5e8 = pgVar58->ne[2];
                                                              sStack_5b8 = pgVar58->nb[1];
                                                              sStack_5c0 = pgVar58->nb[2];
                                                              sStack_5c8 = pgVar58->nb[3];
                                                              lVar55 = pgVar61->ne[0];
                                                              sStack_5d0 = pgVar61->nb[1];
                                                              sStack_5d8 = pgVar61->nb[2];
                                                              sStack_598 = pgVar61->nb[3];
                                                              gVar2 = pgVar65->type;
                                                              iVar73 = *(int *)&pgVar65->field_0x4;
                                                              pgStack_5f0 = (ggml_tensor *)0x12f084;
                                                              lVar71 = ggml_nrows(pgVar58);
                                                              lVar52 = ((long)iVar73 + -1 + lVar71)
                                                                       / (long)iVar73;
                                                              lVar49 = (int)gVar2 * lVar52;
                                                              sStack_5b0 = lVar52 + lVar49;
                                                              if (lVar71 <= (long)sStack_5b0) {
                                                                sStack_5b0 = lVar71;
                                                              }
                                                              if ((long)sStack_5b0 <= lVar49) {
                                                                return;
                                                              }
                                                              lStack_5e8 = lStack_5e8 * lStack_5e0;
                                                              do {
                                                                if (0 < lVar55) {
                                                                  lVar52 = (lVar49 / lStack_5e8) *
                                                                           sStack_5c8;
                                                                  lVar71 = ((lVar49 % lStack_5e8) /
                                                                           lStack_5e0) * sStack_5c0;
                                                                  lVar48 = ((lVar49 % lStack_5e8) %
                                                                           lStack_5e0) * sStack_5b8;
                                                                  pvVar11 = pgStack_5a8->data;
                                                                  lVar70 = 0;
                                                                  do {
                                                                    fVar90 = *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pvVar11 +
                                                          lVar70 * 2 + lVar71 + lVar48 + lVar52) * 4
                                                  );
                                                  if (fVar90 < 0.0) {
                                                    pgStack_5f0 = (ggml_tensor *)0x12f158;
                                                    auVar88._0_4_ = sqrtf(fVar90);
                                                    auVar88._4_60_ = extraout_var_02;
                                                    auVar97 = auVar88._0_16_;
                                                  }
                                                  else {
                                                    auVar97 = vsqrtss_avx(ZEXT416((uint)fVar90),
                                                                          ZEXT416((uint)fVar90));
                                                  }
                                                  auVar97 = vcvtps2ph_f16c(auVar97,0);
                                                  vpextrw_avx(auVar97,0);
                                                  lVar70 = lVar70 + 1;
                                                  } while (lVar55 != lVar70);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != sStack_5b0);
                                                  return;
                                                  }
                                                  goto LAB_0012f86d;
                                                  }
                                                  goto LAB_0012f851;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else if (gVar2 == GGML_TYPE_BF16) {
                                                    gVar4 = pgVar61->type;
                                                    in_RCX = (ulong)gVar4;
                                                    if (gVar4 == GGML_TYPE_F32) {
                                                      pgStack_5f0 = (ggml_tensor *)0x12f6a2;
                                                      cVar47 = ggml_is_contiguous_1(pgVar58);
                                                      if (cVar47 != '\0') {
                                                        pgStack_5f0 = (ggml_tensor *)0x12f6b2;
                                                        cVar47 = ggml_is_contiguous_1(pgVar61);
                                                        if (cVar47 != '\0') {
                                                          pgStack_5f0 = (ggml_tensor *)0x12f6c5;
                                                          cVar47 = ggml_are_same_shape(pgVar58,
                                                  pgVar61);
                                                  if (cVar47 != '\0') {
                                                    if (pgVar61->nb[0] == 4) {
                                                      if (pgVar58->nb[0] == 2) {
                                                        lStack_5e0 = pgVar58->ne[1];
                                                        lStack_5e8 = pgVar58->ne[2];
                                                        sStack_5b0 = pgVar58->nb[1];
                                                        sStack_5b8 = pgVar58->nb[2];
                                                        sStack_5c0 = pgVar58->nb[3];
                                                        lVar55 = pgVar61->ne[0];
                                                        sStack_5c8 = pgVar61->nb[1];
                                                        sStack_5d0 = pgVar61->nb[2];
                                                        sStack_5d8 = pgVar61->nb[3];
                                                        gVar2 = pgVar65->type;
                                                        iVar73 = *(int *)&pgVar65->field_0x4;
                                                        pgStack_5f0 = (ggml_tensor *)0x12f73d;
                                                        lVar52 = ggml_nrows(pgVar58);
                                                        lVar71 = ((long)iVar73 + -1 + lVar52) /
                                                                 (long)iVar73;
                                                        lVar49 = (int)gVar2 * lVar71;
                                                        lVar71 = lVar71 + lVar49;
                                                        if (lVar52 <= lVar71) {
                                                          lVar71 = lVar52;
                                                        }
                                                        if (lVar71 <= lVar49) {
                                                          return;
                                                        }
                                                        lStack_5e8 = lStack_5e8 * lStack_5e0;
                                                        do {
                                                          lVar52 = (lVar49 % lStack_5e8) /
                                                                   lStack_5e0;
                                                          lVar48 = (lVar49 % lStack_5e8) %
                                                                   lStack_5e0;
                                                          if (0 < lVar55) {
                                                            lVar50 = (lVar49 / lStack_5e8) *
                                                                     sStack_5d8;
                                                            lVar51 = lVar52 * sStack_5d0;
                                                            lVar72 = lVar48 * sStack_5c8;
                                                            lVar70 = (lVar49 / lStack_5e8) *
                                                                     sStack_5c0;
                                                            lVar52 = lVar52 * sStack_5b8;
                                                            lVar48 = lVar48 * sStack_5b0;
                                                            pvVar11 = pgStack_5a0->data;
                                                            pvVar12 = pgStack_5a8->data;
                                                            lVar54 = 0;
                                                            do {
                                                              uVar56 = *(ushort *)
                                                                        ((long)pvVar12 +
                                                                        lVar54 * 2 +
                                                                        lVar52 + lVar48 + lVar70);
                                                              fVar90 = (float)((uint)uVar56 << 0x10)
                                                              ;
                                                              if (fVar90 < 0.0) {
                                                                pgStack_5f0 = (ggml_tensor *)
                                                                              0x12f807;
                                                                fVar90 = sqrtf(fVar90);
                                                              }
                                                              else {
                                                                auVar97 = ZEXT216(uVar56) << 0x10;
                                                                auVar97 = vsqrtss_avx(auVar97,
                                                  auVar97);
                                                  fVar90 = auVar97._0_4_;
                                                  }
                                                  *(float *)((long)pvVar11 +
                                                            lVar54 * 4 + lVar51 + lVar72 + lVar50) =
                                                       fVar90;
                                                  lVar54 = lVar54 + 1;
                                                  } while (lVar55 != lVar54);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != lVar71);
                                                  return;
                                                  }
                                                  goto LAB_0012f86d;
                                                  }
                                                  goto LAB_0012f851;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    if (gVar4 != GGML_TYPE_BF16) goto LAB_0012f35e;
                                                    pgStack_5f0 = (ggml_tensor *)0x12f1a9;
                                                    cVar47 = ggml_is_contiguous_1(pgVar58);
                                                    if (cVar47 != '\0') {
                                                      pgStack_5f0 = (ggml_tensor *)0x12f1b9;
                                                      cVar47 = ggml_is_contiguous_1(pgVar61);
                                                      if (cVar47 != '\0') {
                                                        pgStack_5f0 = (ggml_tensor *)0x12f1cc;
                                                        cVar47 = ggml_are_same_shape(pgVar58,pgVar61
                                                                                    );
                                                        if (cVar47 != '\0') {
                                                          if (pgVar61->nb[0] == 2) {
                                                            if (pgVar58->nb[0] == 2) {
                                                              lStack_5e0 = pgVar58->ne[1];
                                                              lStack_5e8 = pgVar58->ne[2];
                                                              sStack_5b0 = pgVar58->nb[1];
                                                              sStack_5b8 = pgVar58->nb[2];
                                                              sStack_5c0 = pgVar58->nb[3];
                                                              lVar55 = pgVar61->ne[0];
                                                              sStack_5c8 = pgVar61->nb[1];
                                                              sStack_5d0 = pgVar61->nb[2];
                                                              sStack_5d8 = pgVar61->nb[3];
                                                              gVar2 = pgVar65->type;
                                                              iVar73 = *(int *)&pgVar65->field_0x4;
                                                              pgStack_5f0 = (ggml_tensor *)0x12f244;
                                                              lVar52 = ggml_nrows(pgVar58);
                                                              lVar71 = ((long)iVar73 + -1 + lVar52)
                                                                       / (long)iVar73;
                                                              lVar49 = (int)gVar2 * lVar71;
                                                              lVar71 = lVar71 + lVar49;
                                                              if (lVar52 <= lVar71) {
                                                                lVar71 = lVar52;
                                                              }
                                                              if (lVar71 <= lVar49) {
                                                                return;
                                                              }
                                                              lStack_5e8 = lStack_5e8 * lStack_5e0;
                                                              do {
                                                                lVar52 = (lVar49 % lStack_5e8) /
                                                                         lStack_5e0;
                                                                lVar48 = (lVar49 % lStack_5e8) %
                                                                         lStack_5e0;
                                                                if (0 < lVar55) {
                                                                  lVar50 = (lVar49 / lStack_5e8) *
                                                                           sStack_5d8;
                                                                  lVar51 = lVar52 * sStack_5d0;
                                                                  lVar54 = lVar48 * sStack_5c8;
                                                                  lVar70 = (lVar49 / lStack_5e8) *
                                                                           sStack_5c0;
                                                                  lVar52 = lVar52 * sStack_5b8;
                                                                  lVar48 = lVar48 * sStack_5b0;
                                                                  pvVar11 = pgStack_5a0->data;
                                                                  pvVar12 = pgStack_5a8->data;
                                                                  lVar72 = 0;
                                                                  do {
                                                                    uVar56 = *(ushort *)
                                                                              ((long)pvVar12 +
                                                                              lVar72 * 2 +
                                                                              lVar52 + lVar48 + 
                                                  lVar70);
                                                  fVar90 = (float)((uint)uVar56 << 0x10);
                                                  if (fVar90 < 0.0) {
                                                    pgStack_5f0 = (ggml_tensor *)0x12f311;
                                                    fVar90 = sqrtf(fVar90);
                                                  }
                                                  else {
                                                    auVar97 = ZEXT216(uVar56) << 0x10;
                                                    auVar97 = vsqrtss_avx(auVar97,auVar97);
                                                    fVar90 = auVar97._0_4_;
                                                  }
                                                  if ((uint)ABS(fVar90) < 0x7f800001) {
                                                    uVar56 = (ushort)((int)fVar90 + 0x7fff +
                                                                      ((uint)fVar90 >> 0x10 & 1) >>
                                                                     0x10);
                                                  }
                                                  else {
                                                    uVar56 = (ushort)((uint)fVar90 >> 0x10) | 0x40;
                                                  }
                                                  *(ushort *)
                                                   ((long)pvVar11 +
                                                   lVar72 * 2 + lVar51 + lVar54 + lVar50) = uVar56;
                                                  lVar72 = lVar72 + 1;
                                                  } while (lVar55 != lVar72);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != lVar71);
                                                  return;
                                                  }
                                                  goto LAB_0012f86d;
                                                  }
                                                  goto LAB_0012f851;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
LAB_0012f35e:
                                                    if ((gVar2 != GGML_TYPE_F16) ||
                                                       (pgVar61->type != GGML_TYPE_F32)) {
                                                      pgStack_5f0 = (ggml_tensor *)
                                                                    ggml_compute_forward_sin;
                                                      pgVar60 = pgVar58;
                                                      pgVar66 = pgVar61;
                                                      ggml_compute_forward_sqrt_cold_1();
                                                      pgVar59 = pgVar60->src[0];
                                                      gVar2 = pgVar59->type;
                                                      pgStack_630 = pgVar59;
                                                      pgStack_628 = pgVar60;
                                                      pgStack_618 = pgVar61;
                                                      pgStack_610 = pgVar62;
                                                      pgStack_608 = pgVar58;
                                                      pgStack_600 = pgVar13;
                                                      pgStack_5f8 = pgVar65;
                                                      pgStack_5f0 = pgVar64;
                                                      if ((gVar2 == GGML_TYPE_F32) &&
                                                         (pgVar60->type == GGML_TYPE_F32)) {
                                                        pgStack_678 = (ggml_tensor *)0x12fdd1;
                                                        cVar47 = ggml_is_contiguous_1(pgVar59);
                                                        if (cVar47 != '\0') {
                                                          pgStack_678 = (ggml_tensor *)0x12fde1;
                                                          cVar47 = ggml_is_contiguous_1(pgVar60);
                                                          if (cVar47 != '\0') {
                                                            pgStack_678 = (ggml_tensor *)0x12fdf4;
                                                            cVar47 = ggml_are_same_shape(pgVar59,
                                                  pgVar60);
                                                  if (cVar47 != '\0') {
                                                    if (pgVar60->nb[0] != 4) goto LAB_001300dd;
                                                    if (pgVar59->nb[0] == 4) {
                                                      lStack_668 = pgVar59->ne[1];
                                                      lStack_670 = pgVar59->ne[2];
                                                      sStack_638 = pgVar59->nb[1];
                                                      sStack_640 = pgVar59->nb[2];
                                                      sStack_648 = pgVar59->nb[3];
                                                      lVar55 = pgVar60->ne[0];
                                                      sStack_650 = pgVar60->nb[1];
                                                      sStack_658 = pgVar60->nb[2];
                                                      sStack_660 = pgVar60->nb[3];
                                                      gVar2 = pgVar66->type;
                                                      iVar73 = *(int *)&pgVar66->field_0x4;
                                                      pgStack_678 = (ggml_tensor *)0x12fe6c;
                                                      lVar52 = ggml_nrows(pgVar59);
                                                      lVar71 = ((long)iVar73 + -1 + lVar52) /
                                                               (long)iVar73;
                                                      lVar49 = (int)gVar2 * lVar71;
                                                      lVar71 = lVar71 + lVar49;
                                                      if (lVar52 <= lVar71) {
                                                        lVar71 = lVar52;
                                                      }
                                                      if (lVar71 <= lVar49) {
                                                        return;
                                                      }
                                                      lStack_670 = lStack_670 * lStack_668;
                                                      do {
                                                        lVar52 = (lVar49 % lStack_670) / lStack_668;
                                                        lVar48 = (lVar49 % lStack_670) % lStack_668;
                                                        if (0 < lVar55) {
                                                          lVar50 = (lVar49 / lStack_670) *
                                                                   sStack_660;
                                                          lVar54 = lVar52 * sStack_658;
                                                          lVar51 = lVar48 * sStack_650;
                                                          lVar70 = (lVar49 / lStack_670) *
                                                                   sStack_648;
                                                          lVar52 = lVar52 * sStack_640;
                                                          lVar48 = lVar48 * sStack_638;
                                                          pvVar11 = pgStack_628->data;
                                                          pvVar12 = pgStack_630->data;
                                                          lVar72 = 0;
                                                          do {
                                                            pgStack_678 = (ggml_tensor *)0x12ff1e;
                                                            fVar90 = sinf(*(float *)((long)pvVar12 +
                                                                                    lVar72 * 4 +
                                                                                    lVar52 + lVar48 
                                                  + lVar70));
                                                  *(float *)((long)pvVar11 +
                                                            lVar72 * 4 + lVar54 + lVar51 + lVar50) =
                                                       fVar90;
                                                  lVar72 = lVar72 + 1;
                                                  } while (lVar55 != lVar72);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != lVar71);
                                                  return;
                                                  }
LAB_001300f9:
                                                  pcVar53 = "nb00 == sizeof(src0_t)";
                                                  uVar57 = 0x56;
                                                  goto LAB_00130113;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else if ((gVar2 == GGML_TYPE_F16) &&
                                                          (pgVar60->type == GGML_TYPE_F16)) {
                                                    pgStack_678 = (ggml_tensor *)0x12f8e9;
                                                    cVar47 = ggml_is_contiguous_1(pgVar59);
                                                    if (cVar47 != '\0') {
                                                      pgStack_678 = (ggml_tensor *)0x12f8f9;
                                                      cVar47 = ggml_is_contiguous_1(pgVar60);
                                                      if (cVar47 != '\0') {
                                                        pgStack_678 = (ggml_tensor *)0x12f90c;
                                                        cVar47 = ggml_are_same_shape(pgVar59,pgVar60
                                                                                    );
                                                        if (cVar47 != '\0') {
                                                          if (pgVar60->nb[0] == 2) {
                                                            if (pgVar59->nb[0] == 2) {
                                                              lStack_668 = pgVar59->ne[1];
                                                              lStack_670 = pgVar59->ne[2];
                                                              sStack_640 = pgVar59->nb[1];
                                                              sStack_648 = pgVar59->nb[2];
                                                              sStack_650 = pgVar59->nb[3];
                                                              lVar55 = pgVar60->ne[0];
                                                              sStack_658 = pgVar60->nb[1];
                                                              sStack_660 = pgVar60->nb[2];
                                                              sStack_620 = pgVar60->nb[3];
                                                              gVar2 = pgVar66->type;
                                                              iVar73 = *(int *)&pgVar66->field_0x4;
                                                              pgStack_678 = (ggml_tensor *)0x12f984;
                                                              lVar71 = ggml_nrows(pgVar59);
                                                              lVar52 = ((long)iVar73 + -1 + lVar71)
                                                                       / (long)iVar73;
                                                              lVar49 = (int)gVar2 * lVar52;
                                                              sStack_638 = lVar52 + lVar49;
                                                              if (lVar71 <= (long)sStack_638) {
                                                                sStack_638 = lVar71;
                                                              }
                                                              if ((long)sStack_638 <= lVar49) {
                                                                return;
                                                              }
                                                              lStack_670 = lStack_670 * lStack_668;
                                                              do {
                                                                if (0 < lVar55) {
                                                                  lVar52 = (lVar49 / lStack_670) *
                                                                           sStack_650;
                                                                  lVar71 = ((lVar49 % lStack_670) /
                                                                           lStack_668) * sStack_648;
                                                                  lVar48 = ((lVar49 % lStack_670) %
                                                                           lStack_668) * sStack_640;
                                                                  pvVar11 = pgStack_630->data;
                                                                  lVar70 = 0;
                                                                  do {
                                                                    pgStack_678 = (ggml_tensor *)
                                                                                  0x12fa44;
                                                                    auVar87._0_4_ =
                                                                         sinf(*(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pvVar11 +
                                                          lVar70 * 2 + lVar71 + lVar48 + lVar52) * 4
                                                  ));
                                                  auVar87._4_60_ = extraout_var_03;
                                                  auVar97 = vcvtps2ph_f16c(auVar87._0_16_,0);
                                                  vpextrw_avx(auVar97,0);
                                                  lVar70 = lVar70 + 1;
                                                  } while (lVar55 != lVar70);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != sStack_638);
                                                  return;
                                                  }
                                                  goto LAB_001300f9;
                                                  }
                                                  goto LAB_001300dd;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else if (gVar2 == GGML_TYPE_BF16) {
                                                    gVar4 = pgVar60->type;
                                                    in_RCX = (ulong)gVar4;
                                                    if (gVar4 == GGML_TYPE_F32) {
                                                      pgStack_678 = (ggml_tensor *)0x12ff46;
                                                      cVar47 = ggml_is_contiguous_1(pgVar59);
                                                      if (cVar47 != '\0') {
                                                        pgStack_678 = (ggml_tensor *)0x12ff56;
                                                        cVar47 = ggml_is_contiguous_1(pgVar60);
                                                        if (cVar47 != '\0') {
                                                          pgStack_678 = (ggml_tensor *)0x12ff69;
                                                          cVar47 = ggml_are_same_shape(pgVar59,
                                                  pgVar60);
                                                  if (cVar47 != '\0') {
                                                    if (pgVar60->nb[0] == 4) {
                                                      if (pgVar59->nb[0] == 2) {
                                                        lStack_668 = pgVar59->ne[1];
                                                        lStack_670 = pgVar59->ne[2];
                                                        sStack_638 = pgVar59->nb[1];
                                                        sStack_640 = pgVar59->nb[2];
                                                        sStack_648 = pgVar59->nb[3];
                                                        lVar55 = pgVar60->ne[0];
                                                        sStack_650 = pgVar60->nb[1];
                                                        sStack_658 = pgVar60->nb[2];
                                                        sStack_660 = pgVar60->nb[3];
                                                        gVar2 = pgVar66->type;
                                                        iVar73 = *(int *)&pgVar66->field_0x4;
                                                        pgStack_678 = (ggml_tensor *)0x12ffe1;
                                                        lVar52 = ggml_nrows(pgVar59);
                                                        lVar71 = ((long)iVar73 + -1 + lVar52) /
                                                                 (long)iVar73;
                                                        lVar49 = (int)gVar2 * lVar71;
                                                        lVar71 = lVar71 + lVar49;
                                                        if (lVar52 <= lVar71) {
                                                          lVar71 = lVar52;
                                                        }
                                                        if (lVar71 <= lVar49) {
                                                          return;
                                                        }
                                                        lStack_670 = lStack_670 * lStack_668;
                                                        do {
                                                          lVar52 = (lVar49 % lStack_670) /
                                                                   lStack_668;
                                                          lVar48 = (lVar49 % lStack_670) %
                                                                   lStack_668;
                                                          if (0 < lVar55) {
                                                            lVar50 = (lVar49 / lStack_670) *
                                                                     sStack_660;
                                                            lVar51 = lVar52 * sStack_658;
                                                            lVar72 = lVar48 * sStack_650;
                                                            lVar70 = (lVar49 / lStack_670) *
                                                                     sStack_648;
                                                            lVar52 = lVar52 * sStack_640;
                                                            lVar48 = lVar48 * sStack_638;
                                                            pvVar11 = pgStack_628->data;
                                                            pvVar12 = pgStack_630->data;
                                                            lVar54 = 0;
                                                            do {
                                                              pgStack_678 = (ggml_tensor *)0x130097;
                                                              fVar90 = sinf((float)((uint)*(ushort *
                                                  )((long)pvVar12 +
                                                   lVar54 * 2 + lVar52 + lVar48 + lVar70) << 0x10));
                                                  *(float *)((long)pvVar11 +
                                                            lVar54 * 4 + lVar51 + lVar72 + lVar50) =
                                                       fVar90;
                                                  lVar54 = lVar54 + 1;
                                                  } while (lVar55 != lVar54);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != lVar71);
                                                  return;
                                                  }
                                                  goto LAB_001300f9;
                                                  }
                                                  goto LAB_001300dd;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    if (gVar4 != GGML_TYPE_BF16) goto LAB_0012fc32;
                                                    pgStack_678 = (ggml_tensor *)0x12fa91;
                                                    cVar47 = ggml_is_contiguous_1(pgVar59);
                                                    if (cVar47 != '\0') {
                                                      pgStack_678 = (ggml_tensor *)0x12faa1;
                                                      cVar47 = ggml_is_contiguous_1(pgVar60);
                                                      if (cVar47 != '\0') {
                                                        pgStack_678 = (ggml_tensor *)0x12fab4;
                                                        cVar47 = ggml_are_same_shape(pgVar59,pgVar60
                                                                                    );
                                                        if (cVar47 != '\0') {
                                                          if (pgVar60->nb[0] == 2) {
                                                            if (pgVar59->nb[0] == 2) {
                                                              lStack_668 = pgVar59->ne[1];
                                                              lStack_670 = pgVar59->ne[2];
                                                              sStack_638 = pgVar59->nb[1];
                                                              sStack_640 = pgVar59->nb[2];
                                                              sStack_648 = pgVar59->nb[3];
                                                              lVar55 = pgVar60->ne[0];
                                                              sStack_650 = pgVar60->nb[1];
                                                              sStack_658 = pgVar60->nb[2];
                                                              sStack_660 = pgVar60->nb[3];
                                                              gVar2 = pgVar66->type;
                                                              iVar73 = *(int *)&pgVar66->field_0x4;
                                                              pgStack_678 = (ggml_tensor *)0x12fb2c;
                                                              lVar52 = ggml_nrows(pgVar59);
                                                              lVar71 = ((long)iVar73 + -1 + lVar52)
                                                                       / (long)iVar73;
                                                              lVar49 = (int)gVar2 * lVar71;
                                                              lVar71 = lVar71 + lVar49;
                                                              if (lVar52 <= lVar71) {
                                                                lVar71 = lVar52;
                                                              }
                                                              if (lVar71 <= lVar49) {
                                                                return;
                                                              }
                                                              lStack_670 = lStack_670 * lStack_668;
                                                              do {
                                                                lVar52 = (lVar49 % lStack_670) /
                                                                         lStack_668;
                                                                lVar48 = (lVar49 % lStack_670) %
                                                                         lStack_668;
                                                                if (0 < lVar55) {
                                                                  lVar50 = (lVar49 / lStack_670) *
                                                                           sStack_660;
                                                                  lVar51 = lVar52 * sStack_658;
                                                                  lVar54 = lVar48 * sStack_650;
                                                                  lVar70 = (lVar49 / lStack_670) *
                                                                           sStack_648;
                                                                  lVar52 = lVar52 * sStack_640;
                                                                  lVar48 = lVar48 * sStack_638;
                                                                  pvVar11 = pgStack_628->data;
                                                                  pvVar12 = pgStack_630->data;
                                                                  lVar72 = 0;
                                                                  do {
                                                                    pgStack_678 = (ggml_tensor *)
                                                                                  0x12fbe9;
                                                                    fVar90 = sinf((float)((uint)*(
                                                  ushort *)((long)pvVar12 +
                                                           lVar72 * 2 + lVar52 + lVar48 + lVar70) <<
                                                  0x10));
                                                  if ((uint)ABS(fVar90) < 0x7f800001) {
                                                    uVar56 = (ushort)((int)fVar90 + 0x7fff +
                                                                      ((uint)fVar90 >> 0x10 & 1) >>
                                                                     0x10);
                                                  }
                                                  else {
                                                    uVar56 = (ushort)((uint)fVar90 >> 0x10) | 0x40;
                                                  }
                                                  *(ushort *)
                                                   ((long)pvVar11 +
                                                   lVar72 * 2 + lVar51 + lVar54 + lVar50) = uVar56;
                                                  lVar72 = lVar72 + 1;
                                                  } while (lVar55 != lVar72);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != lVar71);
                                                  return;
                                                  }
                                                  goto LAB_001300f9;
                                                  }
                                                  goto LAB_001300dd;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
LAB_0012fc32:
                                                    if ((gVar2 != GGML_TYPE_F16) ||
                                                       (pgVar60->type != GGML_TYPE_F32)) {
                                                      pgStack_678 = (ggml_tensor *)
                                                                    ggml_compute_forward_cos;
                                                      pgVar61 = pgVar59;
                                                      pgVar65 = pgVar60;
                                                      ggml_compute_forward_sin_cold_1();
                                                      pgVar58 = pgVar61->src[0];
                                                      gVar2 = pgVar58->type;
                                                      pgStack_6b8 = pgVar58;
                                                      pgStack_6b0 = pgVar61;
                                                      pgStack_6a0 = pgVar60;
                                                      pgStack_698 = pgVar62;
                                                      pgStack_690 = pgVar59;
                                                      pgStack_688 = pgVar13;
                                                      pgStack_680 = pgVar66;
                                                      pgStack_678 = pgVar64;
                                                      if ((gVar2 == GGML_TYPE_F32) &&
                                                         (pgVar61->type == GGML_TYPE_F32)) {
                                                        pgStack_700 = (ggml_tensor *)0x13065d;
                                                        cVar47 = ggml_is_contiguous_1(pgVar58);
                                                        if (cVar47 != '\0') {
                                                          pgStack_700 = (ggml_tensor *)0x13066d;
                                                          cVar47 = ggml_is_contiguous_1(pgVar61);
                                                          if (cVar47 != '\0') {
                                                            pgStack_700 = (ggml_tensor *)0x130680;
                                                            cVar47 = ggml_are_same_shape(pgVar58,
                                                  pgVar61);
                                                  if (cVar47 != '\0') {
                                                    if (pgVar61->nb[0] != 4) goto LAB_00130969;
                                                    if (pgVar58->nb[0] == 4) {
                                                      lStack_6f0 = pgVar58->ne[1];
                                                      lStack_6f8 = pgVar58->ne[2];
                                                      sStack_6c0 = pgVar58->nb[1];
                                                      sStack_6c8 = pgVar58->nb[2];
                                                      sStack_6d0 = pgVar58->nb[3];
                                                      lVar55 = pgVar61->ne[0];
                                                      sStack_6d8 = pgVar61->nb[1];
                                                      sStack_6e0 = pgVar61->nb[2];
                                                      sStack_6e8 = pgVar61->nb[3];
                                                      gVar2 = pgVar65->type;
                                                      iVar73 = *(int *)&pgVar65->field_0x4;
                                                      pgStack_700 = (ggml_tensor *)0x1306f8;
                                                      lVar52 = ggml_nrows(pgVar58);
                                                      lVar71 = ((long)iVar73 + -1 + lVar52) /
                                                               (long)iVar73;
                                                      lVar49 = (int)gVar2 * lVar71;
                                                      lVar71 = lVar71 + lVar49;
                                                      if (lVar52 <= lVar71) {
                                                        lVar71 = lVar52;
                                                      }
                                                      if (lVar71 <= lVar49) {
                                                        return;
                                                      }
                                                      lStack_6f8 = lStack_6f8 * lStack_6f0;
                                                      do {
                                                        lVar52 = (lVar49 % lStack_6f8) / lStack_6f0;
                                                        lVar48 = (lVar49 % lStack_6f8) % lStack_6f0;
                                                        if (0 < lVar55) {
                                                          lVar50 = (lVar49 / lStack_6f8) *
                                                                   sStack_6e8;
                                                          lVar54 = lVar52 * sStack_6e0;
                                                          lVar51 = lVar48 * sStack_6d8;
                                                          lVar70 = (lVar49 / lStack_6f8) *
                                                                   sStack_6d0;
                                                          lVar52 = lVar52 * sStack_6c8;
                                                          lVar48 = lVar48 * sStack_6c0;
                                                          pvVar11 = pgStack_6b0->data;
                                                          pvVar12 = pgStack_6b8->data;
                                                          lVar72 = 0;
                                                          do {
                                                            pgStack_700 = (ggml_tensor *)0x1307aa;
                                                            fVar90 = cosf(*(float *)((long)pvVar12 +
                                                                                    lVar72 * 4 +
                                                                                    lVar52 + lVar48 
                                                  + lVar70));
                                                  *(float *)((long)pvVar11 +
                                                            lVar72 * 4 + lVar54 + lVar51 + lVar50) =
                                                       fVar90;
                                                  lVar72 = lVar72 + 1;
                                                  } while (lVar55 != lVar72);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != lVar71);
                                                  return;
                                                  }
LAB_00130985:
                                                  pcVar53 = "nb00 == sizeof(src0_t)";
                                                  uVar57 = 0x56;
                                                  goto LAB_0013099f;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else if ((gVar2 == GGML_TYPE_F16) &&
                                                          (pgVar61->type == GGML_TYPE_F16)) {
                                                    pgStack_700 = (ggml_tensor *)0x130175;
                                                    cVar47 = ggml_is_contiguous_1(pgVar58);
                                                    if (cVar47 != '\0') {
                                                      pgStack_700 = (ggml_tensor *)0x130185;
                                                      cVar47 = ggml_is_contiguous_1(pgVar61);
                                                      if (cVar47 != '\0') {
                                                        pgStack_700 = (ggml_tensor *)0x130198;
                                                        cVar47 = ggml_are_same_shape(pgVar58,pgVar61
                                                                                    );
                                                        if (cVar47 != '\0') {
                                                          if (pgVar61->nb[0] == 2) {
                                                            if (pgVar58->nb[0] == 2) {
                                                              lStack_6f0 = pgVar58->ne[1];
                                                              lStack_6f8 = pgVar58->ne[2];
                                                              sStack_6c8 = pgVar58->nb[1];
                                                              sStack_6d0 = pgVar58->nb[2];
                                                              sStack_6d8 = pgVar58->nb[3];
                                                              lVar55 = pgVar61->ne[0];
                                                              sStack_6e0 = pgVar61->nb[1];
                                                              sStack_6e8 = pgVar61->nb[2];
                                                              sStack_6a8 = pgVar61->nb[3];
                                                              gVar2 = pgVar65->type;
                                                              iVar73 = *(int *)&pgVar65->field_0x4;
                                                              pgStack_700 = (ggml_tensor *)0x130210;
                                                              lVar71 = ggml_nrows(pgVar58);
                                                              lVar52 = ((long)iVar73 + -1 + lVar71)
                                                                       / (long)iVar73;
                                                              lVar49 = (int)gVar2 * lVar52;
                                                              sStack_6c0 = lVar52 + lVar49;
                                                              if (lVar71 <= (long)sStack_6c0) {
                                                                sStack_6c0 = lVar71;
                                                              }
                                                              if ((long)sStack_6c0 <= lVar49) {
                                                                return;
                                                              }
                                                              lStack_6f8 = lStack_6f8 * lStack_6f0;
                                                              do {
                                                                if (0 < lVar55) {
                                                                  lVar52 = (lVar49 / lStack_6f8) *
                                                                           sStack_6d8;
                                                                  lVar71 = ((lVar49 % lStack_6f8) /
                                                                           lStack_6f0) * sStack_6d0;
                                                                  lVar48 = ((lVar49 % lStack_6f8) %
                                                                           lStack_6f0) * sStack_6c8;
                                                                  pvVar11 = pgStack_6b8->data;
                                                                  lVar70 = 0;
                                                                  do {
                                                                    pgStack_700 = (ggml_tensor *)
                                                                                  0x1302d0;
                                                                    auVar86._0_4_ =
                                                                         cosf(*(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pvVar11 +
                                                          lVar70 * 2 + lVar71 + lVar48 + lVar52) * 4
                                                  ));
                                                  auVar86._4_60_ = extraout_var_04;
                                                  auVar97 = vcvtps2ph_f16c(auVar86._0_16_,0);
                                                  vpextrw_avx(auVar97,0);
                                                  lVar70 = lVar70 + 1;
                                                  } while (lVar55 != lVar70);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != sStack_6c0);
                                                  return;
                                                  }
                                                  goto LAB_00130985;
                                                  }
                                                  goto LAB_00130969;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else if (gVar2 == GGML_TYPE_BF16) {
                                                    gVar4 = pgVar61->type;
                                                    in_RCX = (ulong)gVar4;
                                                    if (gVar4 == GGML_TYPE_F32) {
                                                      pgStack_700 = (ggml_tensor *)0x1307d2;
                                                      cVar47 = ggml_is_contiguous_1(pgVar58);
                                                      if (cVar47 != '\0') {
                                                        pgStack_700 = (ggml_tensor *)0x1307e2;
                                                        cVar47 = ggml_is_contiguous_1(pgVar61);
                                                        if (cVar47 != '\0') {
                                                          pgStack_700 = (ggml_tensor *)0x1307f5;
                                                          cVar47 = ggml_are_same_shape(pgVar58,
                                                  pgVar61);
                                                  if (cVar47 != '\0') {
                                                    if (pgVar61->nb[0] == 4) {
                                                      if (pgVar58->nb[0] == 2) {
                                                        lStack_6f0 = pgVar58->ne[1];
                                                        lStack_6f8 = pgVar58->ne[2];
                                                        sStack_6c0 = pgVar58->nb[1];
                                                        sStack_6c8 = pgVar58->nb[2];
                                                        sStack_6d0 = pgVar58->nb[3];
                                                        lVar55 = pgVar61->ne[0];
                                                        sStack_6d8 = pgVar61->nb[1];
                                                        sStack_6e0 = pgVar61->nb[2];
                                                        sStack_6e8 = pgVar61->nb[3];
                                                        gVar2 = pgVar65->type;
                                                        iVar73 = *(int *)&pgVar65->field_0x4;
                                                        pgStack_700 = (ggml_tensor *)0x13086d;
                                                        lVar52 = ggml_nrows(pgVar58);
                                                        lVar71 = ((long)iVar73 + -1 + lVar52) /
                                                                 (long)iVar73;
                                                        lVar49 = (int)gVar2 * lVar71;
                                                        lVar71 = lVar71 + lVar49;
                                                        if (lVar52 <= lVar71) {
                                                          lVar71 = lVar52;
                                                        }
                                                        if (lVar71 <= lVar49) {
                                                          return;
                                                        }
                                                        lStack_6f8 = lStack_6f8 * lStack_6f0;
                                                        do {
                                                          lVar52 = (lVar49 % lStack_6f8) /
                                                                   lStack_6f0;
                                                          lVar48 = (lVar49 % lStack_6f8) %
                                                                   lStack_6f0;
                                                          if (0 < lVar55) {
                                                            lVar50 = (lVar49 / lStack_6f8) *
                                                                     sStack_6e8;
                                                            lVar51 = lVar52 * sStack_6e0;
                                                            lVar72 = lVar48 * sStack_6d8;
                                                            lVar70 = (lVar49 / lStack_6f8) *
                                                                     sStack_6d0;
                                                            lVar52 = lVar52 * sStack_6c8;
                                                            lVar48 = lVar48 * sStack_6c0;
                                                            pvVar11 = pgStack_6b0->data;
                                                            pvVar12 = pgStack_6b8->data;
                                                            lVar54 = 0;
                                                            do {
                                                              pgStack_700 = (ggml_tensor *)0x130923;
                                                              fVar90 = cosf((float)((uint)*(ushort *
                                                  )((long)pvVar12 +
                                                   lVar54 * 2 + lVar52 + lVar48 + lVar70) << 0x10));
                                                  *(float *)((long)pvVar11 +
                                                            lVar54 * 4 + lVar51 + lVar72 + lVar50) =
                                                       fVar90;
                                                  lVar54 = lVar54 + 1;
                                                  } while (lVar55 != lVar54);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != lVar71);
                                                  return;
                                                  }
                                                  goto LAB_00130985;
                                                  }
                                                  goto LAB_00130969;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    if (gVar4 != GGML_TYPE_BF16) goto LAB_001304be;
                                                    pgStack_700 = (ggml_tensor *)0x13031d;
                                                    cVar47 = ggml_is_contiguous_1(pgVar58);
                                                    if (cVar47 != '\0') {
                                                      pgStack_700 = (ggml_tensor *)0x13032d;
                                                      cVar47 = ggml_is_contiguous_1(pgVar61);
                                                      if (cVar47 != '\0') {
                                                        pgStack_700 = (ggml_tensor *)0x130340;
                                                        cVar47 = ggml_are_same_shape(pgVar58,pgVar61
                                                                                    );
                                                        if (cVar47 != '\0') {
                                                          if (pgVar61->nb[0] == 2) {
                                                            if (pgVar58->nb[0] == 2) {
                                                              lStack_6f0 = pgVar58->ne[1];
                                                              lStack_6f8 = pgVar58->ne[2];
                                                              sStack_6c0 = pgVar58->nb[1];
                                                              sStack_6c8 = pgVar58->nb[2];
                                                              sStack_6d0 = pgVar58->nb[3];
                                                              lVar55 = pgVar61->ne[0];
                                                              sStack_6d8 = pgVar61->nb[1];
                                                              sStack_6e0 = pgVar61->nb[2];
                                                              sStack_6e8 = pgVar61->nb[3];
                                                              gVar2 = pgVar65->type;
                                                              iVar73 = *(int *)&pgVar65->field_0x4;
                                                              pgStack_700 = (ggml_tensor *)0x1303b8;
                                                              lVar52 = ggml_nrows(pgVar58);
                                                              lVar71 = ((long)iVar73 + -1 + lVar52)
                                                                       / (long)iVar73;
                                                              lVar49 = (int)gVar2 * lVar71;
                                                              lVar71 = lVar71 + lVar49;
                                                              if (lVar52 <= lVar71) {
                                                                lVar71 = lVar52;
                                                              }
                                                              if (lVar71 <= lVar49) {
                                                                return;
                                                              }
                                                              lStack_6f8 = lStack_6f8 * lStack_6f0;
                                                              do {
                                                                lVar52 = (lVar49 % lStack_6f8) /
                                                                         lStack_6f0;
                                                                lVar48 = (lVar49 % lStack_6f8) %
                                                                         lStack_6f0;
                                                                if (0 < lVar55) {
                                                                  lVar50 = (lVar49 / lStack_6f8) *
                                                                           sStack_6e8;
                                                                  lVar51 = lVar52 * sStack_6e0;
                                                                  lVar54 = lVar48 * sStack_6d8;
                                                                  lVar70 = (lVar49 / lStack_6f8) *
                                                                           sStack_6d0;
                                                                  lVar52 = lVar52 * sStack_6c8;
                                                                  lVar48 = lVar48 * sStack_6c0;
                                                                  pvVar11 = pgStack_6b0->data;
                                                                  pvVar12 = pgStack_6b8->data;
                                                                  lVar72 = 0;
                                                                  do {
                                                                    pgStack_700 = (ggml_tensor *)
                                                                                  0x130475;
                                                                    fVar90 = cosf((float)((uint)*(
                                                  ushort *)((long)pvVar12 +
                                                           lVar72 * 2 + lVar52 + lVar48 + lVar70) <<
                                                  0x10));
                                                  if ((uint)ABS(fVar90) < 0x7f800001) {
                                                    uVar56 = (ushort)((int)fVar90 + 0x7fff +
                                                                      ((uint)fVar90 >> 0x10 & 1) >>
                                                                     0x10);
                                                  }
                                                  else {
                                                    uVar56 = (ushort)((uint)fVar90 >> 0x10) | 0x40;
                                                  }
                                                  *(ushort *)
                                                   ((long)pvVar11 +
                                                   lVar72 * 2 + lVar51 + lVar54 + lVar50) = uVar56;
                                                  lVar72 = lVar72 + 1;
                                                  } while (lVar55 != lVar72);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != lVar71);
                                                  return;
                                                  }
                                                  goto LAB_00130985;
                                                  }
                                                  goto LAB_00130969;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
LAB_001304be:
                                                    if ((gVar2 != GGML_TYPE_F16) ||
                                                       (pgVar61->type != GGML_TYPE_F32)) {
                                                      pgStack_700 = (ggml_tensor *)
                                                                    ggml_compute_forward_log;
                                                      pgVar60 = pgVar58;
                                                      pgVar66 = pgVar61;
                                                      ggml_compute_forward_cos_cold_1();
                                                      pgVar59 = pgVar60->src[0];
                                                      gVar2 = pgVar59->type;
                                                      pgStack_740 = pgVar59;
                                                      pgStack_738 = pgVar60;
                                                      pgStack_728 = pgVar61;
                                                      pgStack_720 = pgVar62;
                                                      pgStack_718 = pgVar58;
                                                      pgStack_710 = pgVar13;
                                                      pgStack_708 = pgVar65;
                                                      pgStack_700 = pgVar64;
                                                      if ((gVar2 == GGML_TYPE_F32) &&
                                                         (pgVar60->type == GGML_TYPE_F32)) {
                                                        pgStack_788 = (ggml_tensor *)0x130ee9;
                                                        cVar47 = ggml_is_contiguous_1(pgVar59);
                                                        if (cVar47 != '\0') {
                                                          pgStack_788 = (ggml_tensor *)0x130ef9;
                                                          cVar47 = ggml_is_contiguous_1(pgVar60);
                                                          if (cVar47 != '\0') {
                                                            pgStack_788 = (ggml_tensor *)0x130f0c;
                                                            cVar47 = ggml_are_same_shape(pgVar59,
                                                  pgVar60);
                                                  if (cVar47 != '\0') {
                                                    if (pgVar60->nb[0] != 4) goto LAB_001311f5;
                                                    if (pgVar59->nb[0] == 4) {
                                                      lStack_778 = pgVar59->ne[1];
                                                      lStack_780 = pgVar59->ne[2];
                                                      sStack_748 = pgVar59->nb[1];
                                                      sStack_750 = pgVar59->nb[2];
                                                      sStack_758 = pgVar59->nb[3];
                                                      lVar55 = pgVar60->ne[0];
                                                      sStack_760 = pgVar60->nb[1];
                                                      sStack_768 = pgVar60->nb[2];
                                                      sStack_770 = pgVar60->nb[3];
                                                      gVar2 = pgVar66->type;
                                                      iVar73 = *(int *)&pgVar66->field_0x4;
                                                      pgStack_788 = (ggml_tensor *)0x130f84;
                                                      lVar52 = ggml_nrows(pgVar59);
                                                      lVar71 = ((long)iVar73 + -1 + lVar52) /
                                                               (long)iVar73;
                                                      lVar49 = (int)gVar2 * lVar71;
                                                      lVar71 = lVar71 + lVar49;
                                                      if (lVar52 <= lVar71) {
                                                        lVar71 = lVar52;
                                                      }
                                                      if (lVar71 <= lVar49) {
                                                        return;
                                                      }
                                                      lStack_780 = lStack_780 * lStack_778;
                                                      do {
                                                        lVar52 = (lVar49 % lStack_780) / lStack_778;
                                                        lVar48 = (lVar49 % lStack_780) % lStack_778;
                                                        if (0 < lVar55) {
                                                          lVar50 = (lVar49 / lStack_780) *
                                                                   sStack_770;
                                                          lVar54 = lVar52 * sStack_768;
                                                          lVar51 = lVar48 * sStack_760;
                                                          lVar70 = (lVar49 / lStack_780) *
                                                                   sStack_758;
                                                          lVar52 = lVar52 * sStack_750;
                                                          lVar48 = lVar48 * sStack_748;
                                                          pvVar11 = pgStack_738->data;
                                                          pvVar12 = pgStack_740->data;
                                                          lVar72 = 0;
                                                          do {
                                                            pgStack_788 = (ggml_tensor *)0x131036;
                                                            fVar90 = logf(*(float *)((long)pvVar12 +
                                                                                    lVar72 * 4 +
                                                                                    lVar52 + lVar48 
                                                  + lVar70));
                                                  *(float *)((long)pvVar11 +
                                                            lVar72 * 4 + lVar54 + lVar51 + lVar50) =
                                                       fVar90;
                                                  lVar72 = lVar72 + 1;
                                                  } while (lVar55 != lVar72);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != lVar71);
                                                  return;
                                                  }
LAB_00131211:
                                                  pcVar53 = "nb00 == sizeof(src0_t)";
                                                  uVar57 = 0x56;
                                                  goto LAB_0013122b;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else if ((gVar2 == GGML_TYPE_F16) &&
                                                          (pgVar60->type == GGML_TYPE_F16)) {
                                                    pgStack_788 = (ggml_tensor *)0x130a01;
                                                    cVar47 = ggml_is_contiguous_1(pgVar59);
                                                    if (cVar47 != '\0') {
                                                      pgStack_788 = (ggml_tensor *)0x130a11;
                                                      cVar47 = ggml_is_contiguous_1(pgVar60);
                                                      if (cVar47 != '\0') {
                                                        pgStack_788 = (ggml_tensor *)0x130a24;
                                                        cVar47 = ggml_are_same_shape(pgVar59,pgVar60
                                                                                    );
                                                        if (cVar47 != '\0') {
                                                          if (pgVar60->nb[0] == 2) {
                                                            if (pgVar59->nb[0] == 2) {
                                                              lStack_778 = pgVar59->ne[1];
                                                              lStack_780 = pgVar59->ne[2];
                                                              sStack_750 = pgVar59->nb[1];
                                                              sStack_758 = pgVar59->nb[2];
                                                              sStack_760 = pgVar59->nb[3];
                                                              lVar55 = pgVar60->ne[0];
                                                              sStack_768 = pgVar60->nb[1];
                                                              sStack_770 = pgVar60->nb[2];
                                                              sStack_730 = pgVar60->nb[3];
                                                              gVar2 = pgVar66->type;
                                                              iVar73 = *(int *)&pgVar66->field_0x4;
                                                              pgStack_788 = (ggml_tensor *)0x130a9c;
                                                              lVar71 = ggml_nrows(pgVar59);
                                                              lVar52 = ((long)iVar73 + -1 + lVar71)
                                                                       / (long)iVar73;
                                                              lVar49 = (int)gVar2 * lVar52;
                                                              sStack_748 = lVar52 + lVar49;
                                                              if (lVar71 <= (long)sStack_748) {
                                                                sStack_748 = lVar71;
                                                              }
                                                              if ((long)sStack_748 <= lVar49) {
                                                                return;
                                                              }
                                                              lStack_780 = lStack_780 * lStack_778;
                                                              do {
                                                                if (0 < lVar55) {
                                                                  lVar52 = (lVar49 / lStack_780) *
                                                                           sStack_760;
                                                                  lVar71 = ((lVar49 % lStack_780) /
                                                                           lStack_778) * sStack_758;
                                                                  lVar48 = ((lVar49 % lStack_780) %
                                                                           lStack_778) * sStack_750;
                                                                  pvVar11 = pgStack_740->data;
                                                                  lVar70 = 0;
                                                                  do {
                                                                    pgStack_788 = (ggml_tensor *)
                                                                                  0x130b5c;
                                                                    auVar85._0_4_ =
                                                                         logf(*(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pvVar11 +
                                                          lVar70 * 2 + lVar71 + lVar48 + lVar52) * 4
                                                  ));
                                                  auVar85._4_60_ = extraout_var_05;
                                                  auVar97 = vcvtps2ph_f16c(auVar85._0_16_,0);
                                                  vpextrw_avx(auVar97,0);
                                                  lVar70 = lVar70 + 1;
                                                  } while (lVar55 != lVar70);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != sStack_748);
                                                  return;
                                                  }
                                                  goto LAB_00131211;
                                                  }
                                                  goto LAB_001311f5;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else if (gVar2 == GGML_TYPE_BF16) {
                                                    gVar4 = pgVar60->type;
                                                    in_RCX = (ulong)gVar4;
                                                    if (gVar4 == GGML_TYPE_F32) {
                                                      pgStack_788 = (ggml_tensor *)0x13105e;
                                                      cVar47 = ggml_is_contiguous_1(pgVar59);
                                                      if (cVar47 != '\0') {
                                                        pgStack_788 = (ggml_tensor *)0x13106e;
                                                        cVar47 = ggml_is_contiguous_1(pgVar60);
                                                        if (cVar47 != '\0') {
                                                          pgStack_788 = (ggml_tensor *)0x131081;
                                                          cVar47 = ggml_are_same_shape(pgVar59,
                                                  pgVar60);
                                                  if (cVar47 != '\0') {
                                                    if (pgVar60->nb[0] == 4) {
                                                      if (pgVar59->nb[0] == 2) {
                                                        lStack_778 = pgVar59->ne[1];
                                                        lStack_780 = pgVar59->ne[2];
                                                        sStack_748 = pgVar59->nb[1];
                                                        sStack_750 = pgVar59->nb[2];
                                                        sStack_758 = pgVar59->nb[3];
                                                        lVar55 = pgVar60->ne[0];
                                                        sStack_760 = pgVar60->nb[1];
                                                        sStack_768 = pgVar60->nb[2];
                                                        sStack_770 = pgVar60->nb[3];
                                                        gVar2 = pgVar66->type;
                                                        iVar73 = *(int *)&pgVar66->field_0x4;
                                                        pgStack_788 = (ggml_tensor *)0x1310f9;
                                                        lVar52 = ggml_nrows(pgVar59);
                                                        lVar71 = ((long)iVar73 + -1 + lVar52) /
                                                                 (long)iVar73;
                                                        lVar49 = (int)gVar2 * lVar71;
                                                        lVar71 = lVar71 + lVar49;
                                                        if (lVar52 <= lVar71) {
                                                          lVar71 = lVar52;
                                                        }
                                                        if (lVar71 <= lVar49) {
                                                          return;
                                                        }
                                                        lStack_780 = lStack_780 * lStack_778;
                                                        do {
                                                          lVar52 = (lVar49 % lStack_780) /
                                                                   lStack_778;
                                                          lVar48 = (lVar49 % lStack_780) %
                                                                   lStack_778;
                                                          if (0 < lVar55) {
                                                            lVar50 = (lVar49 / lStack_780) *
                                                                     sStack_770;
                                                            lVar51 = lVar52 * sStack_768;
                                                            lVar72 = lVar48 * sStack_760;
                                                            lVar70 = (lVar49 / lStack_780) *
                                                                     sStack_758;
                                                            lVar52 = lVar52 * sStack_750;
                                                            lVar48 = lVar48 * sStack_748;
                                                            pvVar11 = pgStack_738->data;
                                                            pvVar12 = pgStack_740->data;
                                                            lVar54 = 0;
                                                            do {
                                                              pgStack_788 = (ggml_tensor *)0x1311af;
                                                              fVar90 = logf((float)((uint)*(ushort *
                                                  )((long)pvVar12 +
                                                   lVar54 * 2 + lVar52 + lVar48 + lVar70) << 0x10));
                                                  *(float *)((long)pvVar11 +
                                                            lVar54 * 4 + lVar51 + lVar72 + lVar50) =
                                                       fVar90;
                                                  lVar54 = lVar54 + 1;
                                                  } while (lVar55 != lVar54);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != lVar71);
                                                  return;
                                                  }
                                                  goto LAB_00131211;
                                                  }
                                                  goto LAB_001311f5;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    if (gVar4 != GGML_TYPE_BF16) goto LAB_00130d4a;
                                                    pgStack_788 = (ggml_tensor *)0x130ba9;
                                                    cVar47 = ggml_is_contiguous_1(pgVar59);
                                                    if (cVar47 != '\0') {
                                                      pgStack_788 = (ggml_tensor *)0x130bb9;
                                                      cVar47 = ggml_is_contiguous_1(pgVar60);
                                                      if (cVar47 != '\0') {
                                                        pgStack_788 = (ggml_tensor *)0x130bcc;
                                                        cVar47 = ggml_are_same_shape(pgVar59,pgVar60
                                                                                    );
                                                        if (cVar47 != '\0') {
                                                          if (pgVar60->nb[0] == 2) {
                                                            if (pgVar59->nb[0] == 2) {
                                                              lStack_778 = pgVar59->ne[1];
                                                              lStack_780 = pgVar59->ne[2];
                                                              sStack_748 = pgVar59->nb[1];
                                                              sStack_750 = pgVar59->nb[2];
                                                              sStack_758 = pgVar59->nb[3];
                                                              lVar55 = pgVar60->ne[0];
                                                              sStack_760 = pgVar60->nb[1];
                                                              sStack_768 = pgVar60->nb[2];
                                                              sStack_770 = pgVar60->nb[3];
                                                              gVar2 = pgVar66->type;
                                                              iVar73 = *(int *)&pgVar66->field_0x4;
                                                              pgStack_788 = (ggml_tensor *)0x130c44;
                                                              lVar52 = ggml_nrows(pgVar59);
                                                              lVar71 = ((long)iVar73 + -1 + lVar52)
                                                                       / (long)iVar73;
                                                              lVar49 = (int)gVar2 * lVar71;
                                                              lVar71 = lVar71 + lVar49;
                                                              if (lVar52 <= lVar71) {
                                                                lVar71 = lVar52;
                                                              }
                                                              if (lVar71 <= lVar49) {
                                                                return;
                                                              }
                                                              lStack_780 = lStack_780 * lStack_778;
                                                              do {
                                                                lVar52 = (lVar49 % lStack_780) /
                                                                         lStack_778;
                                                                lVar48 = (lVar49 % lStack_780) %
                                                                         lStack_778;
                                                                if (0 < lVar55) {
                                                                  lVar50 = (lVar49 / lStack_780) *
                                                                           sStack_770;
                                                                  lVar51 = lVar52 * sStack_768;
                                                                  lVar54 = lVar48 * sStack_760;
                                                                  lVar70 = (lVar49 / lStack_780) *
                                                                           sStack_758;
                                                                  lVar52 = lVar52 * sStack_750;
                                                                  lVar48 = lVar48 * sStack_748;
                                                                  pvVar11 = pgStack_738->data;
                                                                  pvVar12 = pgStack_740->data;
                                                                  lVar72 = 0;
                                                                  do {
                                                                    pgStack_788 = (ggml_tensor *)
                                                                                  0x130d01;
                                                                    fVar90 = logf((float)((uint)*(
                                                  ushort *)((long)pvVar12 +
                                                           lVar72 * 2 + lVar52 + lVar48 + lVar70) <<
                                                  0x10));
                                                  if ((uint)ABS(fVar90) < 0x7f800001) {
                                                    uVar56 = (ushort)((int)fVar90 + 0x7fff +
                                                                      ((uint)fVar90 >> 0x10 & 1) >>
                                                                     0x10);
                                                  }
                                                  else {
                                                    uVar56 = (ushort)((uint)fVar90 >> 0x10) | 0x40;
                                                  }
                                                  *(ushort *)
                                                   ((long)pvVar11 +
                                                   lVar72 * 2 + lVar51 + lVar54 + lVar50) = uVar56;
                                                  lVar72 = lVar72 + 1;
                                                  } while (lVar55 != lVar72);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != lVar71);
                                                  return;
                                                  }
                                                  goto LAB_00131211;
                                                  }
                                                  goto LAB_001311f5;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
LAB_00130d4a:
                                                    if ((gVar2 != GGML_TYPE_F16) ||
                                                       (pgVar60->type != GGML_TYPE_F32)) {
                                                      pgStack_788 = (ggml_tensor *)0x13123d;
                                                      pgVar58 = pgVar60;
                                                      ggml_compute_forward_log_cold_1();
                                                      pgStack_788 = pgVar64;
                                                      pgStack_790 = pgVar13;
                                                      pgStack_798 = pgVar60;
                                                      uVar63 = (uint)pgVar58;
                                                      uVar68 = uVar63 & 0xffffffc0;
                                                      uStack_840 = 0;
                                                      uStack_838 = 0;
                                                      uStack_830 = 0;
                                                      uStack_828 = 0;
                                                      uStack_820 = 0;
                                                      uStack_818 = 0;
                                                      uStack_810 = 0;
                                                      uStack_808 = 0;
                                                      uStack_880 = 0;
                                                      uStack_878 = 0;
                                                      uStack_870 = 0;
                                                      uStack_868 = 0;
                                                      uStack_860 = 0;
                                                      uStack_858 = 0;
                                                      uStack_850 = 0;
                                                      uStack_848 = 0;
                                                      uStack_8c0 = 0;
                                                      uStack_8b8 = 0;
                                                      uStack_8b0 = 0;
                                                      uStack_8a8 = 0;
                                                      uStack_8a0 = 0;
                                                      uStack_898 = 0;
                                                      uStack_890 = 0;
                                                      uStack_888 = 0;
                                                      auStack_900 = ZEXT1664(ZEXT816(0));
                                                      if (0 < (int)uVar68) {
                                                        uVar67 = 0;
                                                        lVar55 = in_R9;
                                                        uVar69 = in_RCX;
                                                        do {
                                                          lVar71 = 0;
                                                          do {
                                                            auVar89 = vfmadd213ps_avx512f(*(
                                                  undefined1 (*) [64])(lVar55 + lVar71),
                                                  *(undefined1 (*) [64])(uVar69 + lVar71),
                                                  *(undefined1 (*) [64])(auStack_900 + lVar71));
                                                  *(undefined1 (*) [64])(auStack_900 + lVar71) =
                                                       auVar89;
                                                  lVar71 = lVar71 + 0x40;
                                                  } while (lVar71 != 0x100);
                                                  uVar67 = uVar67 + 0x40;
                                                  lVar55 = lVar55 + 0x100;
                                                  uVar69 = uVar69 + 0x100;
                                                  } while (uVar67 < uVar68);
                                                  }
                                                  lVar55 = 0;
                                                  do {
                                                    auVar89 = vaddps_avx512f(*(undefined1 (*) [64])
                                                                              (auStack_900 + lVar55)
                                                                             ,*(undefined1 (*) [64])
                                                                               ((long)&uStack_880 +
                                                                               lVar55));
                                                    *(undefined1 (*) [64])(auStack_900 + lVar55) =
                                                         auVar89;
                                                    lVar55 = lVar55 + 0x40;
                                                  } while (lVar55 == 0x40);
                                                  auVar89._8_8_ = uStack_8b8;
                                                  auVar89._0_8_ = uStack_8c0;
                                                  auVar89._16_8_ = uStack_8b0;
                                                  auVar89._24_8_ = uStack_8a8;
                                                  auVar89._32_8_ = uStack_8a0;
                                                  auVar89._40_8_ = uStack_898;
                                                  auVar89._48_8_ = uStack_890;
                                                  auVar89._56_8_ = uStack_888;
                                                  auVar89 = vaddps_avx512f(auStack_900,auVar89);
                                                  auVar81 = vextractf64x4_avx512f(auVar89,1);
                                                  auVar89 = vaddps_avx512f(auVar89,ZEXT3264(auVar81)
                                                                          );
                                                  auVar95._0_4_ = auVar89._0_4_ + auVar89._16_4_;
                                                  auVar95._4_4_ = auVar89._4_4_ + auVar89._20_4_;
                                                  auVar95._8_4_ = auVar89._8_4_ + auVar89._24_4_;
                                                  auVar95._12_4_ = auVar89._12_4_ + auVar89._28_4_;
                                                  auVar97 = vshufpd_avx(auVar95,auVar95,1);
                                                  auVar96._0_4_ = auVar95._0_4_ + auVar97._0_4_;
                                                  auVar96._4_4_ = auVar95._4_4_ + auVar97._4_4_;
                                                  auVar96._8_4_ = auVar95._8_4_ + auVar97._8_4_;
                                                  auVar96._12_4_ = auVar95._12_4_ + auVar97._12_4_;
                                                  auVar97 = vhaddps_avx(auVar96,auVar96);
                                                  auVar89 = ZEXT1664(auVar97);
                                                  if (uVar68 != uVar63) {
                                                    lVar55 = (long)(int)uVar68;
                                                    do {
                                                      auVar97 = vfmadd231ss_fma(auVar89._0_16_,
                                                                                ZEXT416(*(uint *)(
                                                  in_RCX + lVar55 * 4)),
                                                  ZEXT416(*(uint *)(in_R9 + lVar55 * 4)));
                                                  auVar89 = ZEXT1664(auVar97);
                                                  lVar55 = lVar55 + 1;
                                                  } while (lVar55 < (int)uVar63);
                                                  }
                                                  pgVar59->type = auVar89._0_4_;
                                                  return;
                                                  }
                                                  pgStack_788 = (ggml_tensor *)0x130d64;
                                                  cVar47 = ggml_is_contiguous_1(pgVar59);
                                                  if (cVar47 != '\0') {
                                                    pgStack_788 = (ggml_tensor *)0x130d74;
                                                    cVar47 = ggml_is_contiguous_1(pgVar60);
                                                    if (cVar47 != '\0') {
                                                      pgStack_788 = (ggml_tensor *)0x130d87;
                                                      cVar47 = ggml_are_same_shape(pgVar59,pgVar60);
                                                      if (cVar47 != '\0') {
                                                        if (pgVar60->nb[0] == 4) {
                                                          if (pgVar59->nb[0] == 2) {
                                                            lStack_778 = pgVar59->ne[1];
                                                            lStack_780 = pgVar59->ne[2];
                                                            sStack_750 = pgVar59->nb[1];
                                                            sStack_758 = pgVar59->nb[2];
                                                            sStack_760 = pgVar59->nb[3];
                                                            lVar55 = pgVar60->ne[0];
                                                            sStack_768 = pgVar60->nb[1];
                                                            sStack_770 = pgVar60->nb[2];
                                                            sStack_730 = pgVar60->nb[3];
                                                            gVar2 = pgVar66->type;
                                                            iVar73 = *(int *)&pgVar66->field_0x4;
                                                            pgStack_788 = (ggml_tensor *)0x130dff;
                                                            lVar71 = ggml_nrows(pgVar59);
                                                            lVar52 = ((long)iVar73 + -1 + lVar71) /
                                                                     (long)iVar73;
                                                            lVar49 = (int)gVar2 * lVar52;
                                                            sStack_748 = lVar52 + lVar49;
                                                            if (lVar71 <= (long)sStack_748) {
                                                              sStack_748 = lVar71;
                                                            }
                                                            if (lVar49 < (long)sStack_748) {
                                                              lStack_780 = lStack_780 * lStack_778;
                                                              do {
                                                                lVar71 = (lVar49 % lStack_780) /
                                                                         lStack_778;
                                                                lVar52 = (lVar49 % lStack_780) %
                                                                         lStack_778;
                                                                if (0 < lVar55) {
                                                                  lVar70 = (lVar49 / lStack_780) *
                                                                           sStack_730;
                                                                  lVar50 = lVar71 * sStack_770;
                                                                  lVar54 = lVar52 * sStack_768;
                                                                  lVar48 = (lVar49 / lStack_780) *
                                                                           sStack_760;
                                                                  lVar71 = lVar71 * sStack_758;
                                                                  lVar52 = lVar52 * sStack_750;
                                                                  pvVar11 = pgStack_738->data;
                                                                  pvVar12 = pgStack_740->data;
                                                                  lVar51 = 0;
                                                                  do {
                                                                    pgStack_788 = (ggml_tensor *)
                                                                                  0x130ebf;
                                                                    fVar90 = logf(*(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pvVar12 +
                                                          lVar51 * 2 + lVar71 + lVar52 + lVar48) * 4
                                                  ));
                                                  *(float *)((long)pvVar11 +
                                                            lVar51 * 4 + lVar50 + lVar54 + lVar70) =
                                                       fVar90;
                                                  lVar51 = lVar51 + 1;
                                                  } while (lVar55 != lVar51);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != sStack_748);
                                                  }
                                                  return;
                                                  }
                                                  goto LAB_00131211;
                                                  }
LAB_001311f5:
                                                  pcVar53 = "nb0 == sizeof(dst_t)";
                                                  uVar57 = 0x55;
                                                  goto LAB_0013122b;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  pcVar53 = 
                                                  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                                                  ;
                                                  uVar57 = 0x51;
LAB_0013122b:
                                                  pgStack_788 = (ggml_tensor *)0x131232;
                                                  ggml_abort(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                                                  ,uVar57,"GGML_ASSERT(%s) failed",pcVar53);
                                                  }
                                                  pgStack_700 = (ggml_tensor *)0x1304d8;
                                                  cVar47 = ggml_is_contiguous_1(pgVar58);
                                                  if (cVar47 != '\0') {
                                                    pgStack_700 = (ggml_tensor *)0x1304e8;
                                                    cVar47 = ggml_is_contiguous_1(pgVar61);
                                                    if (cVar47 != '\0') {
                                                      pgStack_700 = (ggml_tensor *)0x1304fb;
                                                      cVar47 = ggml_are_same_shape(pgVar58,pgVar61);
                                                      if (cVar47 != '\0') {
                                                        if (pgVar61->nb[0] == 4) {
                                                          if (pgVar58->nb[0] == 2) {
                                                            lStack_6f0 = pgVar58->ne[1];
                                                            lStack_6f8 = pgVar58->ne[2];
                                                            sStack_6c8 = pgVar58->nb[1];
                                                            sStack_6d0 = pgVar58->nb[2];
                                                            sStack_6d8 = pgVar58->nb[3];
                                                            lVar55 = pgVar61->ne[0];
                                                            sStack_6e0 = pgVar61->nb[1];
                                                            sStack_6e8 = pgVar61->nb[2];
                                                            sStack_6a8 = pgVar61->nb[3];
                                                            gVar2 = pgVar65->type;
                                                            iVar73 = *(int *)&pgVar65->field_0x4;
                                                            pgStack_700 = (ggml_tensor *)0x130573;
                                                            lVar71 = ggml_nrows(pgVar58);
                                                            lVar52 = ((long)iVar73 + -1 + lVar71) /
                                                                     (long)iVar73;
                                                            lVar49 = (int)gVar2 * lVar52;
                                                            sStack_6c0 = lVar52 + lVar49;
                                                            if (lVar71 <= (long)sStack_6c0) {
                                                              sStack_6c0 = lVar71;
                                                            }
                                                            if (lVar49 < (long)sStack_6c0) {
                                                              lStack_6f8 = lStack_6f8 * lStack_6f0;
                                                              do {
                                                                lVar71 = (lVar49 % lStack_6f8) /
                                                                         lStack_6f0;
                                                                lVar52 = (lVar49 % lStack_6f8) %
                                                                         lStack_6f0;
                                                                if (0 < lVar55) {
                                                                  lVar70 = (lVar49 / lStack_6f8) *
                                                                           sStack_6a8;
                                                                  lVar50 = lVar71 * sStack_6e8;
                                                                  lVar54 = lVar52 * sStack_6e0;
                                                                  lVar48 = (lVar49 / lStack_6f8) *
                                                                           sStack_6d8;
                                                                  lVar71 = lVar71 * sStack_6d0;
                                                                  lVar52 = lVar52 * sStack_6c8;
                                                                  pvVar11 = pgStack_6b0->data;
                                                                  pvVar12 = pgStack_6b8->data;
                                                                  lVar51 = 0;
                                                                  do {
                                                                    pgStack_700 = (ggml_tensor *)
                                                                                  0x130633;
                                                                    fVar90 = cosf(*(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pvVar12 +
                                                          lVar51 * 2 + lVar71 + lVar52 + lVar48) * 4
                                                  ));
                                                  *(float *)((long)pvVar11 +
                                                            lVar51 * 4 + lVar50 + lVar54 + lVar70) =
                                                       fVar90;
                                                  lVar51 = lVar51 + 1;
                                                  } while (lVar55 != lVar51);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != sStack_6c0);
                                                  }
                                                  return;
                                                  }
                                                  goto LAB_00130985;
                                                  }
LAB_00130969:
                                                  pcVar53 = "nb0 == sizeof(dst_t)";
                                                  uVar57 = 0x55;
                                                  goto LAB_0013099f;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  pcVar53 = 
                                                  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                                                  ;
                                                  uVar57 = 0x51;
LAB_0013099f:
                                                  pgStack_700 = (ggml_tensor *)0x1309a6;
                                                  ggml_abort(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                                                  ,uVar57,"GGML_ASSERT(%s) failed",pcVar53);
                                                  }
                                                  pgStack_678 = (ggml_tensor *)0x12fc4c;
                                                  cVar47 = ggml_is_contiguous_1(pgVar59);
                                                  if (cVar47 != '\0') {
                                                    pgStack_678 = (ggml_tensor *)0x12fc5c;
                                                    cVar47 = ggml_is_contiguous_1(pgVar60);
                                                    if (cVar47 != '\0') {
                                                      pgStack_678 = (ggml_tensor *)0x12fc6f;
                                                      cVar47 = ggml_are_same_shape(pgVar59,pgVar60);
                                                      if (cVar47 != '\0') {
                                                        if (pgVar60->nb[0] == 4) {
                                                          if (pgVar59->nb[0] == 2) {
                                                            lStack_668 = pgVar59->ne[1];
                                                            lStack_670 = pgVar59->ne[2];
                                                            sStack_640 = pgVar59->nb[1];
                                                            sStack_648 = pgVar59->nb[2];
                                                            sStack_650 = pgVar59->nb[3];
                                                            lVar55 = pgVar60->ne[0];
                                                            sStack_658 = pgVar60->nb[1];
                                                            sStack_660 = pgVar60->nb[2];
                                                            sStack_620 = pgVar60->nb[3];
                                                            gVar2 = pgVar66->type;
                                                            iVar73 = *(int *)&pgVar66->field_0x4;
                                                            pgStack_678 = (ggml_tensor *)0x12fce7;
                                                            lVar71 = ggml_nrows(pgVar59);
                                                            lVar52 = ((long)iVar73 + -1 + lVar71) /
                                                                     (long)iVar73;
                                                            lVar49 = (int)gVar2 * lVar52;
                                                            sStack_638 = lVar52 + lVar49;
                                                            if (lVar71 <= (long)sStack_638) {
                                                              sStack_638 = lVar71;
                                                            }
                                                            if (lVar49 < (long)sStack_638) {
                                                              lStack_670 = lStack_670 * lStack_668;
                                                              do {
                                                                lVar71 = (lVar49 % lStack_670) /
                                                                         lStack_668;
                                                                lVar52 = (lVar49 % lStack_670) %
                                                                         lStack_668;
                                                                if (0 < lVar55) {
                                                                  lVar70 = (lVar49 / lStack_670) *
                                                                           sStack_620;
                                                                  lVar50 = lVar71 * sStack_660;
                                                                  lVar54 = lVar52 * sStack_658;
                                                                  lVar48 = (lVar49 / lStack_670) *
                                                                           sStack_650;
                                                                  lVar71 = lVar71 * sStack_648;
                                                                  lVar52 = lVar52 * sStack_640;
                                                                  pvVar11 = pgStack_628->data;
                                                                  pvVar12 = pgStack_630->data;
                                                                  lVar51 = 0;
                                                                  do {
                                                                    pgStack_678 = (ggml_tensor *)
                                                                                  0x12fda7;
                                                                    fVar90 = sinf(*(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pvVar12 +
                                                          lVar51 * 2 + lVar71 + lVar52 + lVar48) * 4
                                                  ));
                                                  *(float *)((long)pvVar11 +
                                                            lVar51 * 4 + lVar50 + lVar54 + lVar70) =
                                                       fVar90;
                                                  lVar51 = lVar51 + 1;
                                                  } while (lVar55 != lVar51);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != sStack_638);
                                                  }
                                                  return;
                                                  }
                                                  goto LAB_001300f9;
                                                  }
LAB_001300dd:
                                                  pcVar53 = "nb0 == sizeof(dst_t)";
                                                  uVar57 = 0x55;
                                                  goto LAB_00130113;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  pcVar53 = 
                                                  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                                                  ;
                                                  uVar57 = 0x51;
LAB_00130113:
                                                  pgStack_678 = (ggml_tensor *)0x13011a;
                                                  ggml_abort(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                                                  ,uVar57,"GGML_ASSERT(%s) failed",pcVar53);
                                                  }
                                                  pgStack_5f0 = (ggml_tensor *)0x12f378;
                                                  cVar47 = ggml_is_contiguous_1(pgVar58);
                                                  if (cVar47 != '\0') {
                                                    pgStack_5f0 = (ggml_tensor *)0x12f388;
                                                    cVar47 = ggml_is_contiguous_1(pgVar61);
                                                    if (cVar47 != '\0') {
                                                      pgStack_5f0 = (ggml_tensor *)0x12f39b;
                                                      cVar47 = ggml_are_same_shape(pgVar58,pgVar61);
                                                      if (cVar47 != '\0') {
                                                        if (pgVar61->nb[0] == 4) {
                                                          if (pgVar58->nb[0] == 2) {
                                                            lStack_5e0 = pgVar58->ne[1];
                                                            lStack_5e8 = pgVar58->ne[2];
                                                            sStack_5b8 = pgVar58->nb[1];
                                                            sStack_5c0 = pgVar58->nb[2];
                                                            sStack_5c8 = pgVar58->nb[3];
                                                            lVar55 = pgVar61->ne[0];
                                                            sStack_5d0 = pgVar61->nb[1];
                                                            sStack_5d8 = pgVar61->nb[2];
                                                            sStack_598 = pgVar61->nb[3];
                                                            gVar2 = pgVar65->type;
                                                            iVar73 = *(int *)&pgVar65->field_0x4;
                                                            pgStack_5f0 = (ggml_tensor *)0x12f413;
                                                            lVar71 = ggml_nrows(pgVar58);
                                                            lVar52 = ((long)iVar73 + -1 + lVar71) /
                                                                     (long)iVar73;
                                                            lVar49 = (int)gVar2 * lVar52;
                                                            sStack_5b0 = lVar52 + lVar49;
                                                            if (lVar71 <= (long)sStack_5b0) {
                                                              sStack_5b0 = lVar71;
                                                            }
                                                            if (lVar49 < (long)sStack_5b0) {
                                                              lStack_5e8 = lStack_5e8 * lStack_5e0;
                                                              do {
                                                                lVar71 = (lVar49 % lStack_5e8) /
                                                                         lStack_5e0;
                                                                lVar52 = (lVar49 % lStack_5e8) %
                                                                         lStack_5e0;
                                                                if (0 < lVar55) {
                                                                  lVar70 = (lVar49 / lStack_5e8) *
                                                                           sStack_598;
                                                                  lVar50 = lVar71 * sStack_5d8;
                                                                  lVar54 = lVar52 * sStack_5d0;
                                                                  lVar48 = (lVar49 / lStack_5e8) *
                                                                           sStack_5c8;
                                                                  lVar71 = lVar71 * sStack_5c0;
                                                                  lVar52 = lVar52 * sStack_5b8;
                                                                  pvVar11 = pgStack_5a0->data;
                                                                  pvVar12 = pgStack_5a8->data;
                                                                  lVar51 = 0;
                                                                  do {
                                                                    fVar90 = *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pvVar12 +
                                                          lVar51 * 2 + lVar71 + lVar52 + lVar48) * 4
                                                  );
                                                  if (fVar90 < 0.0) {
                                                    pgStack_5f0 = (ggml_tensor *)0x12f4e7;
                                                    fVar90 = sqrtf(fVar90);
                                                  }
                                                  else {
                                                    auVar97 = vsqrtss_avx(ZEXT416((uint)fVar90),
                                                                          ZEXT416((uint)fVar90));
                                                    fVar90 = auVar97._0_4_;
                                                  }
                                                  *(float *)((long)pvVar11 +
                                                            lVar51 * 4 + lVar50 + lVar54 + lVar70) =
                                                       fVar90;
                                                  lVar51 = lVar51 + 1;
                                                  } while (lVar55 != lVar51);
                                                  }
                                                  lVar49 = lVar49 + 1;
                                                  } while (lVar49 != sStack_5b0);
                                                  }
                                                  return;
                                                  }
                                                  goto LAB_0012f86d;
                                                  }
LAB_0012f851:
                                                  pcVar53 = "nb0 == sizeof(dst_t)";
                                                  uVar57 = 0x55;
                                                  goto LAB_0012f887;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  pcVar53 = 
                                                  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                                                  ;
                                                  uVar57 = 0x51;
LAB_0012f887:
                                                  pgStack_5f0 = (ggml_tensor *)0x12f88e;
                                                  ggml_abort(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                                                  ,uVar57,"GGML_ASSERT(%s) failed",pcVar53);
                                                }
                                                pgStack_568 = (ggml_tensor *)0x12eaa2;
                                                cVar47 = ggml_is_contiguous_1(pgVar66);
                                                if (cVar47 != '\0') {
                                                  pgStack_568 = (ggml_tensor *)0x12eab2;
                                                  cVar47 = ggml_is_contiguous_1(pgVar62);
                                                  if (cVar47 != '\0') {
                                                    pgStack_568 = (ggml_tensor *)0x12eac5;
                                                    cVar47 = ggml_are_same_shape(pgVar66,pgVar62);
                                                    if (cVar47 != '\0') {
                                                      if (pgVar62->nb[0] == 4) {
                                                        if (pgVar66->nb[0] == 2) {
                                                          lVar55 = pgVar66->ne[1];
                                                          lVar71 = pgVar66->ne[2];
                                                          sStack_538 = pgVar66->nb[1];
                                                          sStack_540 = pgVar66->nb[2];
                                                          sStack_548 = pgVar66->nb[3];
                                                          lVar52 = pgVar62->ne[0];
                                                          sStack_550 = pgVar62->nb[1];
                                                          sStack_558 = pgVar62->nb[2];
                                                          sVar5 = pgVar62->nb[3];
                                                          gVar2 = pgVar64->type;
                                                          pgStack_560 = (ggml_tensor *)
                                                                        (long)*(int *)&pgVar64->
                                                  field_0x4;
                                                  pgStack_568 = (ggml_tensor *)0x12eb3b;
                                                  lVar48 = ggml_nrows(pgVar66);
                                                  lVar49 = ((long)pgStack_560 + -1 + lVar48) /
                                                           (long)pgStack_560;
                                                  lVar70 = (int)gVar2 * lVar49;
                                                  lVar49 = lVar49 + lVar70;
                                                  if (lVar48 <= lVar49) {
                                                    lVar49 = lVar48;
                                                  }
                                                  if (lVar70 < lVar49) {
                                                    lVar71 = lVar71 * lVar55;
                                                    pvVar11 = pgStack_530->data;
                                                    pvVar12 = pgVar66->data;
                                                    do {
                                                      lVar48 = lVar70 / lVar71;
                                                      lVar54 = lVar70 % lVar71;
                                                      lVar50 = lVar54 / lVar55;
                                                      lVar54 = lVar54 % lVar55;
                                                      if (0 < lVar52) {
                                                        lVar51 = 0;
                                                        do {
                                                          *(float *)((long)pvVar11 +
                                                                    lVar51 * 4 +
                                                                    lVar50 * sStack_558 +
                                                                    lVar54 * sStack_550 +
                                                                    lVar48 * sVar5) =
                                                               *(float *)(&ggml_table_f32_f16 +
                                                                         (ulong)*(ushort *)
                                                                                 ((long)pvVar12 +
                                                                                 lVar51 * 2 +
                                                                                 lVar50 * sStack_540
                                                                                 + lVar54 * 
                                                  sStack_538 + lVar48 * sStack_548) * 4) *
                                                  *(float *)(&ggml_table_f32_f16 +
                                                            (ulong)*(ushort *)
                                                                    ((long)pvVar12 +
                                                                    lVar51 * 2 +
                                                                    lVar50 * sStack_540 +
                                                                    lVar54 * sStack_538 +
                                                                    lVar48 * sStack_548) * 4);
                                                  lVar51 = lVar51 + 1;
                                                  } while (lVar52 != lVar51);
                                                  }
                                                  lVar70 = lVar70 + 1;
                                                  } while (lVar70 != lVar49);
                                                  }
                                                  return;
                                                  }
                                                  goto LAB_0012ef6d;
                                                  }
LAB_0012ef51:
                                                  pcVar53 = "nb0 == sizeof(dst_t)";
                                                  uVar57 = 0x55;
                                                  goto LAB_0012ef87;
                                                  }
                                                  }
                                                }
                                              }
                                              pcVar53 = 
                                              "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                                              ;
                                              uVar57 = 0x51;
LAB_0012ef87:
                                              pgStack_568 = (ggml_tensor *)0x12ef8e;
                                              ggml_abort(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                                                  ,uVar57,"GGML_ASSERT(%s) failed",pcVar53);
                                            }
                                            cVar47 = ggml_is_contiguous_1(pgVar13);
                                            if (((cVar47 != '\0') &&
                                                (cVar47 = ggml_is_contiguous_1(pgVar58),
                                                cVar47 != '\0')) &&
                                               (cVar47 = ggml_are_same_shape(pgVar13,pgVar58),
                                               cVar47 != '\0')) {
                                              if (pgVar58->nb[0] == 4) {
                                                if (pgVar13->nb[0] == 2) {
                                                  lVar55 = pgVar13->ne[1];
                                                  lVar71 = pgVar13->ne[2];
                                                  sVar5 = pgVar13->nb[1];
                                                  sVar6 = pgVar13->nb[2];
                                                  sVar7 = pgVar13->nb[3];
                                                  lVar52 = pgVar58->ne[0];
                                                  sVar8 = pgVar58->nb[1];
                                                  sVar9 = pgVar58->nb[2];
                                                  sVar10 = pgVar58->nb[3];
                                                  gVar2 = pgVar61->type;
                                                  iVar73 = *(int *)&pgVar61->field_0x4;
                                                  lVar48 = ggml_nrows();
                                                  lVar49 = ((long)iVar73 + -1 + lVar48) /
                                                           (long)iVar73;
                                                  lVar70 = (int)gVar2 * lVar49;
                                                  lVar49 = lVar49 + lVar70;
                                                  if (lVar48 <= lVar49) {
                                                    lVar49 = lVar48;
                                                  }
                                                  if (lVar70 < lVar49) {
                                                    lVar71 = lVar71 * lVar55;
                                                    pvVar11 = pgVar58->data;
                                                    pvVar12 = pgVar13->data;
                                                    do {
                                                      lVar48 = lVar70 / lVar71;
                                                      lVar54 = lVar70 % lVar71;
                                                      lVar50 = lVar54 / lVar55;
                                                      lVar54 = lVar54 % lVar55;
                                                      if (0 < lVar52) {
                                                        lVar51 = 0;
                                                        do {
                                                          auVar97._0_4_ =
                                                               (*(float *)(&ggml_table_f32_f16 +
                                                                          (ulong)*(ushort *)
                                                                                  ((long)pvVar12 +
                                                                                  lVar51 * 2 +
                                                                                  lVar50 * sVar6 +
                                                                                  lVar54 * sVar5 +
                                                                                  lVar48 * sVar7) *
                                                                          4) + 3.0) / 6.0;
                                                          auVar97._4_12_ =
                                                               SUB6012((undefined1  [60])0x0,0);
                                                          auVar97 = vmaxss_avx(auVar97,ZEXT816(0) <<
                                                                                       0x40);
                                                          auVar97 = vminss_avx(auVar97,SUB6416(
                                                  ZEXT464(0x3f800000),0));
                                                  *(float *)((long)pvVar11 +
                                                            lVar51 * 4 +
                                                            lVar50 * sVar9 +
                                                            lVar54 * sVar8 + lVar48 * sVar10) =
                                                       *(float *)(&ggml_table_f32_f16 +
                                                                 (ulong)*(ushort *)
                                                                         ((long)pvVar12 +
                                                                         lVar51 * 2 +
                                                                         lVar50 * sVar6 +
                                                                         lVar54 * sVar5 +
                                                                         lVar48 * sVar7) * 4) *
                                                       auVar97._0_4_;
                                                  lVar51 = lVar51 + 1;
                                                  } while (lVar52 != lVar51);
                                                  }
                                                  lVar70 = lVar70 + 1;
                                                  } while (lVar70 != lVar49);
                                                  }
                                                  return;
                                                }
                                                goto LAB_0012e6e5;
                                              }
LAB_0012e6c9:
                                              pcVar53 = "nb0 == sizeof(dst_t)";
                                              uVar57 = 0x55;
                                              goto LAB_0012e6ff;
                                            }
                                          }
                                          pcVar53 = 
                                          "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                                          ;
                                          uVar57 = 0x51;
LAB_0012e6ff:
                                          ggml_abort(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                                                  ,uVar57,"GGML_ASSERT(%s) failed",pcVar53);
                                        }
                                        cVar47 = ggml_is_contiguous_1(pgVar58);
                                        if (((cVar47 != '\0') &&
                                            (cVar47 = ggml_is_contiguous_1(pgVar61), cVar47 != '\0')
                                            ) && (cVar47 = ggml_are_same_shape(pgVar58,pgVar61),
                                                 cVar47 != '\0')) {
                                          if (pgVar61->nb[0] == 4) {
                                            if (pgVar58->nb[0] == 2) {
                                              lVar55 = pgVar58->ne[1];
                                              lVar71 = pgVar58->ne[2];
                                              sVar5 = pgVar58->nb[1];
                                              sVar6 = pgVar58->nb[2];
                                              sVar7 = pgVar58->nb[3];
                                              lVar52 = pgVar61->ne[0];
                                              sVar8 = pgVar61->nb[1];
                                              sVar9 = pgVar61->nb[2];
                                              sVar10 = pgVar61->nb[3];
                                              gVar2 = pgVar59->type;
                                              iVar73 = *(int *)&pgVar59->field_0x4;
                                              lVar48 = ggml_nrows(pgVar58);
                                              lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                              lVar70 = (int)gVar2 * lVar49;
                                              lVar49 = lVar49 + lVar70;
                                              if (lVar48 <= lVar49) {
                                                lVar49 = lVar48;
                                              }
                                              if (lVar70 < lVar49) {
                                                lVar71 = lVar71 * lVar55;
                                                pvVar11 = pgVar61->data;
                                                pvVar12 = pgVar58->data;
                                                do {
                                                  lVar48 = lVar70 / lVar71;
                                                  lVar54 = lVar70 % lVar71;
                                                  lVar50 = lVar54 / lVar55;
                                                  lVar54 = lVar54 % lVar55;
                                                  if (0 < lVar52) {
                                                    lVar51 = 0;
                                                    do {
                                                      fVar90 = expf(*(float *)(&ggml_table_f32_f16 +
                                                                              (ulong)*(ushort *)
                                                                                      ((long)pvVar12
                                                                                      + lVar51 * 2 +
                                                                                        lVar50 * 
                                                  sVar6 + lVar54 * sVar5 + lVar48 * sVar7) * 4));
                                                  *(float *)((long)pvVar11 +
                                                            lVar51 * 4 +
                                                            lVar50 * sVar9 +
                                                            lVar54 * sVar8 + lVar48 * sVar10) =
                                                       fVar90;
                                                  lVar51 = lVar51 + 1;
                                                  } while (lVar52 != lVar51);
                                                  }
                                                  lVar70 = lVar70 + 1;
                                                } while (lVar70 != lVar49);
                                              }
                                              return;
                                            }
                                            goto LAB_0012dd7a;
                                          }
LAB_0012dd5e:
                                          pcVar53 = "nb0 == sizeof(dst_t)";
                                          uVar57 = 0x55;
                                          goto LAB_0012dd94;
                                        }
                                      }
                                      pcVar53 = 
                                      "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                                      ;
                                      uVar57 = 0x51;
LAB_0012dd94:
                                      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                                                 ,uVar57,"GGML_ASSERT(%s) failed",pcVar53);
                                    }
                                    cVar47 = ggml_is_contiguous_1(pgVar61);
                                    if (((cVar47 != '\0') &&
                                        (cVar47 = ggml_is_contiguous_1(pgVar59), cVar47 != '\0')) &&
                                       (cVar47 = ggml_are_same_shape(pgVar61,pgVar59),
                                       cVar47 != '\0')) {
                                      if (pgVar59->nb[0] == 4) {
                                        if (pgVar61->nb[0] == 2) {
                                          lVar55 = pgVar61->ne[1];
                                          lVar71 = pgVar61->ne[2];
                                          sVar5 = pgVar61->nb[1];
                                          sVar6 = pgVar61->nb[2];
                                          sVar7 = pgVar61->nb[3];
                                          lVar52 = pgVar59->ne[0];
                                          sVar8 = pgVar59->nb[1];
                                          sVar9 = pgVar59->nb[2];
                                          sVar10 = pgVar59->nb[3];
                                          gVar2 = pgVar58->type;
                                          iVar73 = *(int *)&pgVar58->field_0x4;
                                          lVar48 = ggml_nrows();
                                          lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                          lVar70 = (int)gVar2 * lVar49;
                                          lVar49 = lVar49 + lVar70;
                                          if (lVar48 <= lVar49) {
                                            lVar49 = lVar48;
                                          }
                                          if (lVar70 < lVar49) {
                                            lVar71 = lVar71 * lVar55;
                                            pvVar11 = pgVar59->data;
                                            pvVar12 = pgVar61->data;
                                            do {
                                              lVar48 = lVar70 / lVar71;
                                              lVar54 = lVar70 % lVar71;
                                              lVar50 = lVar54 / lVar55;
                                              lVar54 = lVar54 % lVar55;
                                              if (0 < lVar52) {
                                                lVar51 = 0;
                                                do {
                                                  auVar100._0_4_ =
                                                       (*(float *)(&ggml_table_f32_f16 +
                                                                  (ulong)*(ushort *)
                                                                          ((long)pvVar12 +
                                                                          lVar51 * 2 +
                                                                          lVar50 * sVar6 +
                                                                          lVar54 * sVar5 +
                                                                          lVar48 * sVar7) * 4) + 3.0
                                                       ) / 6.0;
                                                  auVar100._4_12_ = SUB6012((undefined1  [60])0x0,0)
                                                  ;
                                                  auVar97 = vmaxss_avx(auVar100,ZEXT816(0) << 0x40);
                                                  auVar97 = vminss_avx(auVar97,SUB6416(ZEXT464(
                                                  0x3f800000),0));
                                                  *(int *)((long)pvVar11 +
                                                          lVar51 * 4 +
                                                          lVar50 * sVar9 +
                                                          lVar54 * sVar8 + lVar48 * sVar10) =
                                                       auVar97._0_4_;
                                                  lVar51 = lVar51 + 1;
                                                } while (lVar52 != lVar51);
                                              }
                                              lVar70 = lVar70 + 1;
                                            } while (lVar70 != lVar49);
                                          }
                                          return;
                                        }
                                        goto LAB_0012d49a;
                                      }
LAB_0012d47e:
                                      pcVar53 = "nb0 == sizeof(dst_t)";
                                      uVar57 = 0x55;
                                      goto LAB_0012d4b4;
                                    }
                                  }
                                  pcVar53 = 
                                  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                                  ;
                                  uVar57 = 0x51;
LAB_0012d4b4:
                                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                                             ,uVar57,"GGML_ASSERT(%s) failed",pcVar53);
                                }
                                cVar47 = ggml_is_contiguous_1(pgVar59);
                                if (((cVar47 != '\0') &&
                                    (cVar47 = ggml_is_contiguous_1(pgVar58), cVar47 != '\0')) &&
                                   (cVar47 = ggml_are_same_shape(pgVar59,pgVar58), cVar47 != '\0'))
                                {
                                  if (pgVar58->nb[0] == 4) {
                                    if (pgVar59->nb[0] == 2) {
                                      lVar55 = pgVar59->ne[1];
                                      lVar71 = pgVar59->ne[2];
                                      sVar5 = pgVar59->nb[1];
                                      sVar6 = pgVar59->nb[2];
                                      sVar7 = pgVar59->nb[3];
                                      lVar52 = pgVar58->ne[0];
                                      sVar8 = pgVar58->nb[1];
                                      sVar9 = pgVar58->nb[2];
                                      sVar10 = pgVar58->nb[3];
                                      gVar2 = pgVar61->type;
                                      iVar73 = *(int *)&pgVar61->field_0x4;
                                      lVar48 = ggml_nrows(pgVar59);
                                      lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                      lVar70 = (int)gVar2 * lVar49;
                                      lVar49 = lVar49 + lVar70;
                                      if (lVar48 <= lVar49) {
                                        lVar49 = lVar48;
                                      }
                                      if (lVar70 < lVar49) {
                                        lVar71 = lVar71 * lVar55;
                                        pvVar11 = pgVar58->data;
                                        pvVar12 = pgVar59->data;
                                        do {
                                          lVar48 = lVar70 / lVar71;
                                          lVar54 = lVar70 % lVar71;
                                          lVar50 = lVar54 / lVar55;
                                          lVar54 = lVar54 % lVar55;
                                          if (0 < lVar52) {
                                            lVar51 = 0;
                                            do {
                                              fVar90 = expf(-*(float *)(&ggml_table_f32_f16 +
                                                                       (ulong)*(ushort *)
                                                                               ((long)pvVar12 +
                                                                               lVar51 * 2 +
                                                                               lVar50 * sVar6 +
                                                                               lVar54 * sVar5 +
                                                                               lVar48 * sVar7) * 4))
                                              ;
                                              *(float *)((long)pvVar11 +
                                                        lVar51 * 4 +
                                                        lVar50 * sVar9 +
                                                        lVar54 * sVar8 + lVar48 * sVar10) =
                                                   1.0 / (fVar90 + 1.0);
                                              lVar51 = lVar51 + 1;
                                            } while (lVar52 != lVar51);
                                          }
                                          lVar70 = lVar70 + 1;
                                        } while (lVar70 != lVar49);
                                      }
                                      return;
                                    }
                                    goto LAB_0012cb55;
                                  }
LAB_0012cb39:
                                  pcVar53 = "nb0 == sizeof(dst_t)";
                                  uVar57 = 0x55;
                                  goto LAB_0012cb6f;
                                }
                              }
                              pcVar53 = 
                              "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                              ;
                              uVar57 = 0x51;
LAB_0012cb6f:
                              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                                         ,uVar57,"GGML_ASSERT(%s) failed",pcVar53);
                            }
                            cVar47 = ggml_is_contiguous_1(pgVar58);
                            if (((cVar47 != '\0') &&
                                (cVar47 = ggml_is_contiguous_1(pgVar61), cVar47 != '\0')) &&
                               (cVar47 = ggml_are_same_shape(pgVar58,pgVar61), cVar47 != '\0')) {
                              if (pgVar61->nb[0] == 4) {
                                if (pgVar58->nb[0] == 2) {
                                  lVar55 = pgVar58->ne[1];
                                  lVar71 = pgVar58->ne[2];
                                  sVar5 = pgVar58->nb[1];
                                  sVar6 = pgVar58->nb[2];
                                  sVar7 = pgVar58->nb[3];
                                  lVar52 = pgVar61->ne[0];
                                  sVar8 = pgVar61->nb[1];
                                  sVar9 = pgVar61->nb[2];
                                  sVar10 = pgVar61->nb[3];
                                  gVar2 = pgVar59->type;
                                  iVar73 = *(int *)&pgVar59->field_0x4;
                                  lVar48 = ggml_nrows();
                                  lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                                  lVar70 = (int)gVar2 * lVar49;
                                  lVar49 = lVar49 + lVar70;
                                  if (lVar48 <= lVar49) {
                                    lVar49 = lVar48;
                                  }
                                  if (lVar70 < lVar49) {
                                    lVar71 = lVar71 * lVar55;
                                    pvVar11 = pgVar61->data;
                                    pvVar12 = pgVar58->data;
                                    do {
                                      lVar48 = lVar70 / lVar71;
                                      lVar54 = lVar70 % lVar71;
                                      lVar50 = lVar54 / lVar55;
                                      lVar54 = lVar54 % lVar55;
                                      if (0 < lVar52) {
                                        lVar51 = 0;
                                        do {
                                          auVar97 = vmaxss_avx(ZEXT416(*(uint *)(&ggml_table_f32_f16
                                                                                + (ulong)*(ushort *)
                                                                                          ((long)
                                                  pvVar12 + lVar51 * 2 +
                                                            lVar50 * sVar6 +
                                                            lVar54 * sVar5 + lVar48 * sVar7) * 4)),
                                                  ZEXT816(0) << 0x40);
                                          *(int *)((long)pvVar11 +
                                                  lVar51 * 4 +
                                                  lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10)
                                               = auVar97._0_4_;
                                          lVar51 = lVar51 + 1;
                                        } while (lVar52 != lVar51);
                                      }
                                      lVar70 = lVar70 + 1;
                                    } while (lVar70 != lVar49);
                                  }
                                  return;
                                }
                                goto LAB_0012c1d1;
                              }
LAB_0012c1b5:
                              pcVar53 = "nb0 == sizeof(dst_t)";
                              uVar57 = 0x55;
                              goto LAB_0012c1eb;
                            }
                          }
                          pcVar53 = 
                          "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                          ;
                          uVar57 = 0x51;
LAB_0012c1eb:
                          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                                     ,uVar57,"GGML_ASSERT(%s) failed",pcVar53);
                        }
                        cVar47 = ggml_is_contiguous_1(pgVar60);
                        if (((cVar47 != '\0') &&
                            (cVar47 = ggml_is_contiguous_1(pgVar59), cVar47 != '\0')) &&
                           (cVar47 = ggml_are_same_shape(pgVar60,pgVar59), cVar47 != '\0')) {
                          if (pgVar59->nb[0] == 4) {
                            if (pgVar60->nb[0] == 2) {
                              lVar55 = pgVar60->ne[1];
                              lVar71 = pgVar60->ne[2];
                              sVar5 = pgVar60->nb[1];
                              sVar6 = pgVar60->nb[2];
                              sVar7 = pgVar60->nb[3];
                              lVar52 = pgVar59->ne[0];
                              sVar8 = pgVar59->nb[1];
                              sVar9 = pgVar59->nb[2];
                              sVar10 = pgVar59->nb[3];
                              gVar2 = pgVar58->type;
                              iVar73 = *(int *)&pgVar58->field_0x4;
                              lVar48 = ggml_nrows(pgVar60);
                              lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                              lVar70 = (int)gVar2 * lVar49;
                              lVar49 = lVar49 + lVar70;
                              if (lVar48 <= lVar49) {
                                lVar49 = lVar48;
                              }
                              if (lVar70 < lVar49) {
                                lVar71 = lVar71 * lVar55;
                                do {
                                  lVar48 = lVar70 / lVar71;
                                  lVar54 = lVar70 % lVar71;
                                  lVar50 = lVar54 / lVar55;
                                  lVar54 = lVar54 % lVar55;
                                  if (0 < lVar52) {
                                    pvVar11 = pgVar59->data;
                                    pvVar12 = pgVar60->data;
                                    lVar51 = 0;
                                    do {
                                      fVar90 = *(float *)(&ggml_table_f32_f16 +
                                                         (ulong)*(ushort *)
                                                                 ((long)pvVar12 +
                                                                 lVar51 * 2 +
                                                                 lVar50 * sVar6 +
                                                                 lVar54 * sVar5 + lVar48 * sVar7) *
                                                         4);
                                      if (fVar90 <= 0.0) {
                                        fVar90 = expm1f(fVar90);
                                      }
                                      *(float *)((long)pvVar11 +
                                                lVar51 * 4 +
                                                lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) =
                                           fVar90;
                                      lVar51 = lVar51 + 1;
                                    } while (lVar52 != lVar51);
                                  }
                                  lVar70 = lVar70 + 1;
                                } while (lVar70 != lVar49);
                              }
                              return;
                            }
                            goto LAB_0012b94b;
                          }
LAB_0012b92f:
                          pcVar53 = "nb0 == sizeof(dst_t)";
                          uVar57 = 0x55;
                          goto LAB_0012b965;
                        }
                      }
                      pcVar53 = 
                      "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                      ;
                      uVar57 = 0x51;
LAB_0012b965:
                      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                                 ,uVar57,"GGML_ASSERT(%s) failed",pcVar53);
                    }
                    cVar47 = ggml_is_contiguous_1(pgVar59);
                    if (((cVar47 != '\0') &&
                        (cVar47 = ggml_is_contiguous_1(pgVar58), cVar47 != '\0')) &&
                       (cVar47 = ggml_are_same_shape(pgVar59,pgVar58), cVar47 != '\0')) {
                      if (pgVar58->nb[0] == 4) {
                        if (pgVar59->nb[0] == 2) {
                          lVar55 = pgVar59->ne[1];
                          lVar71 = pgVar59->ne[2];
                          sVar5 = pgVar59->nb[1];
                          sVar6 = pgVar59->nb[2];
                          sVar7 = pgVar59->nb[3];
                          lVar52 = pgVar58->ne[0];
                          sVar8 = pgVar58->nb[1];
                          sVar9 = pgVar58->nb[2];
                          sVar10 = pgVar58->nb[3];
                          gVar2 = pgVar60->type;
                          iVar73 = *(int *)&pgVar60->field_0x4;
                          lVar48 = ggml_nrows(pgVar59);
                          lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                          lVar70 = (int)gVar2 * lVar49;
                          lVar49 = lVar49 + lVar70;
                          if (lVar48 <= lVar49) {
                            lVar49 = lVar48;
                          }
                          if (lVar70 < lVar49) {
                            lVar71 = lVar71 * lVar55;
                            do {
                              lVar48 = lVar70 / lVar71;
                              lVar54 = lVar70 % lVar71;
                              lVar50 = lVar54 / lVar55;
                              lVar54 = lVar54 % lVar55;
                              if (0 < lVar52) {
                                pvVar11 = pgVar58->data;
                                pvVar12 = pgVar59->data;
                                lVar51 = 0;
                                do {
                                  fVar90 = tanhf(*(float *)(&ggml_table_f32_f16 +
                                                           (ulong)*(ushort *)
                                                                   ((long)pvVar12 +
                                                                   lVar51 * 2 +
                                                                   lVar50 * sVar6 +
                                                                   lVar54 * sVar5 + lVar48 * sVar7)
                                                           * 4));
                                  *(float *)((long)pvVar11 +
                                            lVar51 * 4 +
                                            lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) =
                                       fVar90;
                                  lVar51 = lVar51 + 1;
                                } while (lVar52 != lVar51);
                              }
                              lVar70 = lVar70 + 1;
                            } while (lVar70 != lVar49);
                          }
                          return;
                        }
                        goto LAB_0012b071;
                      }
LAB_0012b055:
                      pcVar53 = "nb0 == sizeof(dst_t)";
                      uVar57 = 0x55;
                      goto LAB_0012b08b;
                    }
                  }
                  pcVar53 = 
                  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                  ;
                  uVar57 = 0x51;
LAB_0012b08b:
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                             ,uVar57,"GGML_ASSERT(%s) failed",pcVar53);
                }
                cVar47 = ggml_is_contiguous_1(pgVar58);
                if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(pgVar60), cVar47 != '\0'))
                   && (cVar47 = ggml_are_same_shape(pgVar58,pgVar60), cVar47 != '\0')) {
                  if (pgVar60->nb[0] == 4) {
                    if (pgVar58->nb[0] == 2) {
                      lVar55 = pgVar58->ne[1];
                      lVar71 = pgVar58->ne[2];
                      sVar5 = pgVar58->nb[1];
                      sVar6 = pgVar58->nb[2];
                      sVar7 = pgVar58->nb[3];
                      lVar52 = pgVar60->ne[0];
                      sVar8 = pgVar60->nb[1];
                      sVar9 = pgVar60->nb[2];
                      sVar10 = pgVar60->nb[3];
                      gVar2 = pgVar59->type;
                      iVar73 = *(int *)&pgVar59->field_0x4;
                      lVar48 = ggml_nrows();
                      lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                      lVar70 = (int)gVar2 * lVar49;
                      lVar49 = lVar49 + lVar70;
                      if (lVar48 <= lVar49) {
                        lVar49 = lVar48;
                      }
                      if (lVar70 < lVar49) {
                        lVar71 = lVar71 * lVar55;
                        pvVar11 = pgVar60->data;
                        pvVar12 = pgVar58->data;
                        do {
                          lVar48 = lVar70 / lVar71;
                          lVar54 = lVar70 % lVar71;
                          lVar50 = lVar54 / lVar55;
                          lVar54 = lVar54 % lVar55;
                          if (0 < lVar52) {
                            lVar51 = 0;
                            do {
                              uVar57 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                                      ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                       (ulong)*(ushort *)
                                                                               ((long)pvVar12 +
                                                                               lVar51 * 2 +
                                                                               lVar50 * sVar6 +
                                                                               lVar54 * sVar5 +
                                                                               lVar48 * sVar7) * 4))
                                                      ,1);
                              *(uint *)((long)pvVar11 +
                                       lVar51 * 4 +
                                       lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) =
                                   (uint)((byte)uVar57 & 1) * 0x3f800000;
                              lVar51 = lVar51 + 1;
                            } while (lVar52 != lVar51);
                          }
                          lVar70 = lVar70 + 1;
                        } while (lVar70 != lVar49);
                      }
                      return;
                    }
                    goto LAB_0012a7e5;
                  }
LAB_0012a7c9:
                  pcVar53 = "nb0 == sizeof(dst_t)";
                  uVar57 = 0x55;
                  goto LAB_0012a7ff;
                }
              }
              pcVar53 = 
              "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
              ;
              uVar57 = 0x51;
LAB_0012a7ff:
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                         ,uVar57,"GGML_ASSERT(%s) failed",pcVar53);
            }
            cVar47 = ggml_is_contiguous_1(pgVar60);
            if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(pgVar59), cVar47 != '\0')) &&
               (cVar47 = ggml_are_same_shape(pgVar60,pgVar59), cVar47 != '\0')) {
              if (pgVar59->nb[0] == 4) {
                if (pgVar60->nb[0] == 2) {
                  lVar55 = pgVar60->ne[1];
                  lVar71 = pgVar60->ne[2];
                  sVar5 = pgVar60->nb[1];
                  sVar6 = pgVar60->nb[2];
                  sVar7 = pgVar60->nb[3];
                  lVar52 = pgVar59->ne[0];
                  sVar8 = pgVar59->nb[1];
                  sVar9 = pgVar59->nb[2];
                  sVar10 = pgVar59->nb[3];
                  gVar2 = pgVar58->type;
                  iVar73 = *(int *)&pgVar58->field_0x4;
                  lVar48 = ggml_nrows();
                  lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
                  lVar70 = (int)gVar2 * lVar49;
                  lVar49 = lVar49 + lVar70;
                  if (lVar48 <= lVar49) {
                    lVar49 = lVar48;
                  }
                  if (lVar70 < lVar49) {
                    lVar71 = lVar71 * lVar55;
                    pvVar11 = pgVar59->data;
                    pvVar12 = pgVar60->data;
                    do {
                      lVar48 = lVar70 / lVar71;
                      lVar54 = lVar70 % lVar71;
                      lVar50 = lVar54 / lVar55;
                      lVar54 = lVar54 % lVar55;
                      if (0 < lVar52) {
                        lVar51 = 0;
                        do {
                          *(uint *)((long)pvVar11 +
                                   lVar51 * 4 + lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) =
                               *(uint *)(&ggml_table_f32_f16 +
                                        (ulong)*(ushort *)
                                                ((long)pvVar12 +
                                                lVar51 * 2 +
                                                lVar50 * sVar6 + lVar54 * sVar5 + lVar48 * sVar7) *
                                        4) ^ 0x80000000;
                          lVar51 = lVar51 + 1;
                        } while (lVar52 != lVar51);
                      }
                      lVar70 = lVar70 + 1;
                    } while (lVar70 != lVar49);
                  }
                  return;
                }
                goto LAB_00129f2a;
              }
LAB_00129f0e:
              pcVar53 = "nb0 == sizeof(dst_t)";
              uVar57 = 0x55;
              goto LAB_00129f44;
            }
          }
          pcVar53 = 
          "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
          ;
          uVar57 = 0x51;
LAB_00129f44:
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                     ,uVar57,"GGML_ASSERT(%s) failed",pcVar53);
        }
        cVar47 = ggml_is_contiguous_1(pgVar59);
        if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(pgVar58), cVar47 != '\0')) &&
           (cVar47 = ggml_are_same_shape(pgVar59,pgVar58), cVar47 != '\0')) {
          if (pgVar58->nb[0] == 4) {
            if (pgVar59->nb[0] == 2) {
              lVar55 = pgVar59->ne[1];
              lVar71 = pgVar59->ne[2];
              sVar5 = pgVar59->nb[1];
              sVar6 = pgVar59->nb[2];
              sVar7 = pgVar59->nb[3];
              lVar52 = pgVar58->ne[0];
              sVar8 = pgVar58->nb[1];
              sVar9 = pgVar58->nb[2];
              sVar10 = pgVar58->nb[3];
              gVar2 = dst->type;
              iVar73 = *(int *)&dst->field_0x4;
              lVar48 = ggml_nrows();
              lVar49 = ((long)iVar73 + -1 + lVar48) / (long)iVar73;
              lVar70 = (int)gVar2 * lVar49;
              lVar49 = lVar49 + lVar70;
              if (lVar48 <= lVar49) {
                lVar49 = lVar48;
              }
              if (lVar70 < lVar49) {
                lVar71 = lVar71 * lVar55;
                pvVar11 = pgVar58->data;
                pvVar12 = pgVar59->data;
                do {
                  lVar48 = lVar70 / lVar71;
                  lVar54 = lVar70 % lVar71;
                  lVar50 = lVar54 / lVar55;
                  lVar54 = lVar54 % lVar55;
                  if (0 < lVar52) {
                    lVar51 = 0;
                    do {
                      uVar57 = vcmpss_avx512f(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                               (ulong)*(ushort *)
                                                                       ((long)pvVar12 +
                                                                       lVar51 * 2 +
                                                                       lVar50 * sVar6 +
                                                                       lVar54 * sVar5 +
                                                                       lVar48 * sVar7) * 4)),
                                              ZEXT816(0) << 0x40,1);
                      uVar43 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                              ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                               (ulong)*(ushort *)
                                                                       ((long)pvVar12 +
                                                                       lVar51 * 2 +
                                                                       lVar50 * sVar6 +
                                                                       lVar54 * sVar5 +
                                                                       lVar48 * sVar7) * 4)),1);
                      bVar44 = (bool)((byte)uVar43 & 1);
                      *(uint *)((long)pvVar11 +
                               lVar51 * 4 + lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) =
                           (uint)bVar44 * 0x3f800000 +
                           (uint)!bVar44 * (uint)((byte)uVar57 & 1) * -0x40800000;
                      lVar51 = lVar51 + 1;
                    } while (lVar52 != lVar51);
                  }
                  lVar70 = lVar70 + 1;
                } while (lVar70 != lVar49);
              }
              return;
            }
            goto LAB_00129690;
          }
LAB_00129674:
          pcVar53 = "nb0 == sizeof(dst_t)";
          uVar57 = 0x55;
          goto LAB_001296aa;
        }
      }
      pcVar53 = 
      "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
      uVar57 = 0x51;
LAB_001296aa:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                 ,uVar57,"GGML_ASSERT(%s) failed",pcVar53);
    }
    cVar47 = ggml_is_contiguous_1(pgVar58);
    if (((cVar47 != '\0') && (cVar47 = ggml_is_contiguous_1(dst), cVar47 != '\0')) &&
       (cVar47 = ggml_are_same_shape(pgVar58,dst), cVar47 != '\0')) {
      if (dst->nb[0] == 4) {
        if (pgVar58->nb[0] == 2) {
          lVar55 = pgVar58->ne[1];
          lVar71 = pgVar58->ne[2];
          sVar5 = pgVar58->nb[1];
          sVar6 = pgVar58->nb[2];
          sVar7 = pgVar58->nb[3];
          lVar52 = dst->ne[0];
          sVar8 = dst->nb[1];
          sVar9 = dst->nb[2];
          sVar10 = dst->nb[3];
          iVar73 = params->ith;
          iVar3 = params->nth;
          lVar48 = ggml_nrows();
          lVar49 = ((long)iVar3 + -1 + lVar48) / (long)iVar3;
          lVar70 = iVar73 * lVar49;
          lVar49 = lVar49 + lVar70;
          if (lVar48 <= lVar49) {
            lVar49 = lVar48;
          }
          if (lVar70 < lVar49) {
            lVar71 = lVar71 * lVar55;
            pvVar11 = dst->data;
            pvVar12 = pgVar58->data;
            auVar92._8_4_ = 0x7fffffff;
            auVar92._0_8_ = 0x7fffffff7fffffff;
            auVar92._12_4_ = 0x7fffffff;
            do {
              lVar48 = lVar70 / lVar71;
              lVar54 = lVar70 % lVar71;
              lVar50 = lVar54 / lVar55;
              lVar54 = lVar54 % lVar55;
              if (0 < lVar52) {
                lVar51 = 0;
                do {
                  auVar97 = vpand_avx(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                       (ulong)*(ushort *)
                                                               ((long)pvVar12 +
                                                               lVar51 * 2 +
                                                               lVar50 * sVar6 +
                                                               lVar54 * sVar5 + lVar48 * sVar7) * 4)
                                             ),auVar92);
                  *(int *)((long)pvVar11 +
                          lVar51 * 4 + lVar50 * sVar9 + lVar54 * sVar8 + lVar48 * sVar10) =
                       auVar97._0_4_;
                  lVar51 = lVar51 + 1;
                } while (lVar52 != lVar51);
              }
              lVar70 = lVar70 + 1;
            } while (lVar70 != lVar49);
          }
          return;
        }
        goto LAB_00128d57;
      }
LAB_00128d3b:
      pcVar53 = "nb0 == sizeof(dst_t)";
      uVar57 = 0x55;
      goto LAB_00128d71;
    }
  }
  pcVar53 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uVar57 = 0x51;
LAB_00128d71:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
             ,uVar57,"GGML_ASSERT(%s) failed",pcVar53);
}

Assistant:

void ggml_compute_forward_abs(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_abs>(params, dst);
}